

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar971 [16];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar974 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar978 [16];
  undefined1 auVar979 [16];
  undefined1 auVar980 [16];
  undefined1 auVar981 [16];
  undefined1 auVar982 [16];
  undefined1 auVar983 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar986 [16];
  undefined1 auVar987 [16];
  undefined1 auVar988 [16];
  undefined1 auVar989 [16];
  undefined1 auVar990 [16];
  undefined1 auVar991 [16];
  undefined1 auVar992 [16];
  undefined1 auVar993 [16];
  undefined1 auVar994 [16];
  undefined1 auVar995 [16];
  undefined1 auVar996 [16];
  undefined1 auVar997 [16];
  undefined1 auVar998 [16];
  undefined1 auVar999 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar1001 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1005 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar1016 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar1047 [16];
  undefined1 auVar1048 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1056 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1058 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1060 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1070 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar1075 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1099 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1103 [16];
  undefined1 auVar1104 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1110 [16];
  undefined1 auVar1111 [16];
  undefined1 auVar1112 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1114 [16];
  undefined1 auVar1115 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1117 [16];
  undefined1 auVar1118 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar1121 [16];
  undefined1 auVar1122 [16];
  undefined1 auVar1123 [16];
  undefined1 auVar1124 [16];
  undefined1 auVar1125 [16];
  undefined1 auVar1126 [16];
  undefined1 auVar1127 [16];
  undefined1 auVar1128 [16];
  undefined1 auVar1129 [16];
  undefined1 auVar1130 [16];
  undefined1 auVar1131 [16];
  undefined1 auVar1132 [16];
  undefined1 auVar1133 [16];
  undefined1 auVar1134 [16];
  undefined1 auVar1135 [16];
  undefined1 auVar1136 [16];
  undefined1 auVar1137 [16];
  undefined1 auVar1138 [16];
  undefined1 auVar1139 [16];
  undefined1 auVar1140 [16];
  undefined1 auVar1141 [16];
  undefined1 auVar1142 [16];
  undefined1 auVar1143 [16];
  undefined1 auVar1144 [16];
  undefined1 auVar1145 [16];
  undefined1 auVar1146 [16];
  undefined1 auVar1147 [16];
  undefined1 auVar1148 [16];
  undefined1 auVar1149 [16];
  undefined1 auVar1150 [16];
  undefined1 auVar1151 [16];
  undefined1 auVar1152 [16];
  undefined1 auVar1153 [16];
  undefined1 auVar1154 [16];
  undefined1 auVar1155 [16];
  undefined1 auVar1156 [16];
  undefined1 auVar1157 [16];
  undefined1 auVar1158 [16];
  undefined1 auVar1159 [16];
  undefined1 auVar1160 [16];
  undefined1 auVar1161 [16];
  undefined1 auVar1162 [16];
  undefined1 auVar1163 [16];
  undefined1 auVar1164 [16];
  undefined1 auVar1165 [16];
  undefined1 auVar1166 [16];
  undefined1 auVar1167 [16];
  undefined1 auVar1168 [16];
  undefined1 auVar1169 [16];
  undefined1 auVar1170 [16];
  undefined1 auVar1171 [16];
  undefined1 auVar1172 [16];
  undefined1 auVar1173 [16];
  undefined1 auVar1174 [16];
  undefined1 auVar1175 [16];
  undefined1 auVar1176 [16];
  undefined1 auVar1177 [16];
  undefined1 auVar1178 [16];
  undefined1 auVar1179 [16];
  undefined1 auVar1180 [16];
  undefined1 auVar1181 [16];
  undefined1 auVar1182 [16];
  undefined1 auVar1183 [16];
  undefined1 auVar1184 [16];
  undefined1 auVar1185 [16];
  undefined1 auVar1186 [16];
  undefined1 auVar1187 [16];
  undefined1 auVar1188 [16];
  undefined1 auVar1189 [16];
  undefined1 auVar1190 [16];
  undefined1 auVar1191 [16];
  undefined1 auVar1192 [16];
  undefined1 auVar1193 [16];
  undefined1 auVar1194 [16];
  undefined1 auVar1195 [16];
  undefined1 auVar1196 [16];
  undefined1 auVar1197 [16];
  undefined1 auVar1198 [16];
  undefined1 auVar1199 [16];
  undefined1 auVar1200 [16];
  undefined1 auVar1201 [16];
  undefined1 auVar1202 [16];
  undefined1 auVar1203 [16];
  undefined1 auVar1204 [16];
  undefined1 auVar1205 [16];
  undefined1 auVar1206 [16];
  undefined1 auVar1207 [16];
  undefined1 auVar1208 [16];
  undefined1 auVar1209 [16];
  undefined1 auVar1210 [16];
  undefined1 auVar1211 [16];
  undefined1 auVar1212 [16];
  undefined1 auVar1213 [16];
  undefined1 auVar1214 [16];
  undefined1 auVar1215 [16];
  undefined1 auVar1216 [16];
  undefined1 auVar1217 [16];
  undefined1 auVar1218 [16];
  undefined1 auVar1219 [16];
  undefined1 auVar1220 [16];
  undefined1 auVar1221 [16];
  undefined1 auVar1222 [16];
  undefined1 auVar1223 [16];
  undefined1 auVar1224 [16];
  undefined1 auVar1225 [16];
  undefined1 auVar1226 [16];
  undefined1 auVar1227 [16];
  undefined1 auVar1228 [16];
  undefined1 auVar1229 [16];
  undefined1 auVar1230 [16];
  undefined1 auVar1231 [16];
  undefined1 auVar1232 [16];
  undefined1 auVar1233 [16];
  undefined1 auVar1234 [16];
  undefined1 auVar1235 [16];
  undefined1 auVar1236 [16];
  undefined1 auVar1237 [16];
  undefined1 auVar1238 [16];
  undefined1 auVar1239 [16];
  undefined1 auVar1240 [16];
  undefined1 auVar1241 [16];
  undefined1 auVar1242 [16];
  undefined1 auVar1243 [16];
  undefined1 auVar1244 [16];
  undefined1 auVar1245 [16];
  undefined1 auVar1246 [16];
  undefined1 auVar1247 [16];
  undefined1 auVar1248 [16];
  undefined1 auVar1249 [16];
  undefined1 auVar1250 [16];
  undefined1 auVar1251 [16];
  undefined1 auVar1252 [16];
  undefined1 auVar1253 [16];
  undefined1 auVar1254 [16];
  undefined1 auVar1255 [16];
  undefined1 auVar1256 [16];
  undefined1 auVar1257 [16];
  undefined1 auVar1258 [16];
  undefined1 auVar1259 [16];
  undefined1 auVar1260 [16];
  undefined1 auVar1261 [16];
  undefined1 auVar1262 [16];
  undefined1 auVar1263 [16];
  undefined1 auVar1264 [16];
  undefined1 auVar1265 [16];
  undefined1 auVar1266 [16];
  undefined1 auVar1267 [16];
  undefined1 auVar1268 [16];
  undefined1 auVar1269 [16];
  undefined1 auVar1270 [16];
  undefined1 auVar1271 [16];
  undefined1 auVar1272 [16];
  undefined1 auVar1273 [16];
  undefined1 auVar1274 [16];
  undefined1 auVar1275 [16];
  undefined1 auVar1276 [16];
  undefined1 auVar1277 [16];
  undefined1 auVar1278 [16];
  undefined1 auVar1279 [16];
  undefined1 auVar1280 [16];
  undefined1 auVar1281 [16];
  undefined1 auVar1282 [16];
  undefined1 auVar1283 [16];
  undefined1 auVar1284 [16];
  undefined1 auVar1285 [16];
  undefined1 auVar1286 [16];
  undefined1 auVar1287 [16];
  undefined1 auVar1288 [16];
  undefined1 auVar1289 [16];
  undefined1 auVar1290 [16];
  undefined1 auVar1291 [16];
  undefined1 auVar1292 [16];
  undefined1 auVar1293 [16];
  undefined1 auVar1294 [16];
  undefined1 auVar1295 [16];
  undefined1 auVar1296 [16];
  undefined1 auVar1297 [16];
  undefined1 auVar1298 [16];
  undefined1 auVar1299 [16];
  undefined1 auVar1300 [16];
  undefined1 auVar1301 [16];
  undefined1 auVar1302 [16];
  undefined1 auVar1303 [16];
  undefined1 auVar1304 [16];
  undefined1 auVar1305 [16];
  undefined1 auVar1306 [16];
  undefined1 auVar1307 [16];
  undefined1 auVar1308 [16];
  undefined1 auVar1309 [16];
  undefined1 auVar1310 [16];
  undefined1 auVar1311 [16];
  undefined1 auVar1312 [16];
  undefined1 auVar1313 [16];
  undefined1 auVar1314 [16];
  undefined1 auVar1315 [16];
  undefined1 auVar1316 [16];
  undefined1 auVar1317 [16];
  undefined1 auVar1318 [16];
  undefined1 auVar1319 [16];
  undefined1 auVar1320 [16];
  undefined1 auVar1321 [16];
  undefined1 auVar1322 [16];
  undefined1 auVar1323 [16];
  undefined1 auVar1324 [16];
  undefined1 auVar1325 [16];
  undefined1 auVar1326 [16];
  undefined1 auVar1327 [16];
  undefined1 auVar1328 [16];
  undefined1 auVar1329 [16];
  undefined1 auVar1330 [16];
  undefined1 auVar1331 [16];
  undefined1 auVar1332 [16];
  undefined1 auVar1333 [16];
  undefined1 auVar1334 [16];
  undefined1 auVar1335 [16];
  undefined1 auVar1336 [16];
  undefined1 auVar1337 [16];
  undefined1 auVar1338 [16];
  undefined1 auVar1339 [16];
  undefined1 auVar1340 [16];
  undefined1 auVar1341 [16];
  undefined1 auVar1342 [16];
  undefined1 auVar1343 [16];
  undefined1 auVar1344 [16];
  undefined1 auVar1345 [16];
  undefined1 auVar1346 [16];
  undefined1 auVar1347 [16];
  undefined1 auVar1348 [16];
  undefined1 auVar1349 [16];
  undefined1 auVar1350 [16];
  undefined1 auVar1351 [16];
  undefined1 auVar1352 [16];
  undefined1 auVar1353 [16];
  undefined1 auVar1354 [16];
  undefined1 auVar1355 [16];
  undefined1 auVar1356 [16];
  undefined1 auVar1357 [16];
  undefined1 auVar1358 [16];
  undefined1 auVar1359 [16];
  undefined1 auVar1360 [16];
  undefined1 auVar1361 [16];
  undefined1 auVar1362 [16];
  undefined1 auVar1363 [16];
  undefined1 auVar1364 [16];
  undefined1 auVar1365 [16];
  undefined1 auVar1366 [16];
  undefined1 auVar1367 [16];
  undefined1 auVar1368 [16];
  undefined1 auVar1369 [16];
  undefined1 auVar1370 [16];
  undefined1 auVar1371 [16];
  undefined1 auVar1372 [16];
  undefined1 auVar1373 [16];
  undefined1 auVar1374 [16];
  undefined1 auVar1375 [16];
  undefined1 auVar1376 [16];
  undefined1 auVar1377 [16];
  undefined1 auVar1378 [16];
  undefined1 auVar1379 [16];
  undefined1 auVar1380 [16];
  undefined1 auVar1381 [16];
  undefined1 auVar1382 [16];
  undefined1 auVar1383 [16];
  undefined1 auVar1384 [16];
  undefined1 auVar1385 [16];
  undefined1 auVar1386 [16];
  undefined1 auVar1387 [16];
  undefined1 auVar1388 [16];
  undefined1 auVar1389 [16];
  undefined1 auVar1390 [16];
  undefined1 auVar1391 [16];
  undefined1 auVar1392 [16];
  undefined1 auVar1393 [16];
  undefined1 auVar1394 [16];
  undefined1 auVar1395 [16];
  undefined1 auVar1396 [16];
  undefined1 auVar1397 [16];
  undefined1 auVar1398 [16];
  undefined1 auVar1399 [16];
  undefined1 auVar1400 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1403 [16];
  undefined1 auVar1404 [16];
  undefined1 auVar1405 [16];
  undefined1 auVar1406 [16];
  undefined1 auVar1407 [16];
  undefined1 auVar1408 [16];
  undefined1 auVar1409 [16];
  undefined1 auVar1410 [16];
  undefined1 auVar1411 [16];
  undefined1 auVar1412 [16];
  undefined1 auVar1413 [16];
  undefined1 auVar1414 [16];
  undefined1 auVar1415 [16];
  undefined1 auVar1416 [16];
  undefined1 auVar1417 [16];
  undefined1 auVar1418 [16];
  undefined1 auVar1419 [16];
  undefined1 auVar1420 [16];
  undefined1 auVar1421 [16];
  undefined1 auVar1422 [16];
  undefined1 auVar1423 [16];
  undefined1 auVar1424 [16];
  undefined1 auVar1425 [16];
  undefined1 auVar1426 [16];
  undefined1 auVar1427 [16];
  undefined1 auVar1428 [16];
  undefined1 auVar1429 [16];
  undefined1 auVar1430 [16];
  undefined1 auVar1431 [16];
  undefined1 auVar1432 [16];
  undefined1 auVar1433 [16];
  undefined1 auVar1434 [16];
  undefined1 auVar1435 [16];
  undefined1 auVar1436 [16];
  undefined1 auVar1437 [16];
  undefined1 auVar1438 [16];
  undefined1 auVar1439 [16];
  undefined1 auVar1440 [16];
  undefined1 auVar1441 [16];
  undefined1 auVar1442 [16];
  undefined1 auVar1443 [16];
  undefined1 auVar1444 [16];
  undefined1 auVar1445 [16];
  undefined1 auVar1446 [16];
  undefined1 auVar1447 [16];
  undefined1 auVar1448 [16];
  undefined1 auVar1449 [16];
  undefined1 auVar1450 [16];
  undefined1 auVar1451 [16];
  undefined1 auVar1452 [16];
  undefined1 auVar1453 [16];
  undefined1 auVar1454 [16];
  undefined1 auVar1455 [16];
  undefined1 auVar1456 [16];
  undefined1 auVar1457 [16];
  undefined1 auVar1458 [16];
  undefined1 auVar1459 [16];
  undefined1 auVar1460 [16];
  undefined1 auVar1461 [16];
  undefined1 auVar1462 [16];
  undefined1 auVar1463 [16];
  undefined1 auVar1464 [16];
  undefined1 auVar1465 [16];
  undefined1 auVar1466 [16];
  undefined1 auVar1467 [16];
  undefined1 auVar1468 [16];
  undefined1 auVar1469 [16];
  undefined1 auVar1470 [16];
  undefined1 auVar1471 [16];
  undefined1 auVar1472 [16];
  undefined1 auVar1473 [16];
  undefined1 auVar1474 [16];
  undefined1 auVar1475 [16];
  undefined1 auVar1476 [16];
  undefined1 auVar1477 [16];
  undefined1 auVar1478 [16];
  undefined1 auVar1479 [16];
  undefined1 auVar1480 [16];
  undefined1 auVar1481 [16];
  undefined1 auVar1482 [16];
  undefined1 auVar1483 [16];
  undefined1 auVar1484 [16];
  undefined1 auVar1485 [16];
  undefined1 auVar1486 [16];
  undefined1 auVar1487 [16];
  undefined1 auVar1488 [16];
  undefined1 auVar1489 [16];
  undefined1 auVar1490 [16];
  undefined1 auVar1491 [16];
  undefined1 auVar1492 [16];
  undefined1 auVar1493 [16];
  undefined1 auVar1494 [16];
  undefined1 auVar1495 [16];
  undefined1 auVar1496 [16];
  undefined1 auVar1497 [16];
  undefined1 auVar1498 [16];
  undefined1 auVar1499 [16];
  undefined1 auVar1500 [16];
  undefined1 auVar1501 [16];
  undefined1 auVar1502 [16];
  undefined1 auVar1503 [16];
  undefined1 auVar1504 [16];
  undefined1 auVar1505 [16];
  undefined1 auVar1506 [16];
  undefined1 auVar1507 [16];
  undefined1 auVar1508 [16];
  undefined1 auVar1509 [16];
  undefined1 auVar1510 [16];
  undefined1 auVar1511 [16];
  undefined1 auVar1512 [16];
  undefined1 auVar1513 [16];
  undefined1 auVar1514 [16];
  undefined1 auVar1515 [16];
  undefined1 auVar1516 [16];
  undefined1 auVar1517 [16];
  undefined1 auVar1518 [16];
  undefined1 auVar1519 [16];
  undefined1 auVar1520 [16];
  undefined1 auVar1521 [16];
  undefined1 auVar1522 [16];
  undefined1 auVar1523 [16];
  undefined1 auVar1524 [16];
  undefined1 auVar1525 [16];
  undefined1 auVar1526 [16];
  undefined1 auVar1527 [16];
  undefined1 auVar1528 [16];
  undefined1 auVar1529 [16];
  undefined1 auVar1530 [16];
  undefined1 auVar1531 [16];
  undefined1 auVar1532 [16];
  undefined1 auVar1533 [16];
  undefined1 auVar1534 [16];
  undefined1 auVar1535 [16];
  undefined1 auVar1536 [16];
  undefined1 auVar1537 [16];
  undefined1 auVar1538 [16];
  undefined1 auVar1539 [16];
  undefined1 auVar1540 [16];
  undefined1 auVar1541 [16];
  undefined1 auVar1542 [16];
  undefined1 auVar1543 [16];
  undefined1 auVar1544 [16];
  undefined1 auVar1545 [16];
  undefined1 auVar1546 [16];
  undefined1 auVar1547 [16];
  undefined1 auVar1548 [16];
  undefined1 auVar1549 [16];
  undefined1 auVar1550 [16];
  undefined1 auVar1551 [16];
  undefined1 auVar1552 [16];
  undefined1 auVar1553 [16];
  undefined1 auVar1554 [16];
  undefined1 auVar1555 [16];
  undefined1 auVar1556 [16];
  undefined1 auVar1557 [16];
  undefined1 auVar1558 [16];
  undefined1 auVar1559 [16];
  undefined1 auVar1560 [16];
  undefined1 auVar1561 [16];
  undefined1 auVar1562 [16];
  undefined1 auVar1563 [16];
  undefined1 auVar1564 [16];
  undefined1 auVar1565 [16];
  undefined1 auVar1566 [16];
  undefined1 auVar1567 [16];
  undefined1 auVar1568 [16];
  undefined1 auVar1569 [16];
  undefined1 auVar1570 [16];
  undefined1 auVar1571 [16];
  undefined1 auVar1572 [16];
  undefined1 auVar1573 [16];
  undefined1 auVar1574 [16];
  undefined1 auVar1575 [16];
  undefined1 auVar1576 [16];
  undefined1 auVar1577 [16];
  undefined1 auVar1578 [16];
  undefined1 auVar1579 [16];
  undefined1 auVar1580 [16];
  undefined1 auVar1581 [16];
  undefined1 auVar1582 [16];
  undefined1 auVar1583 [16];
  undefined1 auVar1584 [16];
  undefined1 auVar1585 [16];
  undefined1 auVar1586 [16];
  undefined1 auVar1587 [16];
  undefined1 auVar1588 [16];
  undefined1 auVar1589 [16];
  undefined1 auVar1590 [16];
  undefined1 auVar1591 [16];
  undefined1 auVar1592 [16];
  undefined1 auVar1593 [16];
  undefined1 auVar1594 [16];
  undefined1 auVar1595 [16];
  undefined1 auVar1596 [16];
  undefined1 auVar1597 [16];
  undefined1 auVar1598 [16];
  undefined1 auVar1599 [16];
  undefined1 auVar1600 [16];
  undefined1 auVar1601 [16];
  undefined1 auVar1602 [16];
  undefined1 auVar1603 [16];
  undefined1 auVar1604 [16];
  undefined1 auVar1605 [16];
  undefined1 auVar1606 [16];
  undefined1 auVar1607 [16];
  undefined1 auVar1608 [16];
  undefined1 auVar1609 [16];
  undefined1 auVar1610 [16];
  undefined1 auVar1611 [16];
  undefined1 auVar1612 [16];
  undefined1 auVar1613 [16];
  undefined1 auVar1614 [16];
  undefined1 auVar1615 [16];
  undefined1 auVar1616 [16];
  undefined1 auVar1617 [16];
  undefined1 auVar1618 [16];
  undefined1 auVar1619 [16];
  undefined1 auVar1620 [16];
  undefined1 auVar1621 [16];
  undefined1 auVar1622 [16];
  undefined1 auVar1623 [16];
  undefined1 auVar1624 [16];
  undefined1 auVar1625 [16];
  undefined1 auVar1626 [16];
  undefined1 auVar1627 [16];
  undefined1 auVar1628 [16];
  undefined1 auVar1629 [16];
  undefined1 auVar1630 [16];
  undefined1 auVar1631 [16];
  undefined1 auVar1632 [16];
  undefined1 auVar1633 [16];
  undefined1 auVar1634 [16];
  undefined1 auVar1635 [16];
  undefined1 auVar1636 [16];
  undefined1 auVar1637 [16];
  undefined1 auVar1638 [16];
  undefined1 auVar1639 [16];
  undefined1 auVar1640 [16];
  undefined1 auVar1641 [16];
  undefined1 auVar1642 [16];
  undefined1 auVar1643 [16];
  undefined1 auVar1644 [16];
  undefined1 auVar1645 [16];
  undefined1 auVar1646 [16];
  undefined1 auVar1647 [16];
  undefined1 auVar1648 [16];
  undefined1 auVar1649 [16];
  undefined1 auVar1650 [16];
  undefined1 auVar1651 [16];
  undefined1 auVar1652 [16];
  undefined1 auVar1653 [16];
  undefined1 auVar1654 [16];
  undefined1 auVar1655 [16];
  undefined1 auVar1656 [16];
  undefined1 auVar1657 [16];
  undefined1 auVar1658 [16];
  undefined1 auVar1659 [16];
  undefined1 auVar1660 [16];
  undefined1 auVar1661 [16];
  undefined1 auVar1662 [16];
  undefined1 auVar1663 [16];
  undefined1 auVar1664 [16];
  undefined1 auVar1665 [16];
  undefined1 auVar1666 [16];
  undefined1 auVar1667 [16];
  undefined1 auVar1668 [16];
  undefined1 auVar1669 [16];
  undefined1 auVar1670 [16];
  undefined1 auVar1671 [16];
  undefined1 auVar1672 [16];
  undefined1 auVar1673 [16];
  undefined1 auVar1674 [16];
  undefined1 auVar1675 [16];
  undefined1 auVar1676 [16];
  undefined1 auVar1677 [16];
  ulong uVar1678;
  ulong uVar1679;
  ulong uVar1680;
  ulong uVar1681;
  ulong uVar1682;
  ulong uVar1683;
  ulong uVar1684;
  ulong uVar1685;
  ulong uVar1686;
  ulong uVar1687;
  ulong uVar1688;
  ulong uVar1689;
  ulong uVar1690;
  int iVar1691;
  ulong uVar1692;
  ulong uVar1693;
  ulong uVar1694;
  ulong uVar1695;
  ulong uVar1696;
  ulong uVar1697;
  ulong uVar1698;
  ulong uVar1699;
  ulong uVar1700;
  ulong uVar1701;
  ulong uVar1702;
  ulong uVar1703;
  ulong uVar1704;
  ulong uVar1705;
  ulong uVar1706;
  ulong uVar1707;
  ulong uVar1708;
  ulong uVar1709;
  ulong uVar1710;
  secp256k1_fe x88;
  secp256k1_fe x223;
  secp256k1_fe x220;
  secp256k1_fe x176;
  secp256k1_fe x9;
  secp256k1_fe x11;
  secp256k1_fe x6;
  secp256k1_fe t1;
  secp256k1_fe x3;
  secp256k1_fe x2;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong local_198;
  ulong uStack_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  ulong local_118;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  uint64_t tmp3_18;
  uint64_t tmp3_20;
  uint64_t tmp3_22;
  secp256k1_fe x44;
  secp256k1_fe x22;
  
  uVar1679 = a->n[0];
  uVar1684 = a->n[1];
  uVar1694 = a->n[2];
  uVar1695 = a->n[3];
  uVar1680 = a->n[4];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar1679 * 2;
  auVar791._8_8_ = 0;
  auVar791._0_8_ = uVar1695;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1684 * 2;
  auVar792._8_8_ = 0;
  auVar792._0_8_ = uVar1694;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1680;
  auVar793._8_8_ = 0;
  auVar793._0_8_ = uVar1680;
  uVar1678 = SUB168(auVar3 * auVar793,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1678 & 0xfffffffffffff;
  auVar1 = auVar2 * auVar792 + auVar1 * auVar791 + auVar4 * ZEXT816(0x1000003d10);
  uVar1682 = auVar1._0_8_;
  auVar1453._8_8_ = 0;
  auVar1453._0_8_ = uVar1682 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1680 = uVar1680 * 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1679;
  auVar794._8_8_ = 0;
  auVar794._0_8_ = uVar1680;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1684 * 2;
  auVar795._8_8_ = 0;
  auVar795._0_8_ = uVar1695;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1694;
  auVar796._8_8_ = 0;
  auVar796._0_8_ = uVar1694;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1678 >> 0x34 | SUB168(auVar3 * auVar793,8) << 0xc;
  auVar1 = auVar5 * auVar794 + auVar1453 + auVar6 * auVar795 + auVar7 * auVar796 +
           auVar8 * ZEXT816(0x1000003d10);
  uVar1683 = auVar1._0_8_;
  auVar1454._8_8_ = 0;
  auVar1454._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1679;
  auVar797._8_8_ = 0;
  auVar797._0_8_ = uVar1679;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1684;
  auVar798._8_8_ = 0;
  auVar798._0_8_ = uVar1680;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1694 * 2;
  auVar799._8_8_ = 0;
  auVar799._0_8_ = uVar1695;
  auVar1 = auVar10 * auVar798 + auVar1454 + auVar11 * auVar799;
  uVar1678 = auVar1._0_8_;
  auVar1456._8_8_ = 0;
  auVar1456._0_8_ = uVar1678 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar800._8_8_ = 0;
  auVar800._0_8_ = (uVar1678 & 0xfffffffffffff) << 4 | (uVar1683 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar9 * auVar797 + ZEXT816(0x1000003d1) * auVar800;
  uVar1692 = auVar1._0_8_;
  uVar1678 = uVar1692 & 0xfffffffffffff;
  auVar1455._8_8_ = 0;
  auVar1455._0_8_ = uVar1692 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1679 * 2;
  auVar801._8_8_ = 0;
  auVar801._0_8_ = uVar1684;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar1694;
  auVar802._8_8_ = 0;
  auVar802._0_8_ = uVar1680;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1695;
  auVar803._8_8_ = 0;
  auVar803._0_8_ = uVar1695;
  auVar2 = auVar13 * auVar802 + auVar1456 + auVar14 * auVar803;
  uVar1692 = auVar2._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar1692 & 0xfffffffffffff;
  auVar1 = auVar12 * auVar801 + auVar1455 + auVar15 * ZEXT816(0x1000003d10);
  uVar1693 = auVar1._0_8_;
  auVar1458._8_8_ = 0;
  auVar1458._0_8_ = uVar1692 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1692 = uVar1693 & 0xfffffffffffff;
  auVar1457._8_8_ = 0;
  auVar1457._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1679 * 2;
  auVar804._8_8_ = 0;
  auVar804._0_8_ = uVar1694;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1684;
  auVar805._8_8_ = 0;
  auVar805._0_8_ = uVar1684;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1695;
  auVar806._8_8_ = 0;
  auVar806._0_8_ = uVar1680;
  auVar1458 = auVar18 * auVar806 + auVar1458;
  uVar1684 = auVar1458._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1684 & 0xfffffffffffff;
  auVar1 = auVar16 * auVar804 + auVar1457 + auVar17 * auVar805 + auVar19 * ZEXT816(0x1000003d10);
  uVar1694 = auVar1._0_8_;
  uVar1679 = uVar1694 & 0xfffffffffffff;
  auVar1459._8_8_ = 0;
  auVar1459._0_8_ = (uVar1694 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1682 & 0xfffffffffffff);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar1684 >> 0x34 | auVar1458._8_8_ << 0xc;
  auVar1459 = auVar20 * ZEXT816(0x1000003d10) + auVar1459;
  uVar1694 = auVar1459._0_8_;
  uVar1684 = uVar1694 & 0xfffffffffffff;
  uVar1683 = (uVar1694 >> 0x34 | auVar1459._8_8_ << 0xc) + (uVar1683 & 0xffffffffffff);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = a->n[0];
  auVar807._8_8_ = 0;
  auVar807._0_8_ = uVar1684;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = a->n[1];
  auVar808._8_8_ = 0;
  auVar808._0_8_ = uVar1679;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = a->n[2];
  auVar809._8_8_ = 0;
  auVar809._0_8_ = uVar1692;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = a->n[3];
  auVar810._8_8_ = 0;
  auVar810._0_8_ = uVar1678;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = a->n[4];
  auVar811._8_8_ = 0;
  auVar811._0_8_ = uVar1683;
  uVar1694 = SUB168(auVar25 * auVar811,0);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar1694 & 0xfffffffffffff;
  auVar1 = auVar22 * auVar808 + auVar21 * auVar807 + auVar23 * auVar809 + auVar24 * auVar810 +
           auVar26 * ZEXT816(0x1000003d10);
  uVar1680 = auVar1._0_8_;
  auVar1460._8_8_ = 0;
  auVar1460._0_8_ = uVar1680 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = a->n[0];
  auVar812._8_8_ = 0;
  auVar812._0_8_ = uVar1683;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = a->n[1];
  auVar813._8_8_ = 0;
  auVar813._0_8_ = uVar1684;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = a->n[2];
  auVar814._8_8_ = 0;
  auVar814._0_8_ = uVar1679;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = a->n[3];
  auVar815._8_8_ = 0;
  auVar815._0_8_ = uVar1692;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = a->n[4];
  auVar816._8_8_ = 0;
  auVar816._0_8_ = uVar1678;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar1694 >> 0x34 | SUB168(auVar25 * auVar811,8) << 0xc;
  auVar1 = auVar27 * auVar812 + auVar1460 + auVar28 * auVar813 + auVar29 * auVar814 +
           auVar30 * auVar815 + auVar31 * auVar816 + auVar32 * ZEXT816(0x1000003d10);
  uVar1682 = auVar1._0_8_;
  auVar1461._8_8_ = 0;
  auVar1461._0_8_ = uVar1682 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = a->n[0];
  auVar817._8_8_ = 0;
  auVar817._0_8_ = uVar1678;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = a->n[1];
  auVar818._8_8_ = 0;
  auVar818._0_8_ = uVar1683;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = a->n[2];
  auVar819._8_8_ = 0;
  auVar819._0_8_ = uVar1684;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = a->n[3];
  auVar820._8_8_ = 0;
  auVar820._0_8_ = uVar1679;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = a->n[4];
  auVar821._8_8_ = 0;
  auVar821._0_8_ = uVar1692;
  auVar1 = auVar34 * auVar818 + auVar1461 + auVar35 * auVar819 + auVar36 * auVar820 +
           auVar37 * auVar821;
  uVar1694 = auVar1._0_8_;
  auVar1463._8_8_ = 0;
  auVar1463._0_8_ = uVar1694 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar822._8_8_ = 0;
  auVar822._0_8_ = (uVar1694 & 0xfffffffffffff) << 4 | (uVar1682 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar33 * auVar817 + ZEXT816(0x1000003d1) * auVar822;
  uVar1695 = auVar1._0_8_;
  uVar1694 = uVar1695 & 0xfffffffffffff;
  auVar1462._8_8_ = 0;
  auVar1462._0_8_ = uVar1695 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = a->n[0];
  auVar823._8_8_ = 0;
  auVar823._0_8_ = uVar1692;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = a->n[1];
  auVar824._8_8_ = 0;
  auVar824._0_8_ = uVar1678;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = a->n[2];
  auVar825._8_8_ = 0;
  auVar825._0_8_ = uVar1683;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = a->n[3];
  auVar826._8_8_ = 0;
  auVar826._0_8_ = uVar1684;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = a->n[4];
  auVar827._8_8_ = 0;
  auVar827._0_8_ = uVar1679;
  auVar2 = auVar40 * auVar825 + auVar1463 + auVar41 * auVar826 + auVar42 * auVar827;
  uVar1695 = auVar2._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar1695 & 0xfffffffffffff;
  auVar1 = auVar38 * auVar823 + auVar1462 + auVar39 * auVar824 + auVar43 * ZEXT816(0x1000003d10);
  uVar1693 = auVar1._0_8_;
  auVar1465._8_8_ = 0;
  auVar1465._0_8_ = uVar1695 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1695 = uVar1693 & 0xfffffffffffff;
  auVar1464._8_8_ = 0;
  auVar1464._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = a->n[0];
  auVar828._8_8_ = 0;
  auVar828._0_8_ = uVar1679;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = a->n[1];
  auVar829._8_8_ = 0;
  auVar829._0_8_ = uVar1692;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = a->n[2];
  auVar830._8_8_ = 0;
  auVar830._0_8_ = uVar1678;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = a->n[3];
  auVar831._8_8_ = 0;
  auVar831._0_8_ = uVar1683;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = a->n[4];
  auVar832._8_8_ = 0;
  auVar832._0_8_ = uVar1684;
  auVar2 = auVar47 * auVar831 + auVar1465 + auVar48 * auVar832;
  uVar1679 = auVar2._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar1679 & 0xfffffffffffff;
  auVar1 = auVar44 * auVar828 + auVar1464 + auVar45 * auVar829 + auVar46 * auVar830 +
           auVar49 * ZEXT816(0x1000003d10);
  uVar1678 = auVar1._0_8_;
  uVar1684 = uVar1678 & 0xfffffffffffff;
  auVar1466._8_8_ = 0;
  auVar1466._0_8_ = (uVar1678 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1680 & 0xfffffffffffff);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar1679 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1466 = auVar50 * ZEXT816(0x1000003d10) + auVar1466;
  uVar1679 = auVar1466._0_8_;
  uVar1680 = uVar1679 & 0xfffffffffffff;
  uVar1696 = (uVar1679 >> 0x34 | auVar1466._8_8_ << 0xc) + (uVar1682 & 0xffffffffffff);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar1694 * 2;
  auVar833._8_8_ = 0;
  auVar833._0_8_ = uVar1680;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar1695 * 2;
  auVar834._8_8_ = 0;
  auVar834._0_8_ = uVar1684;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar1696;
  auVar835._8_8_ = 0;
  auVar835._0_8_ = uVar1696;
  uVar1678 = SUB168(auVar53 * auVar835,0);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar1678 & 0xfffffffffffff;
  auVar1 = auVar52 * auVar834 + auVar51 * auVar833 + auVar54 * ZEXT816(0x1000003d10);
  uVar1682 = auVar1._0_8_;
  auVar1467._8_8_ = 0;
  auVar1467._0_8_ = uVar1682 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1679 = uVar1696 * 2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar1694;
  auVar836._8_8_ = 0;
  auVar836._0_8_ = uVar1679;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar1695 * 2;
  auVar837._8_8_ = 0;
  auVar837._0_8_ = uVar1680;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar1684;
  auVar838._8_8_ = 0;
  auVar838._0_8_ = uVar1684;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar1678 >> 0x34 | SUB168(auVar53 * auVar835,8) << 0xc;
  auVar1 = auVar55 * auVar836 + auVar1467 + auVar56 * auVar837 + auVar57 * auVar838 +
           auVar58 * ZEXT816(0x1000003d10);
  uVar1683 = auVar1._0_8_;
  auVar1468._8_8_ = 0;
  auVar1468._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar1694;
  auVar839._8_8_ = 0;
  auVar839._0_8_ = uVar1694;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar1695;
  auVar840._8_8_ = 0;
  auVar840._0_8_ = uVar1679;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar1684 * 2;
  auVar841._8_8_ = 0;
  auVar841._0_8_ = uVar1680;
  auVar1 = auVar60 * auVar840 + auVar1468 + auVar61 * auVar841;
  uVar1678 = auVar1._0_8_;
  auVar1470._8_8_ = 0;
  auVar1470._0_8_ = uVar1678 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar842._8_8_ = 0;
  auVar842._0_8_ = (uVar1678 & 0xfffffffffffff) << 4 | (uVar1683 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar59 * auVar839 + ZEXT816(0x1000003d1) * auVar842;
  uVar1692 = auVar1._0_8_;
  uVar1678 = uVar1692 & 0xfffffffffffff;
  auVar1469._8_8_ = 0;
  auVar1469._0_8_ = uVar1692 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar1694 * 2;
  auVar843._8_8_ = 0;
  auVar843._0_8_ = uVar1695;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar1684;
  auVar844._8_8_ = 0;
  auVar844._0_8_ = uVar1679;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar1680;
  auVar845._8_8_ = 0;
  auVar845._0_8_ = uVar1680;
  auVar2 = auVar63 * auVar844 + auVar1470 + auVar64 * auVar845;
  uVar1692 = auVar2._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar1692 & 0xfffffffffffff;
  auVar1 = auVar62 * auVar843 + auVar1469 + auVar65 * ZEXT816(0x1000003d10);
  uVar1693 = auVar1._0_8_;
  auVar1472._8_8_ = 0;
  auVar1472._0_8_ = uVar1692 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1692 = uVar1693 & 0xfffffffffffff;
  auVar1471._8_8_ = 0;
  auVar1471._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar1694 * 2;
  auVar846._8_8_ = 0;
  auVar846._0_8_ = uVar1684;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar1695;
  auVar847._8_8_ = 0;
  auVar847._0_8_ = uVar1695;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar1680;
  auVar848._8_8_ = 0;
  auVar848._0_8_ = uVar1679;
  auVar1472 = auVar68 * auVar848 + auVar1472;
  uVar1693 = auVar1472._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar1693 & 0xfffffffffffff;
  auVar1 = auVar66 * auVar846 + auVar1471 + auVar67 * auVar847 + auVar69 * ZEXT816(0x1000003d10);
  uVar1697 = auVar1._0_8_;
  uVar1679 = uVar1697 & 0xfffffffffffff;
  auVar1473._8_8_ = 0;
  auVar1473._0_8_ = (uVar1697 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1682 & 0xfffffffffffff);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar1693 >> 0x34 | auVar1472._8_8_ << 0xc;
  auVar1473 = auVar70 * ZEXT816(0x1000003d10) + auVar1473;
  uVar1693 = auVar1473._0_8_;
  uVar1682 = uVar1693 & 0xfffffffffffff;
  uVar1698 = (uVar1693 >> 0x34 | auVar1473._8_8_ << 0xc) + (uVar1683 & 0xffffffffffff);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = a->n[0];
  auVar849._8_8_ = 0;
  auVar849._0_8_ = uVar1682;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = a->n[1];
  auVar850._8_8_ = 0;
  auVar850._0_8_ = uVar1679;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = a->n[2];
  auVar851._8_8_ = 0;
  auVar851._0_8_ = uVar1692;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = a->n[3];
  auVar852._8_8_ = 0;
  auVar852._0_8_ = uVar1678;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = a->n[4];
  auVar853._8_8_ = 0;
  auVar853._0_8_ = uVar1698;
  uVar1683 = SUB168(auVar75 * auVar853,0);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar1683 & 0xfffffffffffff;
  auVar1 = auVar72 * auVar850 + auVar71 * auVar849 + auVar73 * auVar851 + auVar74 * auVar852 +
           auVar76 * ZEXT816(0x1000003d10);
  uVar1697 = auVar1._0_8_;
  auVar1474._8_8_ = 0;
  auVar1474._0_8_ = uVar1697 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = a->n[0];
  auVar854._8_8_ = 0;
  auVar854._0_8_ = uVar1698;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = a->n[1];
  auVar855._8_8_ = 0;
  auVar855._0_8_ = uVar1682;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = a->n[2];
  auVar856._8_8_ = 0;
  auVar856._0_8_ = uVar1679;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = a->n[3];
  auVar857._8_8_ = 0;
  auVar857._0_8_ = uVar1692;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = a->n[4];
  auVar858._8_8_ = 0;
  auVar858._0_8_ = uVar1678;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar1683 >> 0x34 | SUB168(auVar75 * auVar853,8) << 0xc;
  auVar1 = auVar77 * auVar854 + auVar1474 + auVar78 * auVar855 + auVar79 * auVar856 +
           auVar80 * auVar857 + auVar81 * auVar858 + auVar82 * ZEXT816(0x1000003d10);
  uVar1681 = auVar1._0_8_;
  auVar1475._8_8_ = 0;
  auVar1475._0_8_ = uVar1681 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = a->n[0];
  auVar859._8_8_ = 0;
  auVar859._0_8_ = uVar1678;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = a->n[1];
  auVar860._8_8_ = 0;
  auVar860._0_8_ = uVar1698;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = a->n[2];
  auVar861._8_8_ = 0;
  auVar861._0_8_ = uVar1682;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = a->n[3];
  auVar862._8_8_ = 0;
  auVar862._0_8_ = uVar1679;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = a->n[4];
  auVar863._8_8_ = 0;
  auVar863._0_8_ = uVar1692;
  auVar1 = auVar84 * auVar860 + auVar1475 + auVar85 * auVar861 + auVar86 * auVar862 +
           auVar87 * auVar863;
  uVar1683 = auVar1._0_8_;
  auVar1477._8_8_ = 0;
  auVar1477._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar864._8_8_ = 0;
  auVar864._0_8_ = (uVar1683 & 0xfffffffffffff) << 4 | (uVar1681 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar83 * auVar859 + ZEXT816(0x1000003d1) * auVar864;
  uVar1693 = auVar1._0_8_;
  uVar1683 = uVar1693 & 0xfffffffffffff;
  auVar1476._8_8_ = 0;
  auVar1476._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = a->n[0];
  auVar865._8_8_ = 0;
  auVar865._0_8_ = uVar1692;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = a->n[1];
  auVar866._8_8_ = 0;
  auVar866._0_8_ = uVar1678;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = a->n[2];
  auVar867._8_8_ = 0;
  auVar867._0_8_ = uVar1698;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = a->n[3];
  auVar868._8_8_ = 0;
  auVar868._0_8_ = uVar1682;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = a->n[4];
  auVar869._8_8_ = 0;
  auVar869._0_8_ = uVar1679;
  auVar2 = auVar90 * auVar867 + auVar1477 + auVar91 * auVar868 + auVar92 * auVar869;
  uVar1693 = auVar2._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar1693 & 0xfffffffffffff;
  auVar1 = auVar88 * auVar865 + auVar1476 + auVar89 * auVar866 + auVar93 * ZEXT816(0x1000003d10);
  uVar1699 = auVar1._0_8_;
  auVar1479._8_8_ = 0;
  auVar1479._0_8_ = uVar1693 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1693 = uVar1699 & 0xfffffffffffff;
  auVar1478._8_8_ = 0;
  auVar1478._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = a->n[0];
  auVar870._8_8_ = 0;
  auVar870._0_8_ = uVar1679;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = a->n[1];
  auVar871._8_8_ = 0;
  auVar871._0_8_ = uVar1692;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = a->n[2];
  auVar872._8_8_ = 0;
  auVar872._0_8_ = uVar1678;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = a->n[3];
  auVar873._8_8_ = 0;
  auVar873._0_8_ = uVar1698;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = a->n[4];
  auVar874._8_8_ = 0;
  auVar874._0_8_ = uVar1682;
  auVar2 = auVar97 * auVar873 + auVar1479 + auVar98 * auVar874;
  uVar1678 = auVar2._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar1678 & 0xfffffffffffff;
  auVar1 = auVar94 * auVar870 + auVar1478 + auVar95 * auVar871 + auVar96 * auVar872 +
           auVar99 * ZEXT816(0x1000003d10);
  uVar1692 = auVar1._0_8_;
  uVar1679 = uVar1692 & 0xfffffffffffff;
  auVar1480._8_8_ = 0;
  auVar1480._0_8_ = (uVar1692 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1697 & 0xfffffffffffff);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar1678 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1480 = auVar100 * ZEXT816(0x1000003d10) + auVar1480;
  uVar1692 = auVar1480._0_8_;
  uVar1678 = uVar1692 & 0xfffffffffffff;
  uVar1692 = (uVar1692 >> 0x34 | auVar1480._8_8_ << 0xc) + (uVar1681 & 0xffffffffffff);
  iVar1691 = 3;
  local_d8 = uVar1683;
  uStack_d0 = uVar1693;
  local_c8 = uVar1679;
  uStack_c0 = uVar1678;
  local_b8 = uVar1692;
  do {
    auVar101._8_8_ = 0;
    auVar101._0_8_ = local_d8 * 2;
    auVar875._8_8_ = 0;
    auVar875._0_8_ = uStack_c0;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uStack_d0 * 2;
    auVar876._8_8_ = 0;
    auVar876._0_8_ = local_c8;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = local_b8;
    auVar877._8_8_ = 0;
    auVar877._0_8_ = local_b8;
    uVar1682 = SUB168(auVar103 * auVar877,0);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar1682 & 0xfffffffffffff;
    auVar1 = auVar102 * auVar876 + auVar101 * auVar875 + auVar104 * ZEXT816(0x1000003d10);
    uVar1681 = auVar1._0_8_;
    auVar1481._8_8_ = 0;
    auVar1481._0_8_ = uVar1681 >> 0x34 | auVar1._8_8_ << 0xc;
    local_b8 = local_b8 * 2;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = local_d8;
    auVar878._8_8_ = 0;
    auVar878._0_8_ = local_b8;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uStack_d0 * 2;
    auVar879._8_8_ = 0;
    auVar879._0_8_ = uStack_c0;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = local_c8;
    auVar880._8_8_ = 0;
    auVar880._0_8_ = local_c8;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar1682 >> 0x34 | SUB168(auVar103 * auVar877,8) << 0xc;
    auVar1 = auVar105 * auVar878 + auVar1481 + auVar106 * auVar879 + auVar107 * auVar880 +
             auVar108 * ZEXT816(0x1000003d10);
    uVar1698 = auVar1._0_8_;
    auVar1482._8_8_ = 0;
    auVar1482._0_8_ = uVar1698 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = local_d8;
    auVar881._8_8_ = 0;
    auVar881._0_8_ = local_d8;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uStack_d0;
    auVar882._8_8_ = 0;
    auVar882._0_8_ = local_b8;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = local_c8 * 2;
    auVar883._8_8_ = 0;
    auVar883._0_8_ = uStack_c0;
    auVar1 = auVar110 * auVar882 + auVar1482 + auVar111 * auVar883;
    uVar1682 = auVar1._0_8_;
    auVar1484._8_8_ = 0;
    auVar1484._0_8_ = uVar1682 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar884._8_8_ = 0;
    auVar884._0_8_ = (uVar1682 & 0xfffffffffffff) << 4 | (uVar1698 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar109 * auVar881 + ZEXT816(0x1000003d1) * auVar884;
    uVar1697 = auVar1._0_8_;
    uVar1682 = uVar1697 & 0xfffffffffffff;
    auVar1483._8_8_ = 0;
    auVar1483._0_8_ = uVar1697 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_d8 * 2;
    auVar885._8_8_ = 0;
    auVar885._0_8_ = uStack_d0;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = local_c8;
    auVar886._8_8_ = 0;
    auVar886._0_8_ = local_b8;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uStack_c0;
    auVar887._8_8_ = 0;
    auVar887._0_8_ = uStack_c0;
    auVar2 = auVar113 * auVar886 + auVar1484 + auVar114 * auVar887;
    uVar1697 = auVar2._0_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar1697 & 0xfffffffffffff;
    auVar1 = auVar112 * auVar885 + auVar1483 + auVar115 * ZEXT816(0x1000003d10);
    uVar1699 = auVar1._0_8_;
    auVar1486._8_8_ = 0;
    auVar1486._0_8_ = uVar1697 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1697 = uVar1699 & 0xfffffffffffff;
    auVar1485._8_8_ = 0;
    auVar1485._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_d8 * 2;
    auVar888._8_8_ = 0;
    auVar888._0_8_ = local_c8;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uStack_d0;
    auVar889._8_8_ = 0;
    auVar889._0_8_ = uStack_d0;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uStack_c0;
    auVar890._8_8_ = 0;
    auVar890._0_8_ = local_b8;
    auVar1486 = auVar118 * auVar890 + auVar1486;
    uVar1699 = auVar1486._0_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar1699 & 0xfffffffffffff;
    auVar1 = auVar116 * auVar888 + auVar1485 + auVar117 * auVar889 +
             auVar119 * ZEXT816(0x1000003d10);
    uVar1700 = auVar1._0_8_;
    local_c8 = uVar1700 & 0xfffffffffffff;
    auVar1487._8_8_ = 0;
    auVar1487._0_8_ = (uVar1700 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1681 & 0xfffffffffffff);
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar1699 >> 0x34 | auVar1486._8_8_ << 0xc;
    auVar1487 = auVar120 * ZEXT816(0x1000003d10) + auVar1487;
    uVar1681 = auVar1487._0_8_;
    uStack_c0 = uVar1681 & 0xfffffffffffff;
    local_b8 = (uVar1681 >> 0x34 | auVar1487._8_8_ << 0xc) + (uVar1698 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_d8 = uVar1682;
    uStack_d0 = uVar1697;
  } while (iVar1691 != 0);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar1683;
  auVar891._8_8_ = 0;
  auVar891._0_8_ = uStack_c0;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar1693;
  auVar892._8_8_ = 0;
  auVar892._0_8_ = local_c8;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar1679;
  auVar893._8_8_ = 0;
  auVar893._0_8_ = uVar1697;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar1678;
  auVar894._8_8_ = 0;
  auVar894._0_8_ = uVar1682;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar1692;
  auVar895._8_8_ = 0;
  auVar895._0_8_ = local_b8;
  uVar1681 = SUB168(auVar125 * auVar895,0);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar1681 & 0xfffffffffffff;
  auVar1 = auVar122 * auVar892 + auVar121 * auVar891 + auVar123 * auVar893 + auVar124 * auVar894 +
           auVar126 * ZEXT816(0x1000003d10);
  uVar1698 = auVar1._0_8_;
  auVar1488._8_8_ = 0;
  auVar1488._0_8_ = uVar1698 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar1683;
  auVar896._8_8_ = 0;
  auVar896._0_8_ = local_b8;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar1693;
  auVar897._8_8_ = 0;
  auVar897._0_8_ = uStack_c0;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar1679;
  auVar898._8_8_ = 0;
  auVar898._0_8_ = local_c8;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar1678;
  auVar899._8_8_ = 0;
  auVar899._0_8_ = uVar1697;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar1692;
  auVar900._8_8_ = 0;
  auVar900._0_8_ = uVar1682;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar1681 >> 0x34 | SUB168(auVar125 * auVar895,8) << 0xc;
  auVar1 = auVar127 * auVar896 + auVar1488 + auVar128 * auVar897 + auVar129 * auVar898 +
           auVar130 * auVar899 + auVar131 * auVar900 + auVar132 * ZEXT816(0x1000003d10);
  uVar1681 = auVar1._0_8_;
  auVar1489._8_8_ = 0;
  auVar1489._0_8_ = uVar1681 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar1683;
  auVar901._8_8_ = 0;
  auVar901._0_8_ = uVar1682;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar1693;
  auVar902._8_8_ = 0;
  auVar902._0_8_ = local_b8;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar1679;
  auVar903._8_8_ = 0;
  auVar903._0_8_ = uStack_c0;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar1678;
  auVar904._8_8_ = 0;
  auVar904._0_8_ = local_c8;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar1692;
  auVar905._8_8_ = 0;
  auVar905._0_8_ = uVar1697;
  auVar1 = auVar134 * auVar902 + auVar1489 + auVar135 * auVar903 + auVar136 * auVar904 +
           auVar137 * auVar905;
  uVar1699 = auVar1._0_8_;
  auVar1491._8_8_ = 0;
  auVar1491._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar906._8_8_ = 0;
  auVar906._0_8_ = (uVar1699 & 0xfffffffffffff) << 4 | (uVar1681 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar133 * auVar901 + ZEXT816(0x1000003d1) * auVar906;
  uVar1700 = auVar1._0_8_;
  auVar1490._8_8_ = 0;
  auVar1490._0_8_ = uVar1700 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar1683;
  auVar907._8_8_ = 0;
  auVar907._0_8_ = uVar1697;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar1693;
  auVar908._8_8_ = 0;
  auVar908._0_8_ = uVar1682;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar1679;
  auVar909._8_8_ = 0;
  auVar909._0_8_ = local_b8;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar1678;
  auVar910._8_8_ = 0;
  auVar910._0_8_ = uStack_c0;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar1692;
  auVar911._8_8_ = 0;
  auVar911._0_8_ = local_c8;
  auVar2 = auVar140 * auVar909 + auVar1491 + auVar141 * auVar910 + auVar142 * auVar911;
  uVar1699 = auVar2._0_8_;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar1699 & 0xfffffffffffff;
  auVar1 = auVar138 * auVar907 + auVar1490 + auVar139 * auVar908 + auVar143 * ZEXT816(0x1000003d10);
  uVar1701 = auVar1._0_8_;
  auVar1493._8_8_ = 0;
  auVar1493._0_8_ = uVar1699 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1492._8_8_ = 0;
  auVar1492._0_8_ = uVar1701 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar1683;
  auVar912._8_8_ = 0;
  auVar912._0_8_ = local_c8;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar1693;
  auVar913._8_8_ = 0;
  auVar913._0_8_ = uVar1697;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar1679;
  auVar914._8_8_ = 0;
  auVar914._0_8_ = uVar1682;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar1678;
  auVar915._8_8_ = 0;
  auVar915._0_8_ = local_b8;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar1692;
  auVar916._8_8_ = 0;
  auVar916._0_8_ = uStack_c0;
  auVar2 = auVar147 * auVar915 + auVar1493 + auVar148 * auVar916;
  uVar1682 = auVar2._0_8_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar1682 & 0xfffffffffffff;
  auVar1 = auVar144 * auVar912 + auVar1492 + auVar145 * auVar913 + auVar146 * auVar914 +
           auVar149 * ZEXT816(0x1000003d10);
  uVar1697 = auVar1._0_8_;
  local_128 = uVar1697 & 0xfffffffffffff;
  auVar1494._8_8_ = 0;
  auVar1494._0_8_ = (uVar1697 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1698 & 0xfffffffffffff);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar1682 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1494 = auVar150 * ZEXT816(0x1000003d10) + auVar1494;
  uVar1682 = auVar1494._0_8_;
  uStack_120 = uVar1682 & 0xfffffffffffff;
  local_118 = (uVar1682 >> 0x34 | auVar1494._8_8_ << 0xc) + (uVar1681 & 0xffffffffffff);
  iVar1691 = 3;
  local_138 = uVar1700 & 0xfffffffffffff;
  uStack_130 = uVar1701 & 0xfffffffffffff;
  do {
    auVar151._8_8_ = 0;
    auVar151._0_8_ = local_138 * 2;
    auVar917._8_8_ = 0;
    auVar917._0_8_ = uStack_120;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uStack_130 * 2;
    auVar918._8_8_ = 0;
    auVar918._0_8_ = local_128;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = local_118;
    auVar919._8_8_ = 0;
    auVar919._0_8_ = local_118;
    uVar1682 = SUB168(auVar153 * auVar919,0);
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar1682 & 0xfffffffffffff;
    auVar1 = auVar152 * auVar918 + auVar151 * auVar917 + auVar154 * ZEXT816(0x1000003d10);
    uVar1681 = auVar1._0_8_;
    auVar1495._8_8_ = 0;
    auVar1495._0_8_ = uVar1681 >> 0x34 | auVar1._8_8_ << 0xc;
    local_118 = local_118 * 2;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = local_138;
    auVar920._8_8_ = 0;
    auVar920._0_8_ = local_118;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uStack_130 * 2;
    auVar921._8_8_ = 0;
    auVar921._0_8_ = uStack_120;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = local_128;
    auVar922._8_8_ = 0;
    auVar922._0_8_ = local_128;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar1682 >> 0x34 | SUB168(auVar153 * auVar919,8) << 0xc;
    auVar1 = auVar155 * auVar920 + auVar1495 + auVar156 * auVar921 + auVar157 * auVar922 +
             auVar158 * ZEXT816(0x1000003d10);
    uVar1698 = auVar1._0_8_;
    auVar1496._8_8_ = 0;
    auVar1496._0_8_ = uVar1698 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = local_138;
    auVar923._8_8_ = 0;
    auVar923._0_8_ = local_138;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uStack_130;
    auVar924._8_8_ = 0;
    auVar924._0_8_ = local_118;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = local_128 * 2;
    auVar925._8_8_ = 0;
    auVar925._0_8_ = uStack_120;
    auVar1 = auVar160 * auVar924 + auVar1496 + auVar161 * auVar925;
    uVar1682 = auVar1._0_8_;
    auVar1498._8_8_ = 0;
    auVar1498._0_8_ = uVar1682 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar926._8_8_ = 0;
    auVar926._0_8_ = (uVar1682 & 0xfffffffffffff) << 4 | (uVar1698 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar159 * auVar923 + ZEXT816(0x1000003d1) * auVar926;
    uVar1697 = auVar1._0_8_;
    uVar1682 = uVar1697 & 0xfffffffffffff;
    auVar1497._8_8_ = 0;
    auVar1497._0_8_ = uVar1697 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = local_138 * 2;
    auVar927._8_8_ = 0;
    auVar927._0_8_ = uStack_130;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = local_128;
    auVar928._8_8_ = 0;
    auVar928._0_8_ = local_118;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uStack_120;
    auVar929._8_8_ = 0;
    auVar929._0_8_ = uStack_120;
    auVar2 = auVar163 * auVar928 + auVar1498 + auVar164 * auVar929;
    uVar1697 = auVar2._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar1697 & 0xfffffffffffff;
    auVar1 = auVar162 * auVar927 + auVar1497 + auVar165 * ZEXT816(0x1000003d10);
    uVar1699 = auVar1._0_8_;
    auVar1500._8_8_ = 0;
    auVar1500._0_8_ = uVar1697 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1697 = uVar1699 & 0xfffffffffffff;
    auVar1499._8_8_ = 0;
    auVar1499._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = local_138 * 2;
    auVar930._8_8_ = 0;
    auVar930._0_8_ = local_128;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uStack_130;
    auVar931._8_8_ = 0;
    auVar931._0_8_ = uStack_130;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uStack_120;
    auVar932._8_8_ = 0;
    auVar932._0_8_ = local_118;
    auVar1500 = auVar168 * auVar932 + auVar1500;
    uVar1699 = auVar1500._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar1699 & 0xfffffffffffff;
    auVar1 = auVar166 * auVar930 + auVar1499 + auVar167 * auVar931 +
             auVar169 * ZEXT816(0x1000003d10);
    uVar1700 = auVar1._0_8_;
    local_128 = uVar1700 & 0xfffffffffffff;
    auVar1501._8_8_ = 0;
    auVar1501._0_8_ = (uVar1700 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1681 & 0xfffffffffffff);
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar1699 >> 0x34 | auVar1500._8_8_ << 0xc;
    auVar1501 = auVar170 * ZEXT816(0x1000003d10) + auVar1501;
    uVar1681 = auVar1501._0_8_;
    uStack_120 = uVar1681 & 0xfffffffffffff;
    local_118 = (uVar1681 >> 0x34 | auVar1501._8_8_ << 0xc) + (uVar1698 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_138 = uVar1682;
    uStack_130 = uVar1697;
  } while (iVar1691 != 0);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar1683;
  auVar933._8_8_ = 0;
  auVar933._0_8_ = uStack_120;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar1693;
  auVar934._8_8_ = 0;
  auVar934._0_8_ = local_128;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar1679;
  auVar935._8_8_ = 0;
  auVar935._0_8_ = uVar1697;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar1678;
  auVar936._8_8_ = 0;
  auVar936._0_8_ = uVar1682;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar1692;
  auVar937._8_8_ = 0;
  auVar937._0_8_ = local_118;
  uVar1681 = SUB168(auVar175 * auVar937,0);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar1681 & 0xfffffffffffff;
  auVar1 = auVar172 * auVar934 + auVar171 * auVar933 + auVar173 * auVar935 + auVar174 * auVar936 +
           auVar176 * ZEXT816(0x1000003d10);
  uVar1699 = auVar1._0_8_;
  auVar1502._8_8_ = 0;
  auVar1502._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar1683;
  auVar938._8_8_ = 0;
  auVar938._0_8_ = local_118;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar1693;
  auVar939._8_8_ = 0;
  auVar939._0_8_ = uStack_120;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar1679;
  auVar940._8_8_ = 0;
  auVar940._0_8_ = local_128;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar1678;
  auVar941._8_8_ = 0;
  auVar941._0_8_ = uVar1697;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar1692;
  auVar942._8_8_ = 0;
  auVar942._0_8_ = uVar1682;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar1681 >> 0x34 | SUB168(auVar175 * auVar937,8) << 0xc;
  auVar1 = auVar177 * auVar938 + auVar1502 + auVar178 * auVar939 + auVar179 * auVar940 +
           auVar180 * auVar941 + auVar181 * auVar942 + auVar182 * ZEXT816(0x1000003d10);
  uVar1700 = auVar1._0_8_;
  auVar1503._8_8_ = 0;
  auVar1503._0_8_ = uVar1700 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar1683;
  auVar943._8_8_ = 0;
  auVar943._0_8_ = uVar1682;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar1693;
  auVar944._8_8_ = 0;
  auVar944._0_8_ = local_118;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar1679;
  auVar945._8_8_ = 0;
  auVar945._0_8_ = uStack_120;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar1678;
  auVar946._8_8_ = 0;
  auVar946._0_8_ = local_128;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar1692;
  auVar947._8_8_ = 0;
  auVar947._0_8_ = uVar1697;
  auVar1 = auVar184 * auVar944 + auVar1503 + auVar185 * auVar945 + auVar186 * auVar946 +
           auVar187 * auVar947;
  uVar1681 = auVar1._0_8_;
  auVar1505._8_8_ = 0;
  auVar1505._0_8_ = uVar1681 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar948._8_8_ = 0;
  auVar948._0_8_ = (uVar1681 & 0xfffffffffffff) << 4 | (uVar1700 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar183 * auVar943 + ZEXT816(0x1000003d1) * auVar948;
  uVar1698 = auVar1._0_8_;
  uVar1681 = uVar1698 & 0xfffffffffffff;
  auVar1504._8_8_ = 0;
  auVar1504._0_8_ = uVar1698 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar1683;
  auVar949._8_8_ = 0;
  auVar949._0_8_ = uVar1697;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar1693;
  auVar950._8_8_ = 0;
  auVar950._0_8_ = uVar1682;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar1679;
  auVar951._8_8_ = 0;
  auVar951._0_8_ = local_118;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar1678;
  auVar952._8_8_ = 0;
  auVar952._0_8_ = uStack_120;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar1692;
  auVar953._8_8_ = 0;
  auVar953._0_8_ = local_128;
  auVar2 = auVar190 * auVar951 + auVar1505 + auVar191 * auVar952 + auVar192 * auVar953;
  uVar1698 = auVar2._0_8_;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar1698 & 0xfffffffffffff;
  auVar1 = auVar188 * auVar949 + auVar1504 + auVar189 * auVar950 + auVar193 * ZEXT816(0x1000003d10);
  uVar1701 = auVar1._0_8_;
  auVar1507._8_8_ = 0;
  auVar1507._0_8_ = uVar1698 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1698 = uVar1701 & 0xfffffffffffff;
  auVar1506._8_8_ = 0;
  auVar1506._0_8_ = uVar1701 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar1683;
  auVar954._8_8_ = 0;
  auVar954._0_8_ = local_128;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar1693;
  auVar955._8_8_ = 0;
  auVar955._0_8_ = uVar1697;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar1679;
  auVar956._8_8_ = 0;
  auVar956._0_8_ = uVar1682;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar1678;
  auVar957._8_8_ = 0;
  auVar957._0_8_ = local_118;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar1692;
  auVar958._8_8_ = 0;
  auVar958._0_8_ = uStack_120;
  auVar2 = auVar197 * auVar957 + auVar1507 + auVar198 * auVar958;
  uVar1682 = auVar2._0_8_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar1682 & 0xfffffffffffff;
  auVar1 = auVar194 * auVar954 + auVar1506 + auVar195 * auVar955 + auVar196 * auVar956 +
           auVar199 * ZEXT816(0x1000003d10);
  uVar1701 = auVar1._0_8_;
  uVar1697 = uVar1701 & 0xfffffffffffff;
  auVar1508._8_8_ = 0;
  auVar1508._0_8_ = (uVar1701 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1699 & 0xfffffffffffff);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar1682 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1508 = auVar200 * ZEXT816(0x1000003d10) + auVar1508;
  uVar1682 = auVar1508._0_8_;
  uVar1699 = uVar1682 & 0xfffffffffffff;
  uVar1682 = (uVar1682 >> 0x34 | auVar1508._8_8_ << 0xc) + (uVar1700 & 0xffffffffffff);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar1681 * 2;
  auVar959._8_8_ = 0;
  auVar959._0_8_ = uVar1699;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar1698 * 2;
  auVar960._8_8_ = 0;
  auVar960._0_8_ = uVar1697;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar1682;
  auVar961._8_8_ = 0;
  auVar961._0_8_ = uVar1682;
  uVar1700 = SUB168(auVar203 * auVar961,0);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar1700 & 0xfffffffffffff;
  auVar1 = auVar202 * auVar960 + auVar201 * auVar959 + auVar204 * ZEXT816(0x1000003d10);
  uVar1685 = auVar1._0_8_;
  auVar1509._8_8_ = 0;
  auVar1509._0_8_ = uVar1685 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1682 = uVar1682 * 2;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar1681;
  auVar962._8_8_ = 0;
  auVar962._0_8_ = uVar1682;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar1698 * 2;
  auVar963._8_8_ = 0;
  auVar963._0_8_ = uVar1699;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar1697;
  auVar964._8_8_ = 0;
  auVar964._0_8_ = uVar1697;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar1700 >> 0x34 | SUB168(auVar203 * auVar961,8) << 0xc;
  auVar1 = auVar205 * auVar962 + auVar1509 + auVar206 * auVar963 + auVar207 * auVar964 +
           auVar208 * ZEXT816(0x1000003d10);
  uVar1686 = auVar1._0_8_;
  auVar1510._8_8_ = 0;
  auVar1510._0_8_ = uVar1686 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar1681;
  auVar965._8_8_ = 0;
  auVar965._0_8_ = uVar1681;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar1698;
  auVar966._8_8_ = 0;
  auVar966._0_8_ = uVar1682;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar1697 * 2;
  auVar967._8_8_ = 0;
  auVar967._0_8_ = uVar1699;
  auVar1 = auVar210 * auVar966 + auVar1510 + auVar211 * auVar967;
  uVar1700 = auVar1._0_8_;
  auVar1512._8_8_ = 0;
  auVar1512._0_8_ = uVar1700 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar968._8_8_ = 0;
  auVar968._0_8_ = (uVar1700 & 0xfffffffffffff) << 4 | (uVar1686 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar209 * auVar965 + ZEXT816(0x1000003d1) * auVar968;
  uVar1701 = auVar1._0_8_;
  uVar1700 = uVar1701 & 0xfffffffffffff;
  auVar1511._8_8_ = 0;
  auVar1511._0_8_ = uVar1701 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar1681 * 2;
  auVar969._8_8_ = 0;
  auVar969._0_8_ = uVar1698;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar1697;
  auVar970._8_8_ = 0;
  auVar970._0_8_ = uVar1682;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar1699;
  auVar971._8_8_ = 0;
  auVar971._0_8_ = uVar1699;
  auVar2 = auVar213 * auVar970 + auVar1512 + auVar214 * auVar971;
  uVar1701 = auVar2._0_8_;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar1701 & 0xfffffffffffff;
  auVar1 = auVar212 * auVar969 + auVar1511 + auVar215 * ZEXT816(0x1000003d10);
  uVar1702 = auVar1._0_8_;
  auVar1514._8_8_ = 0;
  auVar1514._0_8_ = uVar1701 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1701 = uVar1702 & 0xfffffffffffff;
  auVar1513._8_8_ = 0;
  auVar1513._0_8_ = uVar1702 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar1681 * 2;
  auVar972._8_8_ = 0;
  auVar972._0_8_ = uVar1697;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar1698;
  auVar973._8_8_ = 0;
  auVar973._0_8_ = uVar1698;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar1699;
  auVar974._8_8_ = 0;
  auVar974._0_8_ = uVar1682;
  auVar1514 = auVar218 * auVar974 + auVar1514;
  uVar1682 = auVar1514._0_8_;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar1682 & 0xfffffffffffff;
  auVar1 = auVar216 * auVar972 + auVar1513 + auVar217 * auVar973 + auVar219 * ZEXT816(0x1000003d10);
  uVar1681 = auVar1._0_8_;
  uVar1697 = uVar1681 & 0xfffffffffffff;
  auVar1515._8_8_ = 0;
  auVar1515._0_8_ = (uVar1681 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1685 & 0xfffffffffffff);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar1682 >> 0x34 | auVar1514._8_8_ << 0xc;
  auVar1515 = auVar220 * ZEXT816(0x1000003d10) + auVar1515;
  uVar1682 = auVar1515._0_8_;
  uVar1681 = uVar1682 & 0xfffffffffffff;
  uVar1682 = (uVar1682 >> 0x34 | auVar1515._8_8_ << 0xc) + (uVar1686 & 0xffffffffffff);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar1700 * 2;
  auVar975._8_8_ = 0;
  auVar975._0_8_ = uVar1681;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar1701 * 2;
  auVar976._8_8_ = 0;
  auVar976._0_8_ = uVar1697;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar1682;
  auVar977._8_8_ = 0;
  auVar977._0_8_ = uVar1682;
  uVar1698 = SUB168(auVar223 * auVar977,0);
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar1698 & 0xfffffffffffff;
  auVar1 = auVar222 * auVar976 + auVar221 * auVar975 + auVar224 * ZEXT816(0x1000003d10);
  uVar1685 = auVar1._0_8_;
  auVar1516._8_8_ = 0;
  auVar1516._0_8_ = uVar1685 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1682 = uVar1682 * 2;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar1700;
  auVar978._8_8_ = 0;
  auVar978._0_8_ = uVar1682;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar1701 * 2;
  auVar979._8_8_ = 0;
  auVar979._0_8_ = uVar1681;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar1697;
  auVar980._8_8_ = 0;
  auVar980._0_8_ = uVar1697;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar1698 >> 0x34 | SUB168(auVar223 * auVar977,8) << 0xc;
  auVar1 = auVar225 * auVar978 + auVar1516 + auVar226 * auVar979 + auVar227 * auVar980 +
           auVar228 * ZEXT816(0x1000003d10);
  uVar1686 = auVar1._0_8_;
  auVar1517._8_8_ = 0;
  auVar1517._0_8_ = uVar1686 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar1700;
  auVar981._8_8_ = 0;
  auVar981._0_8_ = uVar1700;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar1701;
  auVar982._8_8_ = 0;
  auVar982._0_8_ = uVar1682;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar1697 * 2;
  auVar983._8_8_ = 0;
  auVar983._0_8_ = uVar1681;
  auVar1 = auVar230 * auVar982 + auVar1517 + auVar231 * auVar983;
  uVar1698 = auVar1._0_8_;
  auVar1519._8_8_ = 0;
  auVar1519._0_8_ = uVar1698 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar984._8_8_ = 0;
  auVar984._0_8_ = (uVar1698 & 0xfffffffffffff) << 4 | (uVar1686 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar229 * auVar981 + ZEXT816(0x1000003d1) * auVar984;
  uVar1699 = auVar1._0_8_;
  uVar1698 = uVar1699 & 0xfffffffffffff;
  auVar1518._8_8_ = 0;
  auVar1518._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar1700 * 2;
  auVar985._8_8_ = 0;
  auVar985._0_8_ = uVar1701;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar1697;
  auVar986._8_8_ = 0;
  auVar986._0_8_ = uVar1682;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar1681;
  auVar987._8_8_ = 0;
  auVar987._0_8_ = uVar1681;
  auVar2 = auVar233 * auVar986 + auVar1519 + auVar234 * auVar987;
  uVar1699 = auVar2._0_8_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar1699 & 0xfffffffffffff;
  auVar1 = auVar232 * auVar985 + auVar1518 + auVar235 * ZEXT816(0x1000003d10);
  uVar1702 = auVar1._0_8_;
  auVar1521._8_8_ = 0;
  auVar1521._0_8_ = uVar1699 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1699 = uVar1702 & 0xfffffffffffff;
  auVar1520._8_8_ = 0;
  auVar1520._0_8_ = uVar1702 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar1700 * 2;
  auVar988._8_8_ = 0;
  auVar988._0_8_ = uVar1697;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar1701;
  auVar989._8_8_ = 0;
  auVar989._0_8_ = uVar1701;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar1681;
  auVar990._8_8_ = 0;
  auVar990._0_8_ = uVar1682;
  auVar1521 = auVar238 * auVar990 + auVar1521;
  uVar1697 = auVar1521._0_8_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar1697 & 0xfffffffffffff;
  auVar1 = auVar236 * auVar988 + auVar1520 + auVar237 * auVar989 + auVar239 * ZEXT816(0x1000003d10);
  uVar1681 = auVar1._0_8_;
  uVar1682 = uVar1681 & 0xfffffffffffff;
  auVar1522._8_8_ = 0;
  auVar1522._0_8_ = (uVar1681 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1685 & 0xfffffffffffff);
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar1697 >> 0x34 | auVar1521._8_8_ << 0xc;
  auVar1522 = auVar240 * ZEXT816(0x1000003d10) + auVar1522;
  uVar1681 = auVar1522._0_8_;
  uVar1697 = uVar1681 & 0xfffffffffffff;
  uVar1686 = (uVar1681 >> 0x34 | auVar1522._8_8_ << 0xc) + (uVar1686 & 0xffffffffffff);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar1694;
  auVar991._8_8_ = 0;
  auVar991._0_8_ = uVar1697;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar1695;
  auVar992._8_8_ = 0;
  auVar992._0_8_ = uVar1682;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar1684;
  auVar993._8_8_ = 0;
  auVar993._0_8_ = uVar1699;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar1680;
  auVar994._8_8_ = 0;
  auVar994._0_8_ = uVar1698;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar1696;
  auVar995._8_8_ = 0;
  auVar995._0_8_ = uVar1686;
  uVar1681 = SUB168(auVar245 * auVar995,0);
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar1681 & 0xfffffffffffff;
  auVar1 = auVar242 * auVar992 + auVar241 * auVar991 + auVar243 * auVar993 + auVar244 * auVar994 +
           auVar246 * ZEXT816(0x1000003d10);
  uVar1701 = auVar1._0_8_;
  auVar1523._8_8_ = 0;
  auVar1523._0_8_ = uVar1701 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar1694;
  auVar996._8_8_ = 0;
  auVar996._0_8_ = uVar1686;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar1695;
  auVar997._8_8_ = 0;
  auVar997._0_8_ = uVar1697;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar1684;
  auVar998._8_8_ = 0;
  auVar998._0_8_ = uVar1682;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar1680;
  auVar999._8_8_ = 0;
  auVar999._0_8_ = uVar1699;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar1696;
  auVar1000._8_8_ = 0;
  auVar1000._0_8_ = uVar1698;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar1681 >> 0x34 | SUB168(auVar245 * auVar995,8) << 0xc;
  auVar1 = auVar247 * auVar996 + auVar1523 + auVar248 * auVar997 + auVar249 * auVar998 +
           auVar250 * auVar999 + auVar251 * auVar1000 + auVar252 * ZEXT816(0x1000003d10);
  uVar1685 = auVar1._0_8_;
  auVar1524._8_8_ = 0;
  auVar1524._0_8_ = uVar1685 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar1694;
  auVar1001._8_8_ = 0;
  auVar1001._0_8_ = uVar1698;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar1695;
  auVar1002._8_8_ = 0;
  auVar1002._0_8_ = uVar1686;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar1684;
  auVar1003._8_8_ = 0;
  auVar1003._0_8_ = uVar1697;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar1680;
  auVar1004._8_8_ = 0;
  auVar1004._0_8_ = uVar1682;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar1696;
  auVar1005._8_8_ = 0;
  auVar1005._0_8_ = uVar1699;
  auVar1 = auVar254 * auVar1002 + auVar1524 + auVar255 * auVar1003 + auVar256 * auVar1004 +
           auVar257 * auVar1005;
  uVar1681 = auVar1._0_8_;
  auVar1526._8_8_ = 0;
  auVar1526._0_8_ = uVar1681 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1006._8_8_ = 0;
  auVar1006._0_8_ = (uVar1681 & 0xfffffffffffff) << 4 | (uVar1685 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar253 * auVar1001 + ZEXT816(0x1000003d1) * auVar1006;
  uVar1700 = auVar1._0_8_;
  uVar1681 = uVar1700 & 0xfffffffffffff;
  auVar1525._8_8_ = 0;
  auVar1525._0_8_ = uVar1700 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar1694;
  auVar1007._8_8_ = 0;
  auVar1007._0_8_ = uVar1699;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar1695;
  auVar1008._8_8_ = 0;
  auVar1008._0_8_ = uVar1698;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar1684;
  auVar1009._8_8_ = 0;
  auVar1009._0_8_ = uVar1686;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar1680;
  auVar1010._8_8_ = 0;
  auVar1010._0_8_ = uVar1697;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar1696;
  auVar1011._8_8_ = 0;
  auVar1011._0_8_ = uVar1682;
  auVar2 = auVar260 * auVar1009 + auVar1526 + auVar261 * auVar1010 + auVar262 * auVar1011;
  uVar1700 = auVar2._0_8_;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar1700 & 0xfffffffffffff;
  auVar1 = auVar258 * auVar1007 + auVar1525 + auVar259 * auVar1008 +
           auVar263 * ZEXT816(0x1000003d10);
  uVar1702 = auVar1._0_8_;
  auVar1528._8_8_ = 0;
  auVar1528._0_8_ = uVar1700 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1700 = uVar1702 & 0xfffffffffffff;
  auVar1527._8_8_ = 0;
  auVar1527._0_8_ = uVar1702 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar1694;
  auVar1012._8_8_ = 0;
  auVar1012._0_8_ = uVar1682;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar1695;
  auVar1013._8_8_ = 0;
  auVar1013._0_8_ = uVar1699;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar1684;
  auVar1014._8_8_ = 0;
  auVar1014._0_8_ = uVar1698;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar1680;
  auVar1015._8_8_ = 0;
  auVar1015._0_8_ = uVar1686;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar1696;
  auVar1016._8_8_ = 0;
  auVar1016._0_8_ = uVar1697;
  auVar2 = auVar267 * auVar1015 + auVar1528 + auVar268 * auVar1016;
  uVar1697 = auVar2._0_8_;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar1697 & 0xfffffffffffff;
  auVar1 = auVar264 * auVar1012 + auVar1527 + auVar265 * auVar1013 + auVar266 * auVar1014 +
           auVar269 * ZEXT816(0x1000003d10);
  uVar1698 = auVar1._0_8_;
  uVar1682 = uVar1698 & 0xfffffffffffff;
  auVar1529._8_8_ = 0;
  auVar1529._0_8_ = (uVar1698 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1701 & 0xfffffffffffff);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar1697 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1529 = auVar270 * ZEXT816(0x1000003d10) + auVar1529;
  uVar1698 = auVar1529._0_8_;
  uVar1697 = uVar1698 & 0xfffffffffffff;
  uVar1698 = (uVar1698 >> 0x34 | auVar1529._8_8_ << 0xc) + (uVar1685 & 0xffffffffffff);
  iVar1691 = 0xb;
  local_228 = uVar1681;
  uStack_220 = uVar1700;
  local_218 = uVar1682;
  uStack_210 = uVar1697;
  local_208 = uVar1698;
  do {
    auVar271._8_8_ = 0;
    auVar271._0_8_ = local_228 * 2;
    auVar1017._8_8_ = 0;
    auVar1017._0_8_ = uStack_210;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = uStack_220 * 2;
    auVar1018._8_8_ = 0;
    auVar1018._0_8_ = local_218;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = local_208;
    auVar1019._8_8_ = 0;
    auVar1019._0_8_ = local_208;
    uVar1699 = SUB168(auVar273 * auVar1019,0);
    auVar274._8_8_ = 0;
    auVar274._0_8_ = uVar1699 & 0xfffffffffffff;
    auVar1 = auVar272 * auVar1018 + auVar271 * auVar1017 + auVar274 * ZEXT816(0x1000003d10);
    uVar1685 = auVar1._0_8_;
    auVar1530._8_8_ = 0;
    auVar1530._0_8_ = uVar1685 >> 0x34 | auVar1._8_8_ << 0xc;
    local_208 = local_208 * 2;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = local_228;
    auVar1020._8_8_ = 0;
    auVar1020._0_8_ = local_208;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = uStack_220 * 2;
    auVar1021._8_8_ = 0;
    auVar1021._0_8_ = uStack_210;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = local_218;
    auVar1022._8_8_ = 0;
    auVar1022._0_8_ = local_218;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = uVar1699 >> 0x34 | SUB168(auVar273 * auVar1019,8) << 0xc;
    auVar1 = auVar275 * auVar1020 + auVar1530 + auVar276 * auVar1021 + auVar277 * auVar1022 +
             auVar278 * ZEXT816(0x1000003d10);
    uVar1686 = auVar1._0_8_;
    auVar1531._8_8_ = 0;
    auVar1531._0_8_ = uVar1686 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar279._8_8_ = 0;
    auVar279._0_8_ = local_228;
    auVar1023._8_8_ = 0;
    auVar1023._0_8_ = local_228;
    auVar280._8_8_ = 0;
    auVar280._0_8_ = uStack_220;
    auVar1024._8_8_ = 0;
    auVar1024._0_8_ = local_208;
    auVar281._8_8_ = 0;
    auVar281._0_8_ = local_218 * 2;
    auVar1025._8_8_ = 0;
    auVar1025._0_8_ = uStack_210;
    auVar1 = auVar280 * auVar1024 + auVar1531 + auVar281 * auVar1025;
    uVar1699 = auVar1._0_8_;
    auVar1533._8_8_ = 0;
    auVar1533._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1026._8_8_ = 0;
    auVar1026._0_8_ = (uVar1699 & 0xfffffffffffff) << 4 | (uVar1686 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar279 * auVar1023 + ZEXT816(0x1000003d1) * auVar1026;
    uVar1701 = auVar1._0_8_;
    uVar1699 = uVar1701 & 0xfffffffffffff;
    auVar1532._8_8_ = 0;
    auVar1532._0_8_ = uVar1701 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar282._8_8_ = 0;
    auVar282._0_8_ = local_228 * 2;
    auVar1027._8_8_ = 0;
    auVar1027._0_8_ = uStack_220;
    auVar283._8_8_ = 0;
    auVar283._0_8_ = local_218;
    auVar1028._8_8_ = 0;
    auVar1028._0_8_ = local_208;
    auVar284._8_8_ = 0;
    auVar284._0_8_ = uStack_210;
    auVar1029._8_8_ = 0;
    auVar1029._0_8_ = uStack_210;
    auVar2 = auVar283 * auVar1028 + auVar1533 + auVar284 * auVar1029;
    uVar1701 = auVar2._0_8_;
    auVar285._8_8_ = 0;
    auVar285._0_8_ = uVar1701 & 0xfffffffffffff;
    auVar1 = auVar282 * auVar1027 + auVar1532 + auVar285 * ZEXT816(0x1000003d10);
    uVar1702 = auVar1._0_8_;
    auVar1535._8_8_ = 0;
    auVar1535._0_8_ = uVar1701 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1701 = uVar1702 & 0xfffffffffffff;
    auVar1534._8_8_ = 0;
    auVar1534._0_8_ = uVar1702 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar286._8_8_ = 0;
    auVar286._0_8_ = local_228 * 2;
    auVar1030._8_8_ = 0;
    auVar1030._0_8_ = local_218;
    auVar287._8_8_ = 0;
    auVar287._0_8_ = uStack_220;
    auVar1031._8_8_ = 0;
    auVar1031._0_8_ = uStack_220;
    auVar288._8_8_ = 0;
    auVar288._0_8_ = uStack_210;
    auVar1032._8_8_ = 0;
    auVar1032._0_8_ = local_208;
    auVar1535 = auVar288 * auVar1032 + auVar1535;
    uVar1702 = auVar1535._0_8_;
    auVar289._8_8_ = 0;
    auVar289._0_8_ = uVar1702 & 0xfffffffffffff;
    auVar1 = auVar286 * auVar1030 + auVar1534 + auVar287 * auVar1031 +
             auVar289 * ZEXT816(0x1000003d10);
    uVar1703 = auVar1._0_8_;
    local_218 = uVar1703 & 0xfffffffffffff;
    auVar1536._8_8_ = 0;
    auVar1536._0_8_ = (uVar1703 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1685 & 0xfffffffffffff);
    auVar290._8_8_ = 0;
    auVar290._0_8_ = uVar1702 >> 0x34 | auVar1535._8_8_ << 0xc;
    auVar1536 = auVar290 * ZEXT816(0x1000003d10) + auVar1536;
    uVar1685 = auVar1536._0_8_;
    uStack_210 = uVar1685 & 0xfffffffffffff;
    local_208 = (uVar1685 >> 0x34 | auVar1536._8_8_ << 0xc) + (uVar1686 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_228 = uVar1699;
    uStack_220 = uVar1701;
  } while (iVar1691 != 0);
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar1681;
  auVar1033._8_8_ = 0;
  auVar1033._0_8_ = uStack_210;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar1700;
  auVar1034._8_8_ = 0;
  auVar1034._0_8_ = local_218;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar1682;
  auVar1035._8_8_ = 0;
  auVar1035._0_8_ = uVar1701;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar1697;
  auVar1036._8_8_ = 0;
  auVar1036._0_8_ = uVar1699;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar1698;
  auVar1037._8_8_ = 0;
  auVar1037._0_8_ = local_208;
  uVar1685 = SUB168(auVar295 * auVar1037,0);
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar1685 & 0xfffffffffffff;
  auVar1 = auVar292 * auVar1034 + auVar291 * auVar1033 + auVar293 * auVar1035 + auVar294 * auVar1036
           + auVar296 * ZEXT816(0x1000003d10);
  uVar1702 = auVar1._0_8_;
  auVar1537._8_8_ = 0;
  auVar1537._0_8_ = uVar1702 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar1681;
  auVar1038._8_8_ = 0;
  auVar1038._0_8_ = local_208;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar1700;
  auVar1039._8_8_ = 0;
  auVar1039._0_8_ = uStack_210;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar1682;
  auVar1040._8_8_ = 0;
  auVar1040._0_8_ = local_218;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar1697;
  auVar1041._8_8_ = 0;
  auVar1041._0_8_ = uVar1701;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar1698;
  auVar1042._8_8_ = 0;
  auVar1042._0_8_ = uVar1699;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar1685 >> 0x34 | SUB168(auVar295 * auVar1037,8) << 0xc;
  auVar1 = auVar297 * auVar1038 + auVar1537 + auVar298 * auVar1039 + auVar299 * auVar1040 +
           auVar300 * auVar1041 + auVar301 * auVar1042 + auVar302 * ZEXT816(0x1000003d10);
  uVar1703 = auVar1._0_8_;
  auVar1538._8_8_ = 0;
  auVar1538._0_8_ = uVar1703 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar1681;
  auVar1043._8_8_ = 0;
  auVar1043._0_8_ = uVar1699;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar1700;
  auVar1044._8_8_ = 0;
  auVar1044._0_8_ = local_208;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uVar1682;
  auVar1045._8_8_ = 0;
  auVar1045._0_8_ = uStack_210;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar1697;
  auVar1046._8_8_ = 0;
  auVar1046._0_8_ = local_218;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar1698;
  auVar1047._8_8_ = 0;
  auVar1047._0_8_ = uVar1701;
  auVar1 = auVar304 * auVar1044 + auVar1538 + auVar305 * auVar1045 + auVar306 * auVar1046 +
           auVar307 * auVar1047;
  uVar1685 = auVar1._0_8_;
  auVar1540._8_8_ = 0;
  auVar1540._0_8_ = uVar1685 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1048._8_8_ = 0;
  auVar1048._0_8_ = (uVar1685 & 0xfffffffffffff) << 4 | (uVar1703 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar303 * auVar1043 + ZEXT816(0x1000003d1) * auVar1048;
  uVar1686 = auVar1._0_8_;
  uVar1685 = uVar1686 & 0xfffffffffffff;
  auVar1539._8_8_ = 0;
  auVar1539._0_8_ = uVar1686 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar1681;
  auVar1049._8_8_ = 0;
  auVar1049._0_8_ = uVar1701;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar1700;
  auVar1050._8_8_ = 0;
  auVar1050._0_8_ = uVar1699;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar1682;
  auVar1051._8_8_ = 0;
  auVar1051._0_8_ = local_208;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar1697;
  auVar1052._8_8_ = 0;
  auVar1052._0_8_ = uStack_210;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar1698;
  auVar1053._8_8_ = 0;
  auVar1053._0_8_ = local_218;
  auVar2 = auVar310 * auVar1051 + auVar1540 + auVar311 * auVar1052 + auVar312 * auVar1053;
  uVar1686 = auVar2._0_8_;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar1686 & 0xfffffffffffff;
  auVar1 = auVar308 * auVar1049 + auVar1539 + auVar309 * auVar1050 +
           auVar313 * ZEXT816(0x1000003d10);
  uVar1704 = auVar1._0_8_;
  auVar1542._8_8_ = 0;
  auVar1542._0_8_ = uVar1686 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1686 = uVar1704 & 0xfffffffffffff;
  auVar1541._8_8_ = 0;
  auVar1541._0_8_ = uVar1704 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar1681;
  auVar1054._8_8_ = 0;
  auVar1054._0_8_ = local_218;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar1700;
  auVar1055._8_8_ = 0;
  auVar1055._0_8_ = uVar1701;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar1682;
  auVar1056._8_8_ = 0;
  auVar1056._0_8_ = uVar1699;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar1697;
  auVar1057._8_8_ = 0;
  auVar1057._0_8_ = local_208;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar1698;
  auVar1058._8_8_ = 0;
  auVar1058._0_8_ = uStack_210;
  auVar2 = auVar317 * auVar1057 + auVar1542 + auVar318 * auVar1058;
  uVar1697 = auVar2._0_8_;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar1697 & 0xfffffffffffff;
  auVar1 = auVar314 * auVar1054 + auVar1541 + auVar315 * auVar1055 + auVar316 * auVar1056 +
           auVar319 * ZEXT816(0x1000003d10);
  uVar1681 = auVar1._0_8_;
  uVar1682 = uVar1681 & 0xfffffffffffff;
  auVar1543._8_8_ = 0;
  auVar1543._0_8_ = (uVar1681 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1702 & 0xfffffffffffff);
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar1697 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1543 = auVar320 * ZEXT816(0x1000003d10) + auVar1543;
  uVar1681 = auVar1543._0_8_;
  uVar1697 = uVar1681 & 0xfffffffffffff;
  uVar1681 = (uVar1681 >> 0x34 | auVar1543._8_8_ << 0xc) + (uVar1703 & 0xffffffffffff);
  iVar1691 = 0x16;
  local_258 = uVar1685;
  uStack_250 = uVar1686;
  local_248 = uVar1682;
  uStack_240 = uVar1697;
  local_238 = uVar1681;
  do {
    auVar321._8_8_ = 0;
    auVar321._0_8_ = local_258 * 2;
    auVar1059._8_8_ = 0;
    auVar1059._0_8_ = uStack_240;
    auVar322._8_8_ = 0;
    auVar322._0_8_ = uStack_250 * 2;
    auVar1060._8_8_ = 0;
    auVar1060._0_8_ = local_248;
    auVar323._8_8_ = 0;
    auVar323._0_8_ = local_238;
    auVar1061._8_8_ = 0;
    auVar1061._0_8_ = local_238;
    uVar1698 = SUB168(auVar323 * auVar1061,0);
    auVar324._8_8_ = 0;
    auVar324._0_8_ = uVar1698 & 0xfffffffffffff;
    auVar1 = auVar322 * auVar1060 + auVar321 * auVar1059 + auVar324 * ZEXT816(0x1000003d10);
    uVar1700 = auVar1._0_8_;
    auVar1544._8_8_ = 0;
    auVar1544._0_8_ = uVar1700 >> 0x34 | auVar1._8_8_ << 0xc;
    local_238 = local_238 * 2;
    auVar325._8_8_ = 0;
    auVar325._0_8_ = local_258;
    auVar1062._8_8_ = 0;
    auVar1062._0_8_ = local_238;
    auVar326._8_8_ = 0;
    auVar326._0_8_ = uStack_250 * 2;
    auVar1063._8_8_ = 0;
    auVar1063._0_8_ = uStack_240;
    auVar327._8_8_ = 0;
    auVar327._0_8_ = local_248;
    auVar1064._8_8_ = 0;
    auVar1064._0_8_ = local_248;
    auVar328._8_8_ = 0;
    auVar328._0_8_ = uVar1698 >> 0x34 | SUB168(auVar323 * auVar1061,8) << 0xc;
    auVar1 = auVar325 * auVar1062 + auVar1544 + auVar326 * auVar1063 + auVar327 * auVar1064 +
             auVar328 * ZEXT816(0x1000003d10);
    uVar1701 = auVar1._0_8_;
    auVar1545._8_8_ = 0;
    auVar1545._0_8_ = uVar1701 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar329._8_8_ = 0;
    auVar329._0_8_ = local_258;
    auVar1065._8_8_ = 0;
    auVar1065._0_8_ = local_258;
    auVar330._8_8_ = 0;
    auVar330._0_8_ = uStack_250;
    auVar1066._8_8_ = 0;
    auVar1066._0_8_ = local_238;
    auVar331._8_8_ = 0;
    auVar331._0_8_ = local_248 * 2;
    auVar1067._8_8_ = 0;
    auVar1067._0_8_ = uStack_240;
    auVar1 = auVar330 * auVar1066 + auVar1545 + auVar331 * auVar1067;
    uVar1698 = auVar1._0_8_;
    auVar1547._8_8_ = 0;
    auVar1547._0_8_ = uVar1698 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1068._8_8_ = 0;
    auVar1068._0_8_ = (uVar1698 & 0xfffffffffffff) << 4 | (uVar1701 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar329 * auVar1065 + ZEXT816(0x1000003d1) * auVar1068;
    uVar1699 = auVar1._0_8_;
    uVar1698 = uVar1699 & 0xfffffffffffff;
    auVar1546._8_8_ = 0;
    auVar1546._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar332._8_8_ = 0;
    auVar332._0_8_ = local_258 * 2;
    auVar1069._8_8_ = 0;
    auVar1069._0_8_ = uStack_250;
    auVar333._8_8_ = 0;
    auVar333._0_8_ = local_248;
    auVar1070._8_8_ = 0;
    auVar1070._0_8_ = local_238;
    auVar334._8_8_ = 0;
    auVar334._0_8_ = uStack_240;
    auVar1071._8_8_ = 0;
    auVar1071._0_8_ = uStack_240;
    auVar2 = auVar333 * auVar1070 + auVar1547 + auVar334 * auVar1071;
    uVar1699 = auVar2._0_8_;
    auVar335._8_8_ = 0;
    auVar335._0_8_ = uVar1699 & 0xfffffffffffff;
    auVar1 = auVar332 * auVar1069 + auVar1546 + auVar335 * ZEXT816(0x1000003d10);
    uVar1702 = auVar1._0_8_;
    auVar1549._8_8_ = 0;
    auVar1549._0_8_ = uVar1699 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1699 = uVar1702 & 0xfffffffffffff;
    auVar1548._8_8_ = 0;
    auVar1548._0_8_ = uVar1702 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar336._8_8_ = 0;
    auVar336._0_8_ = local_258 * 2;
    auVar1072._8_8_ = 0;
    auVar1072._0_8_ = local_248;
    auVar337._8_8_ = 0;
    auVar337._0_8_ = uStack_250;
    auVar1073._8_8_ = 0;
    auVar1073._0_8_ = uStack_250;
    auVar338._8_8_ = 0;
    auVar338._0_8_ = uStack_240;
    auVar1074._8_8_ = 0;
    auVar1074._0_8_ = local_238;
    auVar1549 = auVar338 * auVar1074 + auVar1549;
    uVar1702 = auVar1549._0_8_;
    auVar339._8_8_ = 0;
    auVar339._0_8_ = uVar1702 & 0xfffffffffffff;
    auVar1 = auVar336 * auVar1072 + auVar1548 + auVar337 * auVar1073 +
             auVar339 * ZEXT816(0x1000003d10);
    uVar1703 = auVar1._0_8_;
    local_248 = uVar1703 & 0xfffffffffffff;
    auVar1550._8_8_ = 0;
    auVar1550._0_8_ = (uVar1703 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1700 & 0xfffffffffffff);
    auVar340._8_8_ = 0;
    auVar340._0_8_ = uVar1702 >> 0x34 | auVar1549._8_8_ << 0xc;
    auVar1550 = auVar340 * ZEXT816(0x1000003d10) + auVar1550;
    uVar1700 = auVar1550._0_8_;
    uStack_240 = uVar1700 & 0xfffffffffffff;
    local_238 = (uVar1700 >> 0x34 | auVar1550._8_8_ << 0xc) + (uVar1701 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_258 = uVar1698;
    uStack_250 = uVar1699;
  } while (iVar1691 != 0);
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar1685;
  auVar1075._8_8_ = 0;
  auVar1075._0_8_ = uStack_240;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar1686;
  auVar1076._8_8_ = 0;
  auVar1076._0_8_ = local_248;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar1682;
  auVar1077._8_8_ = 0;
  auVar1077._0_8_ = uVar1699;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar1697;
  auVar1078._8_8_ = 0;
  auVar1078._0_8_ = uVar1698;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar1681;
  auVar1079._8_8_ = 0;
  auVar1079._0_8_ = local_238;
  uVar1700 = SUB168(auVar345 * auVar1079,0);
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar1700 & 0xfffffffffffff;
  auVar1 = auVar342 * auVar1076 + auVar341 * auVar1075 + auVar343 * auVar1077 + auVar344 * auVar1078
           + auVar346 * ZEXT816(0x1000003d10);
  uVar1702 = auVar1._0_8_;
  auVar1551._8_8_ = 0;
  auVar1551._0_8_ = uVar1702 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar1685;
  auVar1080._8_8_ = 0;
  auVar1080._0_8_ = local_238;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar1686;
  auVar1081._8_8_ = 0;
  auVar1081._0_8_ = uStack_240;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar1682;
  auVar1082._8_8_ = 0;
  auVar1082._0_8_ = local_248;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar1697;
  auVar1083._8_8_ = 0;
  auVar1083._0_8_ = uVar1699;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar1681;
  auVar1084._8_8_ = 0;
  auVar1084._0_8_ = uVar1698;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar1700 >> 0x34 | SUB168(auVar345 * auVar1079,8) << 0xc;
  auVar1 = auVar347 * auVar1080 + auVar1551 + auVar348 * auVar1081 + auVar349 * auVar1082 +
           auVar350 * auVar1083 + auVar351 * auVar1084 + auVar352 * ZEXT816(0x1000003d10);
  uVar1703 = auVar1._0_8_;
  auVar1552._8_8_ = 0;
  auVar1552._0_8_ = uVar1703 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar1685;
  auVar1085._8_8_ = 0;
  auVar1085._0_8_ = uVar1698;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar1686;
  auVar1086._8_8_ = 0;
  auVar1086._0_8_ = local_238;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar1682;
  auVar1087._8_8_ = 0;
  auVar1087._0_8_ = uStack_240;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar1697;
  auVar1088._8_8_ = 0;
  auVar1088._0_8_ = local_248;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = uVar1681;
  auVar1089._8_8_ = 0;
  auVar1089._0_8_ = uVar1699;
  auVar1 = auVar354 * auVar1086 + auVar1552 + auVar355 * auVar1087 + auVar356 * auVar1088 +
           auVar357 * auVar1089;
  uVar1700 = auVar1._0_8_;
  auVar1554._8_8_ = 0;
  auVar1554._0_8_ = uVar1700 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1090._8_8_ = 0;
  auVar1090._0_8_ = (uVar1700 & 0xfffffffffffff) << 4 | (uVar1703 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar353 * auVar1085 + ZEXT816(0x1000003d1) * auVar1090;
  uVar1701 = auVar1._0_8_;
  uVar1700 = uVar1701 & 0xfffffffffffff;
  auVar1553._8_8_ = 0;
  auVar1553._0_8_ = uVar1701 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar1685;
  auVar1091._8_8_ = 0;
  auVar1091._0_8_ = uVar1699;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar1686;
  auVar1092._8_8_ = 0;
  auVar1092._0_8_ = uVar1698;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar1682;
  auVar1093._8_8_ = 0;
  auVar1093._0_8_ = local_238;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar1697;
  auVar1094._8_8_ = 0;
  auVar1094._0_8_ = uStack_240;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar1681;
  auVar1095._8_8_ = 0;
  auVar1095._0_8_ = local_248;
  auVar2 = auVar360 * auVar1093 + auVar1554 + auVar361 * auVar1094 + auVar362 * auVar1095;
  uVar1701 = auVar2._0_8_;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = uVar1701 & 0xfffffffffffff;
  auVar1 = auVar358 * auVar1091 + auVar1553 + auVar359 * auVar1092 +
           auVar363 * ZEXT816(0x1000003d10);
  uVar1704 = auVar1._0_8_;
  auVar1556._8_8_ = 0;
  auVar1556._0_8_ = uVar1701 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1701 = uVar1704 & 0xfffffffffffff;
  auVar1555._8_8_ = 0;
  auVar1555._0_8_ = uVar1704 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = uVar1685;
  auVar1096._8_8_ = 0;
  auVar1096._0_8_ = local_248;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = uVar1686;
  auVar1097._8_8_ = 0;
  auVar1097._0_8_ = uVar1699;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = uVar1682;
  auVar1098._8_8_ = 0;
  auVar1098._0_8_ = uVar1698;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = uVar1697;
  auVar1099._8_8_ = 0;
  auVar1099._0_8_ = local_238;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = uVar1681;
  auVar1100._8_8_ = 0;
  auVar1100._0_8_ = uStack_240;
  auVar2 = auVar367 * auVar1099 + auVar1556 + auVar368 * auVar1100;
  uVar1699 = auVar2._0_8_;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = uVar1699 & 0xfffffffffffff;
  auVar1 = auVar364 * auVar1096 + auVar1555 + auVar365 * auVar1097 + auVar366 * auVar1098 +
           auVar369 * ZEXT816(0x1000003d10);
  uVar1704 = auVar1._0_8_;
  uVar1698 = uVar1704 & 0xfffffffffffff;
  auVar1557._8_8_ = 0;
  auVar1557._0_8_ = (uVar1704 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1702 & 0xfffffffffffff);
  auVar370._8_8_ = 0;
  auVar370._0_8_ = uVar1699 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1557 = auVar370 * ZEXT816(0x1000003d10) + auVar1557;
  uVar1702 = auVar1557._0_8_;
  uVar1699 = uVar1702 & 0xfffffffffffff;
  uVar1702 = (uVar1702 >> 0x34 | auVar1557._8_8_ << 0xc) + (uVar1703 & 0xffffffffffff);
  iVar1691 = 0x2c;
  local_1f8 = uVar1700;
  uStack_1f0 = uVar1701;
  local_1e8 = uVar1698;
  uStack_1e0 = uVar1699;
  local_1d8 = uVar1702;
  do {
    auVar371._8_8_ = 0;
    auVar371._0_8_ = local_1f8 * 2;
    auVar1101._8_8_ = 0;
    auVar1101._0_8_ = uStack_1e0;
    auVar372._8_8_ = 0;
    auVar372._0_8_ = uStack_1f0 * 2;
    auVar1102._8_8_ = 0;
    auVar1102._0_8_ = local_1e8;
    auVar373._8_8_ = 0;
    auVar373._0_8_ = local_1d8;
    auVar1103._8_8_ = 0;
    auVar1103._0_8_ = local_1d8;
    uVar1703 = SUB168(auVar373 * auVar1103,0);
    auVar374._8_8_ = 0;
    auVar374._0_8_ = uVar1703 & 0xfffffffffffff;
    auVar1 = auVar372 * auVar1102 + auVar371 * auVar1101 + auVar374 * ZEXT816(0x1000003d10);
    uVar1687 = auVar1._0_8_;
    auVar1558._8_8_ = 0;
    auVar1558._0_8_ = uVar1687 >> 0x34 | auVar1._8_8_ << 0xc;
    local_1d8 = local_1d8 * 2;
    auVar375._8_8_ = 0;
    auVar375._0_8_ = local_1f8;
    auVar1104._8_8_ = 0;
    auVar1104._0_8_ = local_1d8;
    auVar376._8_8_ = 0;
    auVar376._0_8_ = uStack_1f0 * 2;
    auVar1105._8_8_ = 0;
    auVar1105._0_8_ = uStack_1e0;
    auVar377._8_8_ = 0;
    auVar377._0_8_ = local_1e8;
    auVar1106._8_8_ = 0;
    auVar1106._0_8_ = local_1e8;
    auVar378._8_8_ = 0;
    auVar378._0_8_ = uVar1703 >> 0x34 | SUB168(auVar373 * auVar1103,8) << 0xc;
    auVar1 = auVar375 * auVar1104 + auVar1558 + auVar376 * auVar1105 + auVar377 * auVar1106 +
             auVar378 * ZEXT816(0x1000003d10);
    uVar1688 = auVar1._0_8_;
    auVar1559._8_8_ = 0;
    auVar1559._0_8_ = uVar1688 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar379._8_8_ = 0;
    auVar379._0_8_ = local_1f8;
    auVar1107._8_8_ = 0;
    auVar1107._0_8_ = local_1f8;
    auVar380._8_8_ = 0;
    auVar380._0_8_ = uStack_1f0;
    auVar1108._8_8_ = 0;
    auVar1108._0_8_ = local_1d8;
    auVar381._8_8_ = 0;
    auVar381._0_8_ = local_1e8 * 2;
    auVar1109._8_8_ = 0;
    auVar1109._0_8_ = uStack_1e0;
    auVar1 = auVar380 * auVar1108 + auVar1559 + auVar381 * auVar1109;
    uVar1703 = auVar1._0_8_;
    auVar1561._8_8_ = 0;
    auVar1561._0_8_ = uVar1703 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1110._8_8_ = 0;
    auVar1110._0_8_ = (uVar1703 & 0xfffffffffffff) << 4 | (uVar1688 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar379 * auVar1107 + ZEXT816(0x1000003d1) * auVar1110;
    uVar1704 = auVar1._0_8_;
    uVar1703 = uVar1704 & 0xfffffffffffff;
    auVar1560._8_8_ = 0;
    auVar1560._0_8_ = uVar1704 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar382._8_8_ = 0;
    auVar382._0_8_ = local_1f8 * 2;
    auVar1111._8_8_ = 0;
    auVar1111._0_8_ = uStack_1f0;
    auVar383._8_8_ = 0;
    auVar383._0_8_ = local_1e8;
    auVar1112._8_8_ = 0;
    auVar1112._0_8_ = local_1d8;
    auVar384._8_8_ = 0;
    auVar384._0_8_ = uStack_1e0;
    auVar1113._8_8_ = 0;
    auVar1113._0_8_ = uStack_1e0;
    auVar2 = auVar383 * auVar1112 + auVar1561 + auVar384 * auVar1113;
    uVar1704 = auVar2._0_8_;
    auVar385._8_8_ = 0;
    auVar385._0_8_ = uVar1704 & 0xfffffffffffff;
    auVar1 = auVar382 * auVar1111 + auVar1560 + auVar385 * ZEXT816(0x1000003d10);
    uVar1705 = auVar1._0_8_;
    auVar1563._8_8_ = 0;
    auVar1563._0_8_ = uVar1704 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1704 = uVar1705 & 0xfffffffffffff;
    auVar1562._8_8_ = 0;
    auVar1562._0_8_ = uVar1705 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar386._8_8_ = 0;
    auVar386._0_8_ = local_1f8 * 2;
    auVar1114._8_8_ = 0;
    auVar1114._0_8_ = local_1e8;
    auVar387._8_8_ = 0;
    auVar387._0_8_ = uStack_1f0;
    auVar1115._8_8_ = 0;
    auVar1115._0_8_ = uStack_1f0;
    auVar388._8_8_ = 0;
    auVar388._0_8_ = uStack_1e0;
    auVar1116._8_8_ = 0;
    auVar1116._0_8_ = local_1d8;
    auVar1563 = auVar388 * auVar1116 + auVar1563;
    uVar1705 = auVar1563._0_8_;
    auVar389._8_8_ = 0;
    auVar389._0_8_ = uVar1705 & 0xfffffffffffff;
    auVar1 = auVar386 * auVar1114 + auVar1562 + auVar387 * auVar1115 +
             auVar389 * ZEXT816(0x1000003d10);
    uVar1706 = auVar1._0_8_;
    local_1e8 = uVar1706 & 0xfffffffffffff;
    auVar1564._8_8_ = 0;
    auVar1564._0_8_ = (uVar1706 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1687 & 0xfffffffffffff);
    auVar390._8_8_ = 0;
    auVar390._0_8_ = uVar1705 >> 0x34 | auVar1563._8_8_ << 0xc;
    auVar1564 = auVar390 * ZEXT816(0x1000003d10) + auVar1564;
    uVar1687 = auVar1564._0_8_;
    uStack_1e0 = uVar1687 & 0xfffffffffffff;
    local_1d8 = (uVar1687 >> 0x34 | auVar1564._8_8_ << 0xc) + (uVar1688 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_1f8 = uVar1703;
    uStack_1f0 = uVar1704;
  } while (iVar1691 != 0);
  auVar391._8_8_ = 0;
  auVar391._0_8_ = uVar1700;
  auVar1117._8_8_ = 0;
  auVar1117._0_8_ = uStack_1e0;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = uVar1701;
  auVar1118._8_8_ = 0;
  auVar1118._0_8_ = local_1e8;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = uVar1698;
  auVar1119._8_8_ = 0;
  auVar1119._0_8_ = uVar1704;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = uVar1699;
  auVar1120._8_8_ = 0;
  auVar1120._0_8_ = uVar1703;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = uVar1702;
  auVar1121._8_8_ = 0;
  auVar1121._0_8_ = local_1d8;
  uVar1687 = SUB168(auVar395 * auVar1121,0);
  auVar396._8_8_ = 0;
  auVar396._0_8_ = uVar1687 & 0xfffffffffffff;
  auVar1 = auVar392 * auVar1118 + auVar391 * auVar1117 + auVar393 * auVar1119 + auVar394 * auVar1120
           + auVar396 * ZEXT816(0x1000003d10);
  uVar1705 = auVar1._0_8_;
  auVar1565._8_8_ = 0;
  auVar1565._0_8_ = uVar1705 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = uVar1700;
  auVar1122._8_8_ = 0;
  auVar1122._0_8_ = local_1d8;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = uVar1701;
  auVar1123._8_8_ = 0;
  auVar1123._0_8_ = uStack_1e0;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = uVar1698;
  auVar1124._8_8_ = 0;
  auVar1124._0_8_ = local_1e8;
  auVar400._8_8_ = 0;
  auVar400._0_8_ = uVar1699;
  auVar1125._8_8_ = 0;
  auVar1125._0_8_ = uVar1704;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = uVar1702;
  auVar1126._8_8_ = 0;
  auVar1126._0_8_ = uVar1703;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = uVar1687 >> 0x34 | SUB168(auVar395 * auVar1121,8) << 0xc;
  auVar1 = auVar397 * auVar1122 + auVar1565 + auVar398 * auVar1123 + auVar399 * auVar1124 +
           auVar400 * auVar1125 + auVar401 * auVar1126 + auVar402 * ZEXT816(0x1000003d10);
  uVar1706 = auVar1._0_8_;
  auVar1566._8_8_ = 0;
  auVar1566._0_8_ = uVar1706 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = uVar1700;
  auVar1127._8_8_ = 0;
  auVar1127._0_8_ = uVar1703;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = uVar1701;
  auVar1128._8_8_ = 0;
  auVar1128._0_8_ = local_1d8;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = uVar1698;
  auVar1129._8_8_ = 0;
  auVar1129._0_8_ = uStack_1e0;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = uVar1699;
  auVar1130._8_8_ = 0;
  auVar1130._0_8_ = local_1e8;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = uVar1702;
  auVar1131._8_8_ = 0;
  auVar1131._0_8_ = uVar1704;
  auVar1 = auVar404 * auVar1128 + auVar1566 + auVar405 * auVar1129 + auVar406 * auVar1130 +
           auVar407 * auVar1131;
  uVar1687 = auVar1._0_8_;
  auVar1568._8_8_ = 0;
  auVar1568._0_8_ = uVar1687 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1132._8_8_ = 0;
  auVar1132._0_8_ = (uVar1687 & 0xfffffffffffff) << 4 | (uVar1706 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar403 * auVar1127 + ZEXT816(0x1000003d1) * auVar1132;
  uVar1688 = auVar1._0_8_;
  uVar1687 = uVar1688 & 0xfffffffffffff;
  auVar1567._8_8_ = 0;
  auVar1567._0_8_ = uVar1688 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = uVar1700;
  auVar1133._8_8_ = 0;
  auVar1133._0_8_ = uVar1704;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = uVar1701;
  auVar1134._8_8_ = 0;
  auVar1134._0_8_ = uVar1703;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = uVar1698;
  auVar1135._8_8_ = 0;
  auVar1135._0_8_ = local_1d8;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = uVar1699;
  auVar1136._8_8_ = 0;
  auVar1136._0_8_ = uStack_1e0;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = uVar1702;
  auVar1137._8_8_ = 0;
  auVar1137._0_8_ = local_1e8;
  auVar2 = auVar410 * auVar1135 + auVar1568 + auVar411 * auVar1136 + auVar412 * auVar1137;
  uVar1688 = auVar2._0_8_;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = uVar1688 & 0xfffffffffffff;
  auVar1 = auVar408 * auVar1133 + auVar1567 + auVar409 * auVar1134 +
           auVar413 * ZEXT816(0x1000003d10);
  uVar1707 = auVar1._0_8_;
  auVar1570._8_8_ = 0;
  auVar1570._0_8_ = uVar1688 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1688 = uVar1707 & 0xfffffffffffff;
  auVar1569._8_8_ = 0;
  auVar1569._0_8_ = uVar1707 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = uVar1700;
  auVar1138._8_8_ = 0;
  auVar1138._0_8_ = local_1e8;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = uVar1701;
  auVar1139._8_8_ = 0;
  auVar1139._0_8_ = uVar1704;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = uVar1698;
  auVar1140._8_8_ = 0;
  auVar1140._0_8_ = uVar1703;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = uVar1699;
  auVar1141._8_8_ = 0;
  auVar1141._0_8_ = local_1d8;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = uVar1702;
  auVar1142._8_8_ = 0;
  auVar1142._0_8_ = uStack_1e0;
  auVar2 = auVar417 * auVar1141 + auVar1570 + auVar418 * auVar1142;
  uVar1704 = auVar2._0_8_;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = uVar1704 & 0xfffffffffffff;
  auVar1 = auVar414 * auVar1138 + auVar1569 + auVar415 * auVar1139 + auVar416 * auVar1140 +
           auVar419 * ZEXT816(0x1000003d10);
  uVar1707 = auVar1._0_8_;
  uVar1703 = uVar1707 & 0xfffffffffffff;
  auVar1571._8_8_ = 0;
  auVar1571._0_8_ = (uVar1707 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1705 & 0xfffffffffffff);
  auVar420._8_8_ = 0;
  auVar420._0_8_ = uVar1704 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1571 = auVar420 * ZEXT816(0x1000003d10) + auVar1571;
  uVar1705 = auVar1571._0_8_;
  uVar1704 = uVar1705 & 0xfffffffffffff;
  uVar1705 = (uVar1705 >> 0x34 | auVar1571._8_8_ << 0xc) + (uVar1706 & 0xffffffffffff);
  iVar1691 = 0x58;
  local_168 = uVar1687;
  uStack_160 = uVar1688;
  local_158 = uVar1703;
  uStack_150 = uVar1704;
  local_148 = uVar1705;
  do {
    auVar421._8_8_ = 0;
    auVar421._0_8_ = local_168 * 2;
    auVar1143._8_8_ = 0;
    auVar1143._0_8_ = uStack_150;
    auVar422._8_8_ = 0;
    auVar422._0_8_ = uStack_160 * 2;
    auVar1144._8_8_ = 0;
    auVar1144._0_8_ = local_158;
    auVar423._8_8_ = 0;
    auVar423._0_8_ = local_148;
    auVar1145._8_8_ = 0;
    auVar1145._0_8_ = local_148;
    uVar1706 = SUB168(auVar423 * auVar1145,0);
    auVar424._8_8_ = 0;
    auVar424._0_8_ = uVar1706 & 0xfffffffffffff;
    auVar1 = auVar422 * auVar1144 + auVar421 * auVar1143 + auVar424 * ZEXT816(0x1000003d10);
    uVar1689 = auVar1._0_8_;
    auVar1572._8_8_ = 0;
    auVar1572._0_8_ = uVar1689 >> 0x34 | auVar1._8_8_ << 0xc;
    local_148 = local_148 * 2;
    auVar425._8_8_ = 0;
    auVar425._0_8_ = local_168;
    auVar1146._8_8_ = 0;
    auVar1146._0_8_ = local_148;
    auVar426._8_8_ = 0;
    auVar426._0_8_ = uStack_160 * 2;
    auVar1147._8_8_ = 0;
    auVar1147._0_8_ = uStack_150;
    auVar427._8_8_ = 0;
    auVar427._0_8_ = local_158;
    auVar1148._8_8_ = 0;
    auVar1148._0_8_ = local_158;
    auVar428._8_8_ = 0;
    auVar428._0_8_ = uVar1706 >> 0x34 | SUB168(auVar423 * auVar1145,8) << 0xc;
    auVar1 = auVar425 * auVar1146 + auVar1572 + auVar426 * auVar1147 + auVar427 * auVar1148 +
             auVar428 * ZEXT816(0x1000003d10);
    uVar1690 = auVar1._0_8_;
    auVar1573._8_8_ = 0;
    auVar1573._0_8_ = uVar1690 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar429._8_8_ = 0;
    auVar429._0_8_ = local_168;
    auVar1149._8_8_ = 0;
    auVar1149._0_8_ = local_168;
    auVar430._8_8_ = 0;
    auVar430._0_8_ = uStack_160;
    auVar1150._8_8_ = 0;
    auVar1150._0_8_ = local_148;
    auVar431._8_8_ = 0;
    auVar431._0_8_ = local_158 * 2;
    auVar1151._8_8_ = 0;
    auVar1151._0_8_ = uStack_150;
    auVar1 = auVar430 * auVar1150 + auVar1573 + auVar431 * auVar1151;
    uVar1706 = auVar1._0_8_;
    auVar1575._8_8_ = 0;
    auVar1575._0_8_ = uVar1706 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1152._8_8_ = 0;
    auVar1152._0_8_ = (uVar1706 & 0xfffffffffffff) << 4 | (uVar1690 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar429 * auVar1149 + ZEXT816(0x1000003d1) * auVar1152;
    uVar1707 = auVar1._0_8_;
    uVar1706 = uVar1707 & 0xfffffffffffff;
    auVar1574._8_8_ = 0;
    auVar1574._0_8_ = uVar1707 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar432._8_8_ = 0;
    auVar432._0_8_ = local_168 * 2;
    auVar1153._8_8_ = 0;
    auVar1153._0_8_ = uStack_160;
    auVar433._8_8_ = 0;
    auVar433._0_8_ = local_158;
    auVar1154._8_8_ = 0;
    auVar1154._0_8_ = local_148;
    auVar434._8_8_ = 0;
    auVar434._0_8_ = uStack_150;
    auVar1155._8_8_ = 0;
    auVar1155._0_8_ = uStack_150;
    auVar2 = auVar433 * auVar1154 + auVar1575 + auVar434 * auVar1155;
    uVar1707 = auVar2._0_8_;
    auVar435._8_8_ = 0;
    auVar435._0_8_ = uVar1707 & 0xfffffffffffff;
    auVar1 = auVar432 * auVar1153 + auVar1574 + auVar435 * ZEXT816(0x1000003d10);
    uVar1708 = auVar1._0_8_;
    auVar1577._8_8_ = 0;
    auVar1577._0_8_ = uVar1707 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1707 = uVar1708 & 0xfffffffffffff;
    auVar1576._8_8_ = 0;
    auVar1576._0_8_ = uVar1708 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar436._8_8_ = 0;
    auVar436._0_8_ = local_168 * 2;
    auVar1156._8_8_ = 0;
    auVar1156._0_8_ = local_158;
    auVar437._8_8_ = 0;
    auVar437._0_8_ = uStack_160;
    auVar1157._8_8_ = 0;
    auVar1157._0_8_ = uStack_160;
    auVar438._8_8_ = 0;
    auVar438._0_8_ = uStack_150;
    auVar1158._8_8_ = 0;
    auVar1158._0_8_ = local_148;
    auVar1577 = auVar438 * auVar1158 + auVar1577;
    uVar1708 = auVar1577._0_8_;
    auVar439._8_8_ = 0;
    auVar439._0_8_ = uVar1708 & 0xfffffffffffff;
    auVar1 = auVar436 * auVar1156 + auVar1576 + auVar437 * auVar1157 +
             auVar439 * ZEXT816(0x1000003d10);
    uVar1709 = auVar1._0_8_;
    local_158 = uVar1709 & 0xfffffffffffff;
    auVar1578._8_8_ = 0;
    auVar1578._0_8_ = (uVar1709 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1689 & 0xfffffffffffff);
    auVar440._8_8_ = 0;
    auVar440._0_8_ = uVar1708 >> 0x34 | auVar1577._8_8_ << 0xc;
    auVar1578 = auVar440 * ZEXT816(0x1000003d10) + auVar1578;
    uVar1689 = auVar1578._0_8_;
    uStack_150 = uVar1689 & 0xfffffffffffff;
    local_148 = (uVar1689 >> 0x34 | auVar1578._8_8_ << 0xc) + (uVar1690 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_168 = uVar1706;
    uStack_160 = uVar1707;
  } while (iVar1691 != 0);
  auVar441._8_8_ = 0;
  auVar441._0_8_ = uVar1687;
  auVar1159._8_8_ = 0;
  auVar1159._0_8_ = uStack_150;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = uVar1688;
  auVar1160._8_8_ = 0;
  auVar1160._0_8_ = local_158;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = uVar1703;
  auVar1161._8_8_ = 0;
  auVar1161._0_8_ = uVar1707;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = uVar1704;
  auVar1162._8_8_ = 0;
  auVar1162._0_8_ = uVar1706;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = uVar1705;
  auVar1163._8_8_ = 0;
  auVar1163._0_8_ = local_148;
  uVar1689 = SUB168(auVar445 * auVar1163,0);
  auVar446._8_8_ = 0;
  auVar446._0_8_ = uVar1689 & 0xfffffffffffff;
  auVar1 = auVar442 * auVar1160 + auVar441 * auVar1159 + auVar443 * auVar1161 + auVar444 * auVar1162
           + auVar446 * ZEXT816(0x1000003d10);
  uVar1690 = auVar1._0_8_;
  auVar1579._8_8_ = 0;
  auVar1579._0_8_ = uVar1690 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = uVar1687;
  auVar1164._8_8_ = 0;
  auVar1164._0_8_ = local_148;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = uVar1688;
  auVar1165._8_8_ = 0;
  auVar1165._0_8_ = uStack_150;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = uVar1703;
  auVar1166._8_8_ = 0;
  auVar1166._0_8_ = local_158;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uVar1704;
  auVar1167._8_8_ = 0;
  auVar1167._0_8_ = uVar1707;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uVar1705;
  auVar1168._8_8_ = 0;
  auVar1168._0_8_ = uVar1706;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = uVar1689 >> 0x34 | SUB168(auVar445 * auVar1163,8) << 0xc;
  auVar1 = auVar447 * auVar1164 + auVar1579 + auVar448 * auVar1165 + auVar449 * auVar1166 +
           auVar450 * auVar1167 + auVar451 * auVar1168 + auVar452 * ZEXT816(0x1000003d10);
  uVar1689 = auVar1._0_8_;
  auVar1580._8_8_ = 0;
  auVar1580._0_8_ = uVar1689 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = uVar1687;
  auVar1169._8_8_ = 0;
  auVar1169._0_8_ = uVar1706;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = uVar1688;
  auVar1170._8_8_ = 0;
  auVar1170._0_8_ = local_148;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = uVar1703;
  auVar1171._8_8_ = 0;
  auVar1171._0_8_ = uStack_150;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = uVar1704;
  auVar1172._8_8_ = 0;
  auVar1172._0_8_ = local_158;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = uVar1705;
  auVar1173._8_8_ = 0;
  auVar1173._0_8_ = uVar1707;
  auVar1 = auVar454 * auVar1170 + auVar1580 + auVar455 * auVar1171 + auVar456 * auVar1172 +
           auVar457 * auVar1173;
  uVar1708 = auVar1._0_8_;
  auVar1582._8_8_ = 0;
  auVar1582._0_8_ = uVar1708 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1174._8_8_ = 0;
  auVar1174._0_8_ = (uVar1708 & 0xfffffffffffff) << 4 | (uVar1689 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar453 * auVar1169 + ZEXT816(0x1000003d1) * auVar1174;
  uVar1709 = auVar1._0_8_;
  auVar1581._8_8_ = 0;
  auVar1581._0_8_ = uVar1709 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = uVar1687;
  auVar1175._8_8_ = 0;
  auVar1175._0_8_ = uVar1707;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = uVar1688;
  auVar1176._8_8_ = 0;
  auVar1176._0_8_ = uVar1706;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = uVar1703;
  auVar1177._8_8_ = 0;
  auVar1177._0_8_ = local_148;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = uVar1704;
  auVar1178._8_8_ = 0;
  auVar1178._0_8_ = uStack_150;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = uVar1705;
  auVar1179._8_8_ = 0;
  auVar1179._0_8_ = local_158;
  auVar2 = auVar460 * auVar1177 + auVar1582 + auVar461 * auVar1178 + auVar462 * auVar1179;
  uVar1708 = auVar2._0_8_;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = uVar1708 & 0xfffffffffffff;
  auVar1 = auVar458 * auVar1175 + auVar1581 + auVar459 * auVar1176 +
           auVar463 * ZEXT816(0x1000003d10);
  uVar1710 = auVar1._0_8_;
  auVar1584._8_8_ = 0;
  auVar1584._0_8_ = uVar1708 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1583._8_8_ = 0;
  auVar1583._0_8_ = uVar1710 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = uVar1687;
  auVar1180._8_8_ = 0;
  auVar1180._0_8_ = local_158;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = uVar1688;
  auVar1181._8_8_ = 0;
  auVar1181._0_8_ = uVar1707;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = uVar1703;
  auVar1182._8_8_ = 0;
  auVar1182._0_8_ = uVar1706;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = uVar1704;
  auVar1183._8_8_ = 0;
  auVar1183._0_8_ = local_148;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar1705;
  auVar1184._8_8_ = 0;
  auVar1184._0_8_ = uStack_150;
  auVar2 = auVar467 * auVar1183 + auVar1584 + auVar468 * auVar1184;
  uVar1703 = auVar2._0_8_;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = uVar1703 & 0xfffffffffffff;
  auVar1 = auVar464 * auVar1180 + auVar1583 + auVar465 * auVar1181 + auVar466 * auVar1182 +
           auVar469 * ZEXT816(0x1000003d10);
  uVar1704 = auVar1._0_8_;
  local_188 = uVar1704 & 0xfffffffffffff;
  auVar1585._8_8_ = 0;
  auVar1585._0_8_ = (uVar1704 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1690 & 0xfffffffffffff);
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uVar1703 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1585 = auVar470 * ZEXT816(0x1000003d10) + auVar1585;
  uVar1703 = auVar1585._0_8_;
  uStack_180 = uVar1703 & 0xfffffffffffff;
  local_178 = (uVar1703 >> 0x34 | auVar1585._8_8_ << 0xc) + (uVar1689 & 0xffffffffffff);
  iVar1691 = 0x2c;
  local_198 = uVar1709 & 0xfffffffffffff;
  uStack_190 = uVar1710 & 0xfffffffffffff;
  do {
    auVar471._8_8_ = 0;
    auVar471._0_8_ = local_198 * 2;
    auVar1185._8_8_ = 0;
    auVar1185._0_8_ = uStack_180;
    auVar472._8_8_ = 0;
    auVar472._0_8_ = uStack_190 * 2;
    auVar1186._8_8_ = 0;
    auVar1186._0_8_ = local_188;
    auVar473._8_8_ = 0;
    auVar473._0_8_ = local_178;
    auVar1187._8_8_ = 0;
    auVar1187._0_8_ = local_178;
    uVar1703 = SUB168(auVar473 * auVar1187,0);
    auVar474._8_8_ = 0;
    auVar474._0_8_ = uVar1703 & 0xfffffffffffff;
    auVar1 = auVar472 * auVar1186 + auVar471 * auVar1185 + auVar474 * ZEXT816(0x1000003d10);
    uVar1687 = auVar1._0_8_;
    auVar1586._8_8_ = 0;
    auVar1586._0_8_ = uVar1687 >> 0x34 | auVar1._8_8_ << 0xc;
    local_178 = local_178 * 2;
    auVar475._8_8_ = 0;
    auVar475._0_8_ = local_198;
    auVar1188._8_8_ = 0;
    auVar1188._0_8_ = local_178;
    auVar476._8_8_ = 0;
    auVar476._0_8_ = uStack_190 * 2;
    auVar1189._8_8_ = 0;
    auVar1189._0_8_ = uStack_180;
    auVar477._8_8_ = 0;
    auVar477._0_8_ = local_188;
    auVar1190._8_8_ = 0;
    auVar1190._0_8_ = local_188;
    auVar478._8_8_ = 0;
    auVar478._0_8_ = uVar1703 >> 0x34 | SUB168(auVar473 * auVar1187,8) << 0xc;
    auVar1 = auVar475 * auVar1188 + auVar1586 + auVar476 * auVar1189 + auVar477 * auVar1190 +
             auVar478 * ZEXT816(0x1000003d10);
    uVar1688 = auVar1._0_8_;
    auVar1587._8_8_ = 0;
    auVar1587._0_8_ = uVar1688 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar479._8_8_ = 0;
    auVar479._0_8_ = local_198;
    auVar1191._8_8_ = 0;
    auVar1191._0_8_ = local_198;
    auVar480._8_8_ = 0;
    auVar480._0_8_ = uStack_190;
    auVar1192._8_8_ = 0;
    auVar1192._0_8_ = local_178;
    auVar481._8_8_ = 0;
    auVar481._0_8_ = local_188 * 2;
    auVar1193._8_8_ = 0;
    auVar1193._0_8_ = uStack_180;
    auVar1 = auVar480 * auVar1192 + auVar1587 + auVar481 * auVar1193;
    uVar1703 = auVar1._0_8_;
    auVar1589._8_8_ = 0;
    auVar1589._0_8_ = uVar1703 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1194._8_8_ = 0;
    auVar1194._0_8_ = (uVar1703 & 0xfffffffffffff) << 4 | (uVar1688 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar479 * auVar1191 + ZEXT816(0x1000003d1) * auVar1194;
    uVar1704 = auVar1._0_8_;
    uVar1703 = uVar1704 & 0xfffffffffffff;
    auVar1588._8_8_ = 0;
    auVar1588._0_8_ = uVar1704 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar482._8_8_ = 0;
    auVar482._0_8_ = local_198 * 2;
    auVar1195._8_8_ = 0;
    auVar1195._0_8_ = uStack_190;
    auVar483._8_8_ = 0;
    auVar483._0_8_ = local_188;
    auVar1196._8_8_ = 0;
    auVar1196._0_8_ = local_178;
    auVar484._8_8_ = 0;
    auVar484._0_8_ = uStack_180;
    auVar1197._8_8_ = 0;
    auVar1197._0_8_ = uStack_180;
    auVar2 = auVar483 * auVar1196 + auVar1589 + auVar484 * auVar1197;
    uVar1704 = auVar2._0_8_;
    auVar485._8_8_ = 0;
    auVar485._0_8_ = uVar1704 & 0xfffffffffffff;
    auVar1 = auVar482 * auVar1195 + auVar1588 + auVar485 * ZEXT816(0x1000003d10);
    uVar1705 = auVar1._0_8_;
    auVar1591._8_8_ = 0;
    auVar1591._0_8_ = uVar1704 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1704 = uVar1705 & 0xfffffffffffff;
    auVar1590._8_8_ = 0;
    auVar1590._0_8_ = uVar1705 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar486._8_8_ = 0;
    auVar486._0_8_ = local_198 * 2;
    auVar1198._8_8_ = 0;
    auVar1198._0_8_ = local_188;
    auVar487._8_8_ = 0;
    auVar487._0_8_ = uStack_190;
    auVar1199._8_8_ = 0;
    auVar1199._0_8_ = uStack_190;
    auVar488._8_8_ = 0;
    auVar488._0_8_ = uStack_180;
    auVar1200._8_8_ = 0;
    auVar1200._0_8_ = local_178;
    auVar1591 = auVar488 * auVar1200 + auVar1591;
    uVar1705 = auVar1591._0_8_;
    auVar489._8_8_ = 0;
    auVar489._0_8_ = uVar1705 & 0xfffffffffffff;
    auVar1 = auVar486 * auVar1198 + auVar1590 + auVar487 * auVar1199 +
             auVar489 * ZEXT816(0x1000003d10);
    uVar1706 = auVar1._0_8_;
    local_188 = uVar1706 & 0xfffffffffffff;
    auVar1592._8_8_ = 0;
    auVar1592._0_8_ = (uVar1706 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1687 & 0xfffffffffffff);
    auVar490._8_8_ = 0;
    auVar490._0_8_ = uVar1705 >> 0x34 | auVar1591._8_8_ << 0xc;
    auVar1592 = auVar490 * ZEXT816(0x1000003d10) + auVar1592;
    uVar1687 = auVar1592._0_8_;
    uStack_180 = uVar1687 & 0xfffffffffffff;
    local_178 = (uVar1687 >> 0x34 | auVar1592._8_8_ << 0xc) + (uVar1688 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_198 = uVar1703;
    uStack_190 = uVar1704;
  } while (iVar1691 != 0);
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uVar1700;
  auVar1201._8_8_ = 0;
  auVar1201._0_8_ = uStack_180;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = uVar1701;
  auVar1202._8_8_ = 0;
  auVar1202._0_8_ = local_188;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = uVar1698;
  auVar1203._8_8_ = 0;
  auVar1203._0_8_ = uVar1704;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = uVar1699;
  auVar1204._8_8_ = 0;
  auVar1204._0_8_ = uVar1703;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = uVar1702;
  auVar1205._8_8_ = 0;
  auVar1205._0_8_ = local_178;
  uVar1687 = SUB168(auVar495 * auVar1205,0);
  auVar496._8_8_ = 0;
  auVar496._0_8_ = uVar1687 & 0xfffffffffffff;
  auVar1 = auVar492 * auVar1202 + auVar491 * auVar1201 + auVar493 * auVar1203 + auVar494 * auVar1204
           + auVar496 * ZEXT816(0x1000003d10);
  uVar1688 = auVar1._0_8_;
  auVar1593._8_8_ = 0;
  auVar1593._0_8_ = uVar1688 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = uVar1700;
  auVar1206._8_8_ = 0;
  auVar1206._0_8_ = local_178;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = uVar1701;
  auVar1207._8_8_ = 0;
  auVar1207._0_8_ = uStack_180;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = uVar1698;
  auVar1208._8_8_ = 0;
  auVar1208._0_8_ = local_188;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = uVar1699;
  auVar1209._8_8_ = 0;
  auVar1209._0_8_ = uVar1704;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = uVar1702;
  auVar1210._8_8_ = 0;
  auVar1210._0_8_ = uVar1703;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = uVar1687 >> 0x34 | SUB168(auVar495 * auVar1205,8) << 0xc;
  auVar1 = auVar497 * auVar1206 + auVar1593 + auVar498 * auVar1207 + auVar499 * auVar1208 +
           auVar500 * auVar1209 + auVar501 * auVar1210 + auVar502 * ZEXT816(0x1000003d10);
  uVar1687 = auVar1._0_8_;
  auVar1594._8_8_ = 0;
  auVar1594._0_8_ = uVar1687 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = uVar1700;
  auVar1211._8_8_ = 0;
  auVar1211._0_8_ = uVar1703;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = uVar1701;
  auVar1212._8_8_ = 0;
  auVar1212._0_8_ = local_178;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = uVar1698;
  auVar1213._8_8_ = 0;
  auVar1213._0_8_ = uStack_180;
  auVar506._8_8_ = 0;
  auVar506._0_8_ = uVar1699;
  auVar1214._8_8_ = 0;
  auVar1214._0_8_ = local_188;
  auVar507._8_8_ = 0;
  auVar507._0_8_ = uVar1702;
  auVar1215._8_8_ = 0;
  auVar1215._0_8_ = uVar1704;
  auVar1 = auVar504 * auVar1212 + auVar1594 + auVar505 * auVar1213 + auVar506 * auVar1214 +
           auVar507 * auVar1215;
  uVar1705 = auVar1._0_8_;
  auVar1596._8_8_ = 0;
  auVar1596._0_8_ = uVar1705 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1216._8_8_ = 0;
  auVar1216._0_8_ = (uVar1705 & 0xfffffffffffff) << 4 | (uVar1687 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar503 * auVar1211 + ZEXT816(0x1000003d1) * auVar1216;
  uVar1706 = auVar1._0_8_;
  auVar1595._8_8_ = 0;
  auVar1595._0_8_ = uVar1706 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = uVar1700;
  auVar1217._8_8_ = 0;
  auVar1217._0_8_ = uVar1704;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = uVar1701;
  auVar1218._8_8_ = 0;
  auVar1218._0_8_ = uVar1703;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = uVar1698;
  auVar1219._8_8_ = 0;
  auVar1219._0_8_ = local_178;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = uVar1699;
  auVar1220._8_8_ = 0;
  auVar1220._0_8_ = uStack_180;
  auVar512._8_8_ = 0;
  auVar512._0_8_ = uVar1702;
  auVar1221._8_8_ = 0;
  auVar1221._0_8_ = local_188;
  auVar2 = auVar510 * auVar1219 + auVar1596 + auVar511 * auVar1220 + auVar512 * auVar1221;
  uVar1705 = auVar2._0_8_;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = uVar1705 & 0xfffffffffffff;
  auVar1 = auVar508 * auVar1217 + auVar1595 + auVar509 * auVar1218 +
           auVar513 * ZEXT816(0x1000003d10);
  uVar1707 = auVar1._0_8_;
  auVar1598._8_8_ = 0;
  auVar1598._0_8_ = uVar1705 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1597._8_8_ = 0;
  auVar1597._0_8_ = uVar1707 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = uVar1700;
  auVar1222._8_8_ = 0;
  auVar1222._0_8_ = local_188;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = uVar1701;
  auVar1223._8_8_ = 0;
  auVar1223._0_8_ = uVar1704;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = uVar1698;
  auVar1224._8_8_ = 0;
  auVar1224._0_8_ = uVar1703;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = uVar1699;
  auVar1225._8_8_ = 0;
  auVar1225._0_8_ = local_178;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = uVar1702;
  auVar1226._8_8_ = 0;
  auVar1226._0_8_ = uStack_180;
  auVar2 = auVar517 * auVar1225 + auVar1598 + auVar518 * auVar1226;
  uVar1698 = auVar2._0_8_;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = uVar1698 & 0xfffffffffffff;
  auVar1 = auVar514 * auVar1222 + auVar1597 + auVar515 * auVar1223 + auVar516 * auVar1224 +
           auVar519 * ZEXT816(0x1000003d10);
  uVar1699 = auVar1._0_8_;
  local_1b8 = uVar1699 & 0xfffffffffffff;
  auVar1599._8_8_ = 0;
  auVar1599._0_8_ = (uVar1699 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1688 & 0xfffffffffffff);
  auVar520._8_8_ = 0;
  auVar520._0_8_ = uVar1698 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1599 = auVar520 * ZEXT816(0x1000003d10) + auVar1599;
  uVar1698 = auVar1599._0_8_;
  uStack_1b0 = uVar1698 & 0xfffffffffffff;
  local_1a8 = (uVar1698 >> 0x34 | auVar1599._8_8_ << 0xc) + (uVar1687 & 0xffffffffffff);
  iVar1691 = 3;
  local_1c8 = uVar1706 & 0xfffffffffffff;
  uStack_1c0 = uVar1707 & 0xfffffffffffff;
  do {
    auVar521._8_8_ = 0;
    auVar521._0_8_ = local_1c8 * 2;
    auVar1227._8_8_ = 0;
    auVar1227._0_8_ = uStack_1b0;
    auVar522._8_8_ = 0;
    auVar522._0_8_ = uStack_1c0 * 2;
    auVar1228._8_8_ = 0;
    auVar1228._0_8_ = local_1b8;
    auVar523._8_8_ = 0;
    auVar523._0_8_ = local_1a8;
    auVar1229._8_8_ = 0;
    auVar1229._0_8_ = local_1a8;
    uVar1698 = SUB168(auVar523 * auVar1229,0);
    auVar524._8_8_ = 0;
    auVar524._0_8_ = uVar1698 & 0xfffffffffffff;
    auVar1 = auVar522 * auVar1228 + auVar521 * auVar1227 + auVar524 * ZEXT816(0x1000003d10);
    uVar1700 = auVar1._0_8_;
    auVar1600._8_8_ = 0;
    auVar1600._0_8_ = uVar1700 >> 0x34 | auVar1._8_8_ << 0xc;
    local_1a8 = local_1a8 * 2;
    auVar525._8_8_ = 0;
    auVar525._0_8_ = local_1c8;
    auVar1230._8_8_ = 0;
    auVar1230._0_8_ = local_1a8;
    auVar526._8_8_ = 0;
    auVar526._0_8_ = uStack_1c0 * 2;
    auVar1231._8_8_ = 0;
    auVar1231._0_8_ = uStack_1b0;
    auVar527._8_8_ = 0;
    auVar527._0_8_ = local_1b8;
    auVar1232._8_8_ = 0;
    auVar1232._0_8_ = local_1b8;
    auVar528._8_8_ = 0;
    auVar528._0_8_ = uVar1698 >> 0x34 | SUB168(auVar523 * auVar1229,8) << 0xc;
    auVar1 = auVar525 * auVar1230 + auVar1600 + auVar526 * auVar1231 + auVar527 * auVar1232 +
             auVar528 * ZEXT816(0x1000003d10);
    uVar1701 = auVar1._0_8_;
    auVar1601._8_8_ = 0;
    auVar1601._0_8_ = uVar1701 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar529._8_8_ = 0;
    auVar529._0_8_ = local_1c8;
    auVar1233._8_8_ = 0;
    auVar1233._0_8_ = local_1c8;
    auVar530._8_8_ = 0;
    auVar530._0_8_ = uStack_1c0;
    auVar1234._8_8_ = 0;
    auVar1234._0_8_ = local_1a8;
    auVar531._8_8_ = 0;
    auVar531._0_8_ = local_1b8 * 2;
    auVar1235._8_8_ = 0;
    auVar1235._0_8_ = uStack_1b0;
    auVar1 = auVar530 * auVar1234 + auVar1601 + auVar531 * auVar1235;
    uVar1698 = auVar1._0_8_;
    auVar1603._8_8_ = 0;
    auVar1603._0_8_ = uVar1698 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1236._8_8_ = 0;
    auVar1236._0_8_ = (uVar1698 & 0xfffffffffffff) << 4 | (uVar1701 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar529 * auVar1233 + ZEXT816(0x1000003d1) * auVar1236;
    uVar1699 = auVar1._0_8_;
    uVar1698 = uVar1699 & 0xfffffffffffff;
    auVar1602._8_8_ = 0;
    auVar1602._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar532._8_8_ = 0;
    auVar532._0_8_ = local_1c8 * 2;
    auVar1237._8_8_ = 0;
    auVar1237._0_8_ = uStack_1c0;
    auVar533._8_8_ = 0;
    auVar533._0_8_ = local_1b8;
    auVar1238._8_8_ = 0;
    auVar1238._0_8_ = local_1a8;
    auVar534._8_8_ = 0;
    auVar534._0_8_ = uStack_1b0;
    auVar1239._8_8_ = 0;
    auVar1239._0_8_ = uStack_1b0;
    auVar2 = auVar533 * auVar1238 + auVar1603 + auVar534 * auVar1239;
    uVar1699 = auVar2._0_8_;
    auVar535._8_8_ = 0;
    auVar535._0_8_ = uVar1699 & 0xfffffffffffff;
    auVar1 = auVar532 * auVar1237 + auVar1602 + auVar535 * ZEXT816(0x1000003d10);
    uVar1702 = auVar1._0_8_;
    auVar1605._8_8_ = 0;
    auVar1605._0_8_ = uVar1699 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1699 = uVar1702 & 0xfffffffffffff;
    auVar1604._8_8_ = 0;
    auVar1604._0_8_ = uVar1702 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar536._8_8_ = 0;
    auVar536._0_8_ = local_1c8 * 2;
    auVar1240._8_8_ = 0;
    auVar1240._0_8_ = local_1b8;
    auVar537._8_8_ = 0;
    auVar537._0_8_ = uStack_1c0;
    auVar1241._8_8_ = 0;
    auVar1241._0_8_ = uStack_1c0;
    auVar538._8_8_ = 0;
    auVar538._0_8_ = uStack_1b0;
    auVar1242._8_8_ = 0;
    auVar1242._0_8_ = local_1a8;
    auVar1605 = auVar538 * auVar1242 + auVar1605;
    uVar1702 = auVar1605._0_8_;
    auVar539._8_8_ = 0;
    auVar539._0_8_ = uVar1702 & 0xfffffffffffff;
    auVar1 = auVar536 * auVar1240 + auVar1604 + auVar537 * auVar1241 +
             auVar539 * ZEXT816(0x1000003d10);
    uVar1703 = auVar1._0_8_;
    local_1b8 = uVar1703 & 0xfffffffffffff;
    auVar1606._8_8_ = 0;
    auVar1606._0_8_ = (uVar1703 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1700 & 0xfffffffffffff);
    auVar540._8_8_ = 0;
    auVar540._0_8_ = uVar1702 >> 0x34 | auVar1605._8_8_ << 0xc;
    auVar1606 = auVar540 * ZEXT816(0x1000003d10) + auVar1606;
    uVar1700 = auVar1606._0_8_;
    uStack_1b0 = uVar1700 & 0xfffffffffffff;
    local_1a8 = (uVar1700 >> 0x34 | auVar1606._8_8_ << 0xc) + (uVar1701 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_1c8 = uVar1698;
    uStack_1c0 = uVar1699;
  } while (iVar1691 != 0);
  auVar541._8_8_ = 0;
  auVar541._0_8_ = uVar1683;
  auVar1243._8_8_ = 0;
  auVar1243._0_8_ = uStack_1b0;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = uVar1693;
  auVar1244._8_8_ = 0;
  auVar1244._0_8_ = local_1b8;
  auVar543._8_8_ = 0;
  auVar543._0_8_ = uVar1679;
  auVar1245._8_8_ = 0;
  auVar1245._0_8_ = uVar1699;
  auVar544._8_8_ = 0;
  auVar544._0_8_ = uVar1678;
  auVar1246._8_8_ = 0;
  auVar1246._0_8_ = uVar1698;
  auVar545._8_8_ = 0;
  auVar545._0_8_ = uVar1692;
  auVar1247._8_8_ = 0;
  auVar1247._0_8_ = local_1a8;
  uVar1700 = SUB168(auVar545 * auVar1247,0);
  auVar546._8_8_ = 0;
  auVar546._0_8_ = uVar1700 & 0xfffffffffffff;
  auVar1 = auVar542 * auVar1244 + auVar541 * auVar1243 + auVar543 * auVar1245 + auVar544 * auVar1246
           + auVar546 * ZEXT816(0x1000003d10);
  uVar1701 = auVar1._0_8_;
  auVar1607._8_8_ = 0;
  auVar1607._0_8_ = uVar1701 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = uVar1683;
  auVar1248._8_8_ = 0;
  auVar1248._0_8_ = local_1a8;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = uVar1693;
  auVar1249._8_8_ = 0;
  auVar1249._0_8_ = uStack_1b0;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = uVar1679;
  auVar1250._8_8_ = 0;
  auVar1250._0_8_ = local_1b8;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = uVar1678;
  auVar1251._8_8_ = 0;
  auVar1251._0_8_ = uVar1699;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = uVar1692;
  auVar1252._8_8_ = 0;
  auVar1252._0_8_ = uVar1698;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = uVar1700 >> 0x34 | SUB168(auVar545 * auVar1247,8) << 0xc;
  auVar1 = auVar547 * auVar1248 + auVar1607 + auVar548 * auVar1249 + auVar549 * auVar1250 +
           auVar550 * auVar1251 + auVar551 * auVar1252 + auVar552 * ZEXT816(0x1000003d10);
  uVar1700 = auVar1._0_8_;
  auVar1608._8_8_ = 0;
  auVar1608._0_8_ = uVar1700 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = uVar1683;
  auVar1253._8_8_ = 0;
  auVar1253._0_8_ = uVar1698;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = uVar1693;
  auVar1254._8_8_ = 0;
  auVar1254._0_8_ = local_1a8;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = uVar1679;
  auVar1255._8_8_ = 0;
  auVar1255._0_8_ = uStack_1b0;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = uVar1678;
  auVar1256._8_8_ = 0;
  auVar1256._0_8_ = local_1b8;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = uVar1692;
  auVar1257._8_8_ = 0;
  auVar1257._0_8_ = uVar1699;
  auVar1 = auVar554 * auVar1254 + auVar1608 + auVar555 * auVar1255 + auVar556 * auVar1256 +
           auVar557 * auVar1257;
  uVar1702 = auVar1._0_8_;
  auVar1610._8_8_ = 0;
  auVar1610._0_8_ = uVar1702 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1258._8_8_ = 0;
  auVar1258._0_8_ = (uVar1702 & 0xfffffffffffff) << 4 | (uVar1700 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar553 * auVar1253 + ZEXT816(0x1000003d1) * auVar1258;
  uVar1703 = auVar1._0_8_;
  auVar1609._8_8_ = 0;
  auVar1609._0_8_ = uVar1703 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = uVar1683;
  auVar1259._8_8_ = 0;
  auVar1259._0_8_ = uVar1699;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = uVar1693;
  auVar1260._8_8_ = 0;
  auVar1260._0_8_ = uVar1698;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = uVar1679;
  auVar1261._8_8_ = 0;
  auVar1261._0_8_ = local_1a8;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = uVar1678;
  auVar1262._8_8_ = 0;
  auVar1262._0_8_ = uStack_1b0;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = uVar1692;
  auVar1263._8_8_ = 0;
  auVar1263._0_8_ = local_1b8;
  auVar2 = auVar560 * auVar1261 + auVar1610 + auVar561 * auVar1262 + auVar562 * auVar1263;
  uVar1702 = auVar2._0_8_;
  auVar563._8_8_ = 0;
  auVar563._0_8_ = uVar1702 & 0xfffffffffffff;
  auVar1 = auVar558 * auVar1259 + auVar1609 + auVar559 * auVar1260 +
           auVar563 * ZEXT816(0x1000003d10);
  uVar1704 = auVar1._0_8_;
  auVar1612._8_8_ = 0;
  auVar1612._0_8_ = uVar1702 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1611._8_8_ = 0;
  auVar1611._0_8_ = uVar1704 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = uVar1683;
  auVar1264._8_8_ = 0;
  auVar1264._0_8_ = local_1b8;
  auVar565._8_8_ = 0;
  auVar565._0_8_ = uVar1693;
  auVar1265._8_8_ = 0;
  auVar1265._0_8_ = uVar1699;
  auVar566._8_8_ = 0;
  auVar566._0_8_ = uVar1679;
  auVar1266._8_8_ = 0;
  auVar1266._0_8_ = uVar1698;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = uVar1678;
  auVar1267._8_8_ = 0;
  auVar1267._0_8_ = local_1a8;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = uVar1692;
  auVar1268._8_8_ = 0;
  auVar1268._0_8_ = uStack_1b0;
  auVar2 = auVar567 * auVar1267 + auVar1612 + auVar568 * auVar1268;
  uVar1679 = auVar2._0_8_;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = uVar1679 & 0xfffffffffffff;
  auVar1 = auVar564 * auVar1264 + auVar1611 + auVar565 * auVar1265 + auVar566 * auVar1266 +
           auVar569 * ZEXT816(0x1000003d10);
  uVar1678 = auVar1._0_8_;
  local_98 = uVar1678 & 0xfffffffffffff;
  auVar1613._8_8_ = 0;
  auVar1613._0_8_ = (uVar1678 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1701 & 0xfffffffffffff);
  auVar570._8_8_ = 0;
  auVar570._0_8_ = uVar1679 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1613 = auVar570 * ZEXT816(0x1000003d10) + auVar1613;
  uVar1679 = auVar1613._0_8_;
  uStack_90 = uVar1679 & 0xfffffffffffff;
  local_88 = (uVar1679 >> 0x34 | auVar1613._8_8_ << 0xc) + (uVar1700 & 0xffffffffffff);
  iVar1691 = 0x17;
  local_a8 = uVar1703 & 0xfffffffffffff;
  uStack_a0 = uVar1704 & 0xfffffffffffff;
  do {
    auVar571._8_8_ = 0;
    auVar571._0_8_ = local_a8 * 2;
    auVar1269._8_8_ = 0;
    auVar1269._0_8_ = uStack_90;
    auVar572._8_8_ = 0;
    auVar572._0_8_ = uStack_a0 * 2;
    auVar1270._8_8_ = 0;
    auVar1270._0_8_ = local_98;
    auVar573._8_8_ = 0;
    auVar573._0_8_ = local_88;
    auVar1271._8_8_ = 0;
    auVar1271._0_8_ = local_88;
    uVar1679 = SUB168(auVar573 * auVar1271,0);
    auVar574._8_8_ = 0;
    auVar574._0_8_ = uVar1679 & 0xfffffffffffff;
    auVar1 = auVar572 * auVar1270 + auVar571 * auVar1269 + auVar574 * ZEXT816(0x1000003d10);
    uVar1692 = auVar1._0_8_;
    auVar1614._8_8_ = 0;
    auVar1614._0_8_ = uVar1692 >> 0x34 | auVar1._8_8_ << 0xc;
    local_88 = local_88 * 2;
    auVar575._8_8_ = 0;
    auVar575._0_8_ = local_a8;
    auVar1272._8_8_ = 0;
    auVar1272._0_8_ = local_88;
    auVar576._8_8_ = 0;
    auVar576._0_8_ = uStack_a0 * 2;
    auVar1273._8_8_ = 0;
    auVar1273._0_8_ = uStack_90;
    auVar577._8_8_ = 0;
    auVar577._0_8_ = local_98;
    auVar1274._8_8_ = 0;
    auVar1274._0_8_ = local_98;
    auVar578._8_8_ = 0;
    auVar578._0_8_ = uVar1679 >> 0x34 | SUB168(auVar573 * auVar1271,8) << 0xc;
    auVar1 = auVar575 * auVar1272 + auVar1614 + auVar576 * auVar1273 + auVar577 * auVar1274 +
             auVar578 * ZEXT816(0x1000003d10);
    uVar1683 = auVar1._0_8_;
    auVar1615._8_8_ = 0;
    auVar1615._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar579._8_8_ = 0;
    auVar579._0_8_ = local_a8;
    auVar1275._8_8_ = 0;
    auVar1275._0_8_ = local_a8;
    auVar580._8_8_ = 0;
    auVar580._0_8_ = uStack_a0;
    auVar1276._8_8_ = 0;
    auVar1276._0_8_ = local_88;
    auVar581._8_8_ = 0;
    auVar581._0_8_ = local_98 * 2;
    auVar1277._8_8_ = 0;
    auVar1277._0_8_ = uStack_90;
    auVar1 = auVar580 * auVar1276 + auVar1615 + auVar581 * auVar1277;
    uVar1679 = auVar1._0_8_;
    auVar1617._8_8_ = 0;
    auVar1617._0_8_ = uVar1679 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1278._8_8_ = 0;
    auVar1278._0_8_ = (uVar1679 & 0xfffffffffffff) << 4 | (uVar1683 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar579 * auVar1275 + ZEXT816(0x1000003d1) * auVar1278;
    uVar1678 = auVar1._0_8_;
    uVar1679 = uVar1678 & 0xfffffffffffff;
    auVar1616._8_8_ = 0;
    auVar1616._0_8_ = uVar1678 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar582._8_8_ = 0;
    auVar582._0_8_ = local_a8 * 2;
    auVar1279._8_8_ = 0;
    auVar1279._0_8_ = uStack_a0;
    auVar583._8_8_ = 0;
    auVar583._0_8_ = local_98;
    auVar1280._8_8_ = 0;
    auVar1280._0_8_ = local_88;
    auVar584._8_8_ = 0;
    auVar584._0_8_ = uStack_90;
    auVar1281._8_8_ = 0;
    auVar1281._0_8_ = uStack_90;
    auVar2 = auVar583 * auVar1280 + auVar1617 + auVar584 * auVar1281;
    uVar1678 = auVar2._0_8_;
    auVar585._8_8_ = 0;
    auVar585._0_8_ = uVar1678 & 0xfffffffffffff;
    auVar1 = auVar582 * auVar1279 + auVar1616 + auVar585 * ZEXT816(0x1000003d10);
    uVar1693 = auVar1._0_8_;
    auVar1619._8_8_ = 0;
    auVar1619._0_8_ = uVar1678 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1678 = uVar1693 & 0xfffffffffffff;
    auVar1618._8_8_ = 0;
    auVar1618._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar586._8_8_ = 0;
    auVar586._0_8_ = local_a8 * 2;
    auVar1282._8_8_ = 0;
    auVar1282._0_8_ = local_98;
    auVar587._8_8_ = 0;
    auVar587._0_8_ = uStack_a0;
    auVar1283._8_8_ = 0;
    auVar1283._0_8_ = uStack_a0;
    auVar588._8_8_ = 0;
    auVar588._0_8_ = uStack_90;
    auVar1284._8_8_ = 0;
    auVar1284._0_8_ = local_88;
    auVar1619 = auVar588 * auVar1284 + auVar1619;
    uVar1693 = auVar1619._0_8_;
    auVar589._8_8_ = 0;
    auVar589._0_8_ = uVar1693 & 0xfffffffffffff;
    auVar1 = auVar586 * auVar1282 + auVar1618 + auVar587 * auVar1283 +
             auVar589 * ZEXT816(0x1000003d10);
    uVar1698 = auVar1._0_8_;
    local_98 = uVar1698 & 0xfffffffffffff;
    auVar1620._8_8_ = 0;
    auVar1620._0_8_ = (uVar1698 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1692 & 0xfffffffffffff);
    auVar590._8_8_ = 0;
    auVar590._0_8_ = uVar1693 >> 0x34 | auVar1619._8_8_ << 0xc;
    auVar1620 = auVar590 * ZEXT816(0x1000003d10) + auVar1620;
    uVar1692 = auVar1620._0_8_;
    uStack_90 = uVar1692 & 0xfffffffffffff;
    local_88 = (uVar1692 >> 0x34 | auVar1620._8_8_ << 0xc) + (uVar1683 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_a8 = uVar1679;
    uStack_a0 = uVar1678;
  } while (iVar1691 != 0);
  auVar591._8_8_ = 0;
  auVar591._0_8_ = uVar1685;
  auVar1285._8_8_ = 0;
  auVar1285._0_8_ = uStack_90;
  auVar592._8_8_ = 0;
  auVar592._0_8_ = uVar1686;
  auVar1286._8_8_ = 0;
  auVar1286._0_8_ = local_98;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = uVar1682;
  auVar1287._8_8_ = 0;
  auVar1287._0_8_ = uVar1678;
  auVar594._8_8_ = 0;
  auVar594._0_8_ = uVar1697;
  auVar1288._8_8_ = 0;
  auVar1288._0_8_ = uVar1679;
  auVar595._8_8_ = 0;
  auVar595._0_8_ = uVar1681;
  auVar1289._8_8_ = 0;
  auVar1289._0_8_ = local_88;
  uVar1692 = SUB168(auVar595 * auVar1289,0);
  auVar596._8_8_ = 0;
  auVar596._0_8_ = uVar1692 & 0xfffffffffffff;
  auVar1 = auVar592 * auVar1286 + auVar591 * auVar1285 + auVar593 * auVar1287 + auVar594 * auVar1288
           + auVar596 * ZEXT816(0x1000003d10);
  uVar1683 = auVar1._0_8_;
  auVar1621._8_8_ = 0;
  auVar1621._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar597._8_8_ = 0;
  auVar597._0_8_ = uVar1685;
  auVar1290._8_8_ = 0;
  auVar1290._0_8_ = local_88;
  auVar598._8_8_ = 0;
  auVar598._0_8_ = uVar1686;
  auVar1291._8_8_ = 0;
  auVar1291._0_8_ = uStack_90;
  auVar599._8_8_ = 0;
  auVar599._0_8_ = uVar1682;
  auVar1292._8_8_ = 0;
  auVar1292._0_8_ = local_98;
  auVar600._8_8_ = 0;
  auVar600._0_8_ = uVar1697;
  auVar1293._8_8_ = 0;
  auVar1293._0_8_ = uVar1678;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = uVar1681;
  auVar1294._8_8_ = 0;
  auVar1294._0_8_ = uVar1679;
  auVar602._8_8_ = 0;
  auVar602._0_8_ = uVar1692 >> 0x34 | SUB168(auVar595 * auVar1289,8) << 0xc;
  auVar1 = auVar597 * auVar1290 + auVar1621 + auVar598 * auVar1291 + auVar599 * auVar1292 +
           auVar600 * auVar1293 + auVar601 * auVar1294 + auVar602 * ZEXT816(0x1000003d10);
  uVar1692 = auVar1._0_8_;
  auVar1622._8_8_ = 0;
  auVar1622._0_8_ = uVar1692 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar603._8_8_ = 0;
  auVar603._0_8_ = uVar1685;
  auVar1295._8_8_ = 0;
  auVar1295._0_8_ = uVar1679;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = uVar1686;
  auVar1296._8_8_ = 0;
  auVar1296._0_8_ = local_88;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = uVar1682;
  auVar1297._8_8_ = 0;
  auVar1297._0_8_ = uStack_90;
  auVar606._8_8_ = 0;
  auVar606._0_8_ = uVar1697;
  auVar1298._8_8_ = 0;
  auVar1298._0_8_ = local_98;
  auVar607._8_8_ = 0;
  auVar607._0_8_ = uVar1681;
  auVar1299._8_8_ = 0;
  auVar1299._0_8_ = uVar1678;
  auVar1 = auVar604 * auVar1296 + auVar1622 + auVar605 * auVar1297 + auVar606 * auVar1298 +
           auVar607 * auVar1299;
  uVar1693 = auVar1._0_8_;
  auVar1624._8_8_ = 0;
  auVar1624._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1300._8_8_ = 0;
  auVar1300._0_8_ = (uVar1693 & 0xfffffffffffff) << 4 | (uVar1692 & 0xfffffffffffff) >> 0x30;
  uVar1698 = auVar621._0_8_;
  auVar621 = auVar603 * auVar1295 + ZEXT816(0x1000003d1) * auVar1300;
  auVar1623._8_8_ = 0;
  auVar1623._0_8_ = uVar1698 >> 0x34 | auVar621._8_8_ << 0xc;
  auVar608._8_8_ = 0;
  auVar608._0_8_ = uVar1685;
  auVar1301._8_8_ = 0;
  auVar1301._0_8_ = uVar1678;
  auVar609._8_8_ = 0;
  auVar609._0_8_ = uVar1686;
  auVar1302._8_8_ = 0;
  auVar1302._0_8_ = uVar1679;
  auVar610._8_8_ = 0;
  auVar610._0_8_ = uVar1682;
  auVar1303._8_8_ = 0;
  auVar1303._0_8_ = local_88;
  auVar611._8_8_ = 0;
  auVar611._0_8_ = uVar1697;
  auVar1304._8_8_ = 0;
  auVar1304._0_8_ = uStack_90;
  auVar612._8_8_ = 0;
  auVar612._0_8_ = uVar1681;
  auVar1305._8_8_ = 0;
  auVar1305._0_8_ = local_98;
  auVar2 = auVar610 * auVar1303 + auVar1624 + auVar611 * auVar1304 + auVar612 * auVar1305;
  uVar1693 = auVar2._0_8_;
  auVar613._8_8_ = 0;
  auVar613._0_8_ = uVar1693 & 0xfffffffffffff;
  auVar1 = auVar608 * auVar1301 + auVar1623 + auVar609 * auVar1302 +
           auVar613 * ZEXT816(0x1000003d10);
  uVar1699 = auVar1._0_8_;
  auVar1626._8_8_ = 0;
  auVar1626._0_8_ = uVar1693 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1625._8_8_ = 0;
  auVar1625._0_8_ = uVar1699 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar614._8_8_ = 0;
  auVar614._0_8_ = uVar1685;
  auVar1306._8_8_ = 0;
  auVar1306._0_8_ = local_98;
  auVar615._8_8_ = 0;
  auVar615._0_8_ = uVar1686;
  auVar1307._8_8_ = 0;
  auVar1307._0_8_ = uVar1678;
  auVar616._8_8_ = 0;
  auVar616._0_8_ = uVar1682;
  auVar1308._8_8_ = 0;
  auVar1308._0_8_ = uVar1679;
  auVar617._8_8_ = 0;
  auVar617._0_8_ = uVar1697;
  auVar1309._8_8_ = 0;
  auVar1309._0_8_ = local_88;
  auVar618._8_8_ = 0;
  auVar618._0_8_ = uVar1681;
  auVar1310._8_8_ = 0;
  auVar1310._0_8_ = uStack_90;
  auVar2 = auVar617 * auVar1309 + auVar1626 + auVar618 * auVar1310;
  uVar1679 = auVar2._0_8_;
  auVar619._8_8_ = 0;
  auVar619._0_8_ = uVar1679 & 0xfffffffffffff;
  auVar1 = auVar614 * auVar1306 + auVar1625 + auVar615 * auVar1307 + auVar616 * auVar1308 +
           auVar619 * ZEXT816(0x1000003d10);
  uVar1678 = auVar1._0_8_;
  local_98 = uVar1678 & 0xfffffffffffff;
  auVar1627._8_8_ = 0;
  auVar1627._0_8_ = (uVar1678 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1683 & 0xfffffffffffff);
  auVar620._8_8_ = 0;
  auVar620._0_8_ = uVar1679 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1627 = auVar620 * ZEXT816(0x1000003d10) + auVar1627;
  uVar1679 = auVar1627._0_8_;
  uStack_90 = uVar1679 & 0xfffffffffffff;
  local_88 = (uVar1679 >> 0x34 | auVar1627._8_8_ << 0xc) + (uVar1692 & 0xffffffffffff);
  iVar1691 = 5;
  local_a8 = uVar1698 & 0xfffffffffffff;
  uStack_a0 = uVar1699 & 0xfffffffffffff;
  do {
    auVar621._8_8_ = 0;
    auVar621._0_8_ = local_a8 * 2;
    auVar1311._8_8_ = 0;
    auVar1311._0_8_ = uStack_90;
    auVar622._8_8_ = 0;
    auVar622._0_8_ = uStack_a0 * 2;
    auVar1312._8_8_ = 0;
    auVar1312._0_8_ = local_98;
    auVar623._8_8_ = 0;
    auVar623._0_8_ = local_88;
    auVar1313._8_8_ = 0;
    auVar1313._0_8_ = local_88;
    uVar1679 = SUB168(auVar623 * auVar1313,0);
    auVar624._8_8_ = 0;
    auVar624._0_8_ = uVar1679 & 0xfffffffffffff;
    auVar1 = auVar622 * auVar1312 + auVar621 * auVar1311 + auVar624 * ZEXT816(0x1000003d10);
    uVar1692 = auVar1._0_8_;
    auVar1628._8_8_ = 0;
    auVar1628._0_8_ = uVar1692 >> 0x34 | auVar1._8_8_ << 0xc;
    local_88 = local_88 * 2;
    auVar625._8_8_ = 0;
    auVar625._0_8_ = local_a8;
    auVar1314._8_8_ = 0;
    auVar1314._0_8_ = local_88;
    auVar626._8_8_ = 0;
    auVar626._0_8_ = uStack_a0 * 2;
    auVar1315._8_8_ = 0;
    auVar1315._0_8_ = uStack_90;
    auVar627._8_8_ = 0;
    auVar627._0_8_ = local_98;
    auVar1316._8_8_ = 0;
    auVar1316._0_8_ = local_98;
    auVar628._8_8_ = 0;
    auVar628._0_8_ = uVar1679 >> 0x34 | SUB168(auVar623 * auVar1313,8) << 0xc;
    auVar1 = auVar625 * auVar1314 + auVar1628 + auVar626 * auVar1315 + auVar627 * auVar1316 +
             auVar628 * ZEXT816(0x1000003d10);
    uVar1682 = auVar1._0_8_;
    auVar1629._8_8_ = 0;
    auVar1629._0_8_ = uVar1682 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar629._8_8_ = 0;
    auVar629._0_8_ = local_a8;
    auVar1317._8_8_ = 0;
    auVar1317._0_8_ = local_a8;
    auVar630._8_8_ = 0;
    auVar630._0_8_ = uStack_a0;
    auVar1318._8_8_ = 0;
    auVar1318._0_8_ = local_88;
    auVar631._8_8_ = 0;
    auVar631._0_8_ = local_98 * 2;
    auVar1319._8_8_ = 0;
    auVar1319._0_8_ = uStack_90;
    auVar1 = auVar630 * auVar1318 + auVar1629 + auVar631 * auVar1319;
    uVar1679 = auVar1._0_8_;
    auVar1631._8_8_ = 0;
    auVar1631._0_8_ = uVar1679 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1320._8_8_ = 0;
    auVar1320._0_8_ = (uVar1679 & 0xfffffffffffff) << 4 | (uVar1682 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar629 * auVar1317 + ZEXT816(0x1000003d1) * auVar1320;
    uVar1678 = auVar1._0_8_;
    uVar1679 = uVar1678 & 0xfffffffffffff;
    auVar1630._8_8_ = 0;
    auVar1630._0_8_ = uVar1678 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar632._8_8_ = 0;
    auVar632._0_8_ = local_a8 * 2;
    auVar1321._8_8_ = 0;
    auVar1321._0_8_ = uStack_a0;
    auVar633._8_8_ = 0;
    auVar633._0_8_ = local_98;
    auVar1322._8_8_ = 0;
    auVar1322._0_8_ = local_88;
    auVar634._8_8_ = 0;
    auVar634._0_8_ = uStack_90;
    auVar1323._8_8_ = 0;
    auVar1323._0_8_ = uStack_90;
    auVar2 = auVar633 * auVar1322 + auVar1631 + auVar634 * auVar1323;
    uVar1678 = auVar2._0_8_;
    auVar635._8_8_ = 0;
    auVar635._0_8_ = uVar1678 & 0xfffffffffffff;
    auVar1 = auVar632 * auVar1321 + auVar1630 + auVar635 * ZEXT816(0x1000003d10);
    uVar1683 = auVar1._0_8_;
    auVar1633._8_8_ = 0;
    auVar1633._0_8_ = uVar1678 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1678 = uVar1683 & 0xfffffffffffff;
    auVar1632._8_8_ = 0;
    auVar1632._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar636._8_8_ = 0;
    auVar636._0_8_ = local_a8 * 2;
    auVar1324._8_8_ = 0;
    auVar1324._0_8_ = local_98;
    auVar637._8_8_ = 0;
    auVar637._0_8_ = uStack_a0;
    auVar1325._8_8_ = 0;
    auVar1325._0_8_ = uStack_a0;
    auVar638._8_8_ = 0;
    auVar638._0_8_ = uStack_90;
    auVar1326._8_8_ = 0;
    auVar1326._0_8_ = local_88;
    auVar1633 = auVar638 * auVar1326 + auVar1633;
    uVar1683 = auVar1633._0_8_;
    auVar639._8_8_ = 0;
    auVar639._0_8_ = uVar1683 & 0xfffffffffffff;
    auVar1 = auVar636 * auVar1324 + auVar1632 + auVar637 * auVar1325 +
             auVar639 * ZEXT816(0x1000003d10);
    uVar1693 = auVar1._0_8_;
    local_98 = uVar1693 & 0xfffffffffffff;
    auVar1634._8_8_ = 0;
    auVar1634._0_8_ = (uVar1693 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1692 & 0xfffffffffffff);
    auVar640._8_8_ = 0;
    auVar640._0_8_ = uVar1683 >> 0x34 | auVar1633._8_8_ << 0xc;
    auVar1634 = auVar640 * ZEXT816(0x1000003d10) + auVar1634;
    uVar1692 = auVar1634._0_8_;
    uStack_90 = uVar1692 & 0xfffffffffffff;
    local_88 = (uVar1692 >> 0x34 | auVar1634._8_8_ << 0xc) + (uVar1682 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_a8 = uVar1679;
    uStack_a0 = uVar1678;
  } while (iVar1691 != 0);
  auVar641._8_8_ = 0;
  auVar641._0_8_ = a->n[0];
  auVar1327._8_8_ = 0;
  auVar1327._0_8_ = uStack_90;
  auVar642._8_8_ = 0;
  auVar642._0_8_ = a->n[1];
  auVar1328._8_8_ = 0;
  auVar1328._0_8_ = local_98;
  auVar643._8_8_ = 0;
  auVar643._0_8_ = a->n[2];
  auVar1329._8_8_ = 0;
  auVar1329._0_8_ = uVar1678;
  auVar644._8_8_ = 0;
  auVar644._0_8_ = a->n[3];
  auVar1330._8_8_ = 0;
  auVar1330._0_8_ = uVar1679;
  auVar645._8_8_ = 0;
  auVar645._0_8_ = a->n[4];
  auVar1331._8_8_ = 0;
  auVar1331._0_8_ = local_88;
  uVar1692 = SUB168(auVar645 * auVar1331,0);
  auVar646._8_8_ = 0;
  auVar646._0_8_ = uVar1692 & 0xfffffffffffff;
  auVar1 = auVar642 * auVar1328 + auVar641 * auVar1327 + auVar643 * auVar1329 + auVar644 * auVar1330
           + auVar646 * ZEXT816(0x1000003d10);
  uVar1682 = auVar1._0_8_;
  auVar1635._8_8_ = 0;
  auVar1635._0_8_ = uVar1682 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar647._8_8_ = 0;
  auVar647._0_8_ = a->n[0];
  auVar1332._8_8_ = 0;
  auVar1332._0_8_ = local_88;
  auVar648._8_8_ = 0;
  auVar648._0_8_ = a->n[1];
  auVar1333._8_8_ = 0;
  auVar1333._0_8_ = uStack_90;
  auVar649._8_8_ = 0;
  auVar649._0_8_ = a->n[2];
  auVar1334._8_8_ = 0;
  auVar1334._0_8_ = local_98;
  auVar650._8_8_ = 0;
  auVar650._0_8_ = a->n[3];
  auVar1335._8_8_ = 0;
  auVar1335._0_8_ = uVar1678;
  auVar651._8_8_ = 0;
  auVar651._0_8_ = a->n[4];
  auVar1336._8_8_ = 0;
  auVar1336._0_8_ = uVar1679;
  auVar652._8_8_ = 0;
  auVar652._0_8_ = uVar1692 >> 0x34 | SUB168(auVar645 * auVar1331,8) << 0xc;
  auVar1 = auVar647 * auVar1332 + auVar1635 + auVar648 * auVar1333 + auVar649 * auVar1334 +
           auVar650 * auVar1335 + auVar651 * auVar1336 + auVar652 * ZEXT816(0x1000003d10);
  uVar1692 = auVar1._0_8_;
  auVar1636._8_8_ = 0;
  auVar1636._0_8_ = uVar1692 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar653._8_8_ = 0;
  auVar653._0_8_ = a->n[0];
  auVar1337._8_8_ = 0;
  auVar1337._0_8_ = uVar1679;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = a->n[1];
  auVar1338._8_8_ = 0;
  auVar1338._0_8_ = local_88;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = a->n[2];
  auVar1339._8_8_ = 0;
  auVar1339._0_8_ = uStack_90;
  auVar656._8_8_ = 0;
  auVar656._0_8_ = a->n[3];
  auVar1340._8_8_ = 0;
  auVar1340._0_8_ = local_98;
  auVar657._8_8_ = 0;
  auVar657._0_8_ = a->n[4];
  auVar1341._8_8_ = 0;
  auVar1341._0_8_ = uVar1678;
  auVar1 = auVar654 * auVar1338 + auVar1636 + auVar655 * auVar1339 + auVar656 * auVar1340 +
           auVar657 * auVar1341;
  uVar1683 = auVar1._0_8_;
  auVar1638._8_8_ = 0;
  auVar1638._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1342._8_8_ = 0;
  auVar1342._0_8_ = (uVar1683 & 0xfffffffffffff) << 4 | (uVar1692 & 0xfffffffffffff) >> 0x30;
  uVar1693 = auVar671._0_8_;
  auVar671 = auVar653 * auVar1337 + ZEXT816(0x1000003d1) * auVar1342;
  auVar1637._8_8_ = 0;
  auVar1637._0_8_ = uVar1693 >> 0x34 | auVar671._8_8_ << 0xc;
  auVar658._8_8_ = 0;
  auVar658._0_8_ = a->n[0];
  auVar1343._8_8_ = 0;
  auVar1343._0_8_ = uVar1678;
  auVar659._8_8_ = 0;
  auVar659._0_8_ = a->n[1];
  auVar1344._8_8_ = 0;
  auVar1344._0_8_ = uVar1679;
  auVar660._8_8_ = 0;
  auVar660._0_8_ = a->n[2];
  auVar1345._8_8_ = 0;
  auVar1345._0_8_ = local_88;
  auVar661._8_8_ = 0;
  auVar661._0_8_ = a->n[3];
  auVar1346._8_8_ = 0;
  auVar1346._0_8_ = uStack_90;
  auVar662._8_8_ = 0;
  auVar662._0_8_ = a->n[4];
  auVar1347._8_8_ = 0;
  auVar1347._0_8_ = local_98;
  auVar2 = auVar660 * auVar1345 + auVar1638 + auVar661 * auVar1346 + auVar662 * auVar1347;
  uVar1683 = auVar2._0_8_;
  auVar663._8_8_ = 0;
  auVar663._0_8_ = uVar1683 & 0xfffffffffffff;
  auVar1 = auVar658 * auVar1343 + auVar1637 + auVar659 * auVar1344 +
           auVar663 * ZEXT816(0x1000003d10);
  uVar1697 = auVar1._0_8_;
  auVar1640._8_8_ = 0;
  auVar1640._0_8_ = uVar1683 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1639._8_8_ = 0;
  auVar1639._0_8_ = uVar1697 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar664._8_8_ = 0;
  auVar664._0_8_ = a->n[0];
  auVar1348._8_8_ = 0;
  auVar1348._0_8_ = local_98;
  auVar665._8_8_ = 0;
  auVar665._0_8_ = a->n[1];
  auVar1349._8_8_ = 0;
  auVar1349._0_8_ = uVar1678;
  auVar666._8_8_ = 0;
  auVar666._0_8_ = a->n[2];
  auVar1350._8_8_ = 0;
  auVar1350._0_8_ = uVar1679;
  auVar667._8_8_ = 0;
  auVar667._0_8_ = a->n[3];
  auVar1351._8_8_ = 0;
  auVar1351._0_8_ = local_88;
  auVar668._8_8_ = 0;
  auVar668._0_8_ = a->n[4];
  auVar1352._8_8_ = 0;
  auVar1352._0_8_ = uStack_90;
  auVar2 = auVar667 * auVar1351 + auVar1640 + auVar668 * auVar1352;
  uVar1679 = auVar2._0_8_;
  auVar669._8_8_ = 0;
  auVar669._0_8_ = uVar1679 & 0xfffffffffffff;
  auVar1 = auVar664 * auVar1348 + auVar1639 + auVar665 * auVar1349 + auVar666 * auVar1350 +
           auVar669 * ZEXT816(0x1000003d10);
  uVar1678 = auVar1._0_8_;
  local_98 = uVar1678 & 0xfffffffffffff;
  auVar1641._8_8_ = 0;
  auVar1641._0_8_ = (uVar1678 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1682 & 0xfffffffffffff);
  auVar670._8_8_ = 0;
  auVar670._0_8_ = uVar1679 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1641 = auVar670 * ZEXT816(0x1000003d10) + auVar1641;
  uVar1679 = auVar1641._0_8_;
  uStack_90 = uVar1679 & 0xfffffffffffff;
  local_88 = (uVar1679 >> 0x34 | auVar1641._8_8_ << 0xc) + (uVar1692 & 0xffffffffffff);
  iVar1691 = 3;
  local_a8 = uVar1693 & 0xfffffffffffff;
  uStack_a0 = uVar1697 & 0xfffffffffffff;
  do {
    auVar671._8_8_ = 0;
    auVar671._0_8_ = local_a8 * 2;
    auVar1353._8_8_ = 0;
    auVar1353._0_8_ = uStack_90;
    auVar672._8_8_ = 0;
    auVar672._0_8_ = uStack_a0 * 2;
    auVar1354._8_8_ = 0;
    auVar1354._0_8_ = local_98;
    auVar673._8_8_ = 0;
    auVar673._0_8_ = local_88;
    auVar1355._8_8_ = 0;
    auVar1355._0_8_ = local_88;
    uVar1679 = SUB168(auVar673 * auVar1355,0);
    auVar674._8_8_ = 0;
    auVar674._0_8_ = uVar1679 & 0xfffffffffffff;
    auVar1 = auVar672 * auVar1354 + auVar671 * auVar1353 + auVar674 * ZEXT816(0x1000003d10);
    uVar1692 = auVar1._0_8_;
    auVar1642._8_8_ = 0;
    auVar1642._0_8_ = uVar1692 >> 0x34 | auVar1._8_8_ << 0xc;
    local_88 = local_88 * 2;
    auVar675._8_8_ = 0;
    auVar675._0_8_ = local_a8;
    auVar1356._8_8_ = 0;
    auVar1356._0_8_ = local_88;
    auVar676._8_8_ = 0;
    auVar676._0_8_ = uStack_a0 * 2;
    auVar1357._8_8_ = 0;
    auVar1357._0_8_ = uStack_90;
    auVar677._8_8_ = 0;
    auVar677._0_8_ = local_98;
    auVar1358._8_8_ = 0;
    auVar1358._0_8_ = local_98;
    auVar678._8_8_ = 0;
    auVar678._0_8_ = uVar1679 >> 0x34 | SUB168(auVar673 * auVar1355,8) << 0xc;
    auVar1 = auVar675 * auVar1356 + auVar1642 + auVar676 * auVar1357 + auVar677 * auVar1358 +
             auVar678 * ZEXT816(0x1000003d10);
    uVar1682 = auVar1._0_8_;
    auVar1643._8_8_ = 0;
    auVar1643._0_8_ = uVar1682 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar679._8_8_ = 0;
    auVar679._0_8_ = local_a8;
    auVar1359._8_8_ = 0;
    auVar1359._0_8_ = local_a8;
    auVar680._8_8_ = 0;
    auVar680._0_8_ = uStack_a0;
    auVar1360._8_8_ = 0;
    auVar1360._0_8_ = local_88;
    auVar681._8_8_ = 0;
    auVar681._0_8_ = local_98 * 2;
    auVar1361._8_8_ = 0;
    auVar1361._0_8_ = uStack_90;
    auVar1 = auVar680 * auVar1360 + auVar1643 + auVar681 * auVar1361;
    uVar1679 = auVar1._0_8_;
    auVar1645._8_8_ = 0;
    auVar1645._0_8_ = uVar1679 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1362._8_8_ = 0;
    auVar1362._0_8_ = (uVar1679 & 0xfffffffffffff) << 4 | (uVar1682 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar679 * auVar1359 + ZEXT816(0x1000003d1) * auVar1362;
    uVar1678 = auVar1._0_8_;
    uVar1679 = uVar1678 & 0xfffffffffffff;
    auVar1644._8_8_ = 0;
    auVar1644._0_8_ = uVar1678 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar682._8_8_ = 0;
    auVar682._0_8_ = local_a8 * 2;
    auVar1363._8_8_ = 0;
    auVar1363._0_8_ = uStack_a0;
    auVar683._8_8_ = 0;
    auVar683._0_8_ = local_98;
    auVar1364._8_8_ = 0;
    auVar1364._0_8_ = local_88;
    auVar684._8_8_ = 0;
    auVar684._0_8_ = uStack_90;
    auVar1365._8_8_ = 0;
    auVar1365._0_8_ = uStack_90;
    auVar2 = auVar683 * auVar1364 + auVar1645 + auVar684 * auVar1365;
    uVar1678 = auVar2._0_8_;
    auVar685._8_8_ = 0;
    auVar685._0_8_ = uVar1678 & 0xfffffffffffff;
    auVar1 = auVar682 * auVar1363 + auVar1644 + auVar685 * ZEXT816(0x1000003d10);
    uVar1683 = auVar1._0_8_;
    auVar1647._8_8_ = 0;
    auVar1647._0_8_ = uVar1678 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1678 = uVar1683 & 0xfffffffffffff;
    auVar1646._8_8_ = 0;
    auVar1646._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar686._8_8_ = 0;
    auVar686._0_8_ = local_a8 * 2;
    auVar1366._8_8_ = 0;
    auVar1366._0_8_ = local_98;
    auVar687._8_8_ = 0;
    auVar687._0_8_ = uStack_a0;
    auVar1367._8_8_ = 0;
    auVar1367._0_8_ = uStack_a0;
    auVar688._8_8_ = 0;
    auVar688._0_8_ = uStack_90;
    auVar1368._8_8_ = 0;
    auVar1368._0_8_ = local_88;
    auVar1647 = auVar688 * auVar1368 + auVar1647;
    uVar1683 = auVar1647._0_8_;
    auVar689._8_8_ = 0;
    auVar689._0_8_ = uVar1683 & 0xfffffffffffff;
    auVar1 = auVar686 * auVar1366 + auVar1646 + auVar687 * auVar1367 +
             auVar689 * ZEXT816(0x1000003d10);
    uVar1693 = auVar1._0_8_;
    local_98 = uVar1693 & 0xfffffffffffff;
    auVar1648._8_8_ = 0;
    auVar1648._0_8_ = (uVar1693 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1692 & 0xfffffffffffff);
    auVar690._8_8_ = 0;
    auVar690._0_8_ = uVar1683 >> 0x34 | auVar1647._8_8_ << 0xc;
    auVar1648 = auVar690 * ZEXT816(0x1000003d10) + auVar1648;
    uVar1692 = auVar1648._0_8_;
    uStack_90 = uVar1692 & 0xfffffffffffff;
    local_88 = (uVar1692 >> 0x34 | auVar1648._8_8_ << 0xc) + (uVar1682 & 0xffffffffffff);
    iVar1691 = iVar1691 + -1;
    local_a8 = uVar1679;
    uStack_a0 = uVar1678;
  } while (iVar1691 != 0);
  auVar691._8_8_ = 0;
  auVar691._0_8_ = uVar1694;
  auVar1369._8_8_ = 0;
  auVar1369._0_8_ = uStack_90;
  auVar692._8_8_ = 0;
  auVar692._0_8_ = uVar1695;
  auVar1370._8_8_ = 0;
  auVar1370._0_8_ = local_98;
  auVar693._8_8_ = 0;
  auVar693._0_8_ = uVar1684;
  auVar1371._8_8_ = 0;
  auVar1371._0_8_ = uVar1678;
  auVar694._8_8_ = 0;
  auVar694._0_8_ = uVar1680;
  auVar1372._8_8_ = 0;
  auVar1372._0_8_ = uVar1679;
  auVar695._8_8_ = 0;
  auVar695._0_8_ = uVar1696;
  auVar1373._8_8_ = 0;
  auVar1373._0_8_ = local_88;
  uVar1692 = SUB168(auVar695 * auVar1373,0);
  auVar696._8_8_ = 0;
  auVar696._0_8_ = uVar1692 & 0xfffffffffffff;
  auVar1 = auVar692 * auVar1370 + auVar691 * auVar1369 + auVar693 * auVar1371 + auVar694 * auVar1372
           + auVar696 * ZEXT816(0x1000003d10);
  uVar1683 = auVar1._0_8_;
  auVar1649._8_8_ = 0;
  auVar1649._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar697._8_8_ = 0;
  auVar697._0_8_ = uVar1694;
  auVar1374._8_8_ = 0;
  auVar1374._0_8_ = local_88;
  auVar698._8_8_ = 0;
  auVar698._0_8_ = uVar1695;
  auVar1375._8_8_ = 0;
  auVar1375._0_8_ = uStack_90;
  auVar699._8_8_ = 0;
  auVar699._0_8_ = uVar1684;
  auVar1376._8_8_ = 0;
  auVar1376._0_8_ = local_98;
  auVar700._8_8_ = 0;
  auVar700._0_8_ = uVar1680;
  auVar1377._8_8_ = 0;
  auVar1377._0_8_ = uVar1678;
  auVar701._8_8_ = 0;
  auVar701._0_8_ = uVar1696;
  auVar1378._8_8_ = 0;
  auVar1378._0_8_ = uVar1679;
  auVar702._8_8_ = 0;
  auVar702._0_8_ = uVar1692 >> 0x34 | SUB168(auVar695 * auVar1373,8) << 0xc;
  auVar1 = auVar697 * auVar1374 + auVar1649 + auVar698 * auVar1375 + auVar699 * auVar1376 +
           auVar700 * auVar1377 + auVar701 * auVar1378 + auVar702 * ZEXT816(0x1000003d10);
  uVar1693 = auVar1._0_8_;
  auVar1651._8_8_ = 0;
  auVar1651._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar703._8_8_ = 0;
  auVar703._0_8_ = uVar1694;
  auVar1379._8_8_ = 0;
  auVar1379._0_8_ = uVar1679;
  auVar704._8_8_ = 0;
  auVar704._0_8_ = uVar1695;
  auVar1380._8_8_ = 0;
  auVar1380._0_8_ = local_88;
  auVar705._8_8_ = 0;
  auVar705._0_8_ = uVar1684;
  auVar1381._8_8_ = 0;
  auVar1381._0_8_ = uStack_90;
  auVar706._8_8_ = 0;
  auVar706._0_8_ = uVar1680;
  auVar1382._8_8_ = 0;
  auVar1382._0_8_ = local_98;
  auVar707._8_8_ = 0;
  auVar707._0_8_ = uVar1696;
  auVar1383._8_8_ = 0;
  auVar1383._0_8_ = uVar1678;
  auVar1 = auVar704 * auVar1380 + auVar1651 + auVar705 * auVar1381 + auVar706 * auVar1382 +
           auVar707 * auVar1383;
  uVar1692 = auVar1._0_8_;
  auVar1653._8_8_ = 0;
  auVar1653._0_8_ = uVar1692 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1384._8_8_ = 0;
  auVar1384._0_8_ = (uVar1692 & 0xfffffffffffff) << 4 | (uVar1693 & 0xfffffffffffff) >> 0x30;
  uVar1682 = auVar1650._0_8_;
  auVar1650 = auVar703 * auVar1379 + ZEXT816(0x1000003d1) * auVar1384;
  uVar1692 = uVar1682 & 0xfffffffffffff;
  auVar1652._8_8_ = 0;
  auVar1652._0_8_ = uVar1682 >> 0x34 | auVar1650._8_8_ << 0xc;
  auVar708._8_8_ = 0;
  auVar708._0_8_ = uVar1694;
  auVar1385._8_8_ = 0;
  auVar1385._0_8_ = uVar1678;
  auVar709._8_8_ = 0;
  auVar709._0_8_ = uVar1695;
  auVar1386._8_8_ = 0;
  auVar1386._0_8_ = uVar1679;
  auVar710._8_8_ = 0;
  auVar710._0_8_ = uVar1684;
  auVar1387._8_8_ = 0;
  auVar1387._0_8_ = local_88;
  auVar711._8_8_ = 0;
  auVar711._0_8_ = uVar1680;
  auVar1388._8_8_ = 0;
  auVar1388._0_8_ = uStack_90;
  auVar712._8_8_ = 0;
  auVar712._0_8_ = uVar1696;
  auVar1389._8_8_ = 0;
  auVar1389._0_8_ = local_98;
  auVar2 = auVar710 * auVar1387 + auVar1653 + auVar711 * auVar1388 + auVar712 * auVar1389;
  uVar1682 = auVar2._0_8_;
  auVar713._8_8_ = 0;
  auVar713._0_8_ = uVar1682 & 0xfffffffffffff;
  auVar1 = auVar708 * auVar1385 + auVar1652 + auVar709 * auVar1386 +
           auVar713 * ZEXT816(0x1000003d10);
  uVar1697 = auVar1._0_8_;
  auVar1655._8_8_ = 0;
  auVar1655._0_8_ = uVar1682 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1682 = uVar1697 & 0xfffffffffffff;
  auVar1654._8_8_ = 0;
  auVar1654._0_8_ = uVar1697 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar714._8_8_ = 0;
  auVar714._0_8_ = uVar1694;
  auVar1390._8_8_ = 0;
  auVar1390._0_8_ = local_98;
  auVar715._8_8_ = 0;
  auVar715._0_8_ = uVar1695;
  auVar1391._8_8_ = 0;
  auVar1391._0_8_ = uVar1678;
  auVar716._8_8_ = 0;
  auVar716._0_8_ = uVar1684;
  auVar1392._8_8_ = 0;
  auVar1392._0_8_ = uVar1679;
  auVar717._8_8_ = 0;
  auVar717._0_8_ = uVar1680;
  auVar1393._8_8_ = 0;
  auVar1393._0_8_ = local_88;
  auVar718._8_8_ = 0;
  auVar718._0_8_ = uVar1696;
  auVar1394._8_8_ = 0;
  auVar1394._0_8_ = uStack_90;
  auVar2 = auVar717 * auVar1393 + auVar1655 + auVar718 * auVar1394;
  uVar1679 = auVar2._0_8_;
  auVar719._8_8_ = 0;
  auVar719._0_8_ = uVar1679 & 0xfffffffffffff;
  auVar1 = auVar714 * auVar1390 + auVar1654 + auVar715 * auVar1391 + auVar716 * auVar1392 +
           auVar719 * ZEXT816(0x1000003d10);
  uVar1694 = auVar1._0_8_;
  uVar1684 = uVar1694 & 0xfffffffffffff;
  auVar1656._8_8_ = 0;
  auVar1656._0_8_ = (uVar1694 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1683 & 0xfffffffffffff);
  auVar720._8_8_ = 0;
  auVar720._0_8_ = uVar1679 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1656 = auVar720 * ZEXT816(0x1000003d10) + auVar1656;
  uVar1679 = auVar1656._0_8_;
  uVar1694 = uVar1679 & 0xfffffffffffff;
  uVar1679 = (uVar1679 >> 0x34 | auVar1656._8_8_ << 0xc) + (uVar1693 & 0xffffffffffff);
  auVar721._8_8_ = 0;
  auVar721._0_8_ = uVar1692 * 2;
  auVar1395._8_8_ = 0;
  auVar1395._0_8_ = uVar1694;
  auVar722._8_8_ = 0;
  auVar722._0_8_ = uVar1682 * 2;
  auVar1396._8_8_ = 0;
  auVar1396._0_8_ = uVar1684;
  auVar723._8_8_ = 0;
  auVar723._0_8_ = uVar1679;
  auVar1397._8_8_ = 0;
  auVar1397._0_8_ = uVar1679;
  uVar1695 = SUB168(auVar723 * auVar1397,0);
  auVar724._8_8_ = 0;
  auVar724._0_8_ = uVar1695 & 0xfffffffffffff;
  auVar1 = auVar722 * auVar1396 + auVar721 * auVar1395 + auVar724 * ZEXT816(0x1000003d10);
  uVar1678 = auVar1._0_8_;
  auVar1657._8_8_ = 0;
  auVar1657._0_8_ = uVar1678 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1679 = uVar1679 * 2;
  auVar725._8_8_ = 0;
  auVar725._0_8_ = uVar1692;
  auVar1398._8_8_ = 0;
  auVar1398._0_8_ = uVar1679;
  auVar726._8_8_ = 0;
  auVar726._0_8_ = uVar1682 * 2;
  auVar1399._8_8_ = 0;
  auVar1399._0_8_ = uVar1694;
  auVar727._8_8_ = 0;
  auVar727._0_8_ = uVar1684;
  auVar1400._8_8_ = 0;
  auVar1400._0_8_ = uVar1684;
  auVar728._8_8_ = 0;
  auVar728._0_8_ = uVar1695 >> 0x34 | SUB168(auVar723 * auVar1397,8) << 0xc;
  auVar1 = auVar725 * auVar1398 + auVar1657 + auVar726 * auVar1399 + auVar727 * auVar1400 +
           auVar728 * ZEXT816(0x1000003d10);
  uVar1683 = auVar1._0_8_;
  auVar1658._8_8_ = 0;
  auVar1658._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar729._8_8_ = 0;
  auVar729._0_8_ = uVar1692;
  auVar1401._8_8_ = 0;
  auVar1401._0_8_ = uVar1692;
  auVar730._8_8_ = 0;
  auVar730._0_8_ = uVar1682;
  auVar1402._8_8_ = 0;
  auVar1402._0_8_ = uVar1679;
  auVar731._8_8_ = 0;
  auVar731._0_8_ = uVar1684 * 2;
  auVar1403._8_8_ = 0;
  auVar1403._0_8_ = uVar1694;
  auVar1 = auVar730 * auVar1402 + auVar1658 + auVar731 * auVar1403;
  uVar1695 = auVar1._0_8_;
  auVar1660._8_8_ = 0;
  auVar1660._0_8_ = uVar1695 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1404._8_8_ = 0;
  auVar1404._0_8_ = (uVar1695 & 0xfffffffffffff) << 4 | (uVar1683 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar729 * auVar1401 + ZEXT816(0x1000003d1) * auVar1404;
  uVar1680 = auVar1._0_8_;
  uVar1695 = uVar1680 & 0xfffffffffffff;
  auVar1659._8_8_ = 0;
  auVar1659._0_8_ = uVar1680 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar732._8_8_ = 0;
  auVar732._0_8_ = uVar1692 * 2;
  auVar1405._8_8_ = 0;
  auVar1405._0_8_ = uVar1682;
  auVar733._8_8_ = 0;
  auVar733._0_8_ = uVar1684;
  auVar1406._8_8_ = 0;
  auVar1406._0_8_ = uVar1679;
  auVar734._8_8_ = 0;
  auVar734._0_8_ = uVar1694;
  auVar1407._8_8_ = 0;
  auVar1407._0_8_ = uVar1694;
  auVar2 = auVar733 * auVar1406 + auVar1660 + auVar734 * auVar1407;
  uVar1680 = auVar2._0_8_;
  auVar735._8_8_ = 0;
  auVar735._0_8_ = uVar1680 & 0xfffffffffffff;
  auVar1 = auVar732 * auVar1405 + auVar1659 + auVar735 * ZEXT816(0x1000003d10);
  uVar1693 = auVar1._0_8_;
  auVar1662._8_8_ = 0;
  auVar1662._0_8_ = uVar1680 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1680 = uVar1693 & 0xfffffffffffff;
  auVar1661._8_8_ = 0;
  auVar1661._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar736._8_8_ = 0;
  auVar736._0_8_ = uVar1692 * 2;
  auVar1408._8_8_ = 0;
  auVar1408._0_8_ = uVar1684;
  auVar737._8_8_ = 0;
  auVar737._0_8_ = uVar1682;
  auVar1409._8_8_ = 0;
  auVar1409._0_8_ = uVar1682;
  auVar738._8_8_ = 0;
  auVar738._0_8_ = uVar1694;
  auVar1410._8_8_ = 0;
  auVar1410._0_8_ = uVar1679;
  auVar1662 = auVar738 * auVar1410 + auVar1662;
  uVar1679 = auVar1662._0_8_;
  auVar739._8_8_ = 0;
  auVar739._0_8_ = uVar1679 & 0xfffffffffffff;
  auVar1 = auVar736 * auVar1408 + auVar1661 + auVar737 * auVar1409 +
           auVar739 * ZEXT816(0x1000003d10);
  uVar1694 = auVar1._0_8_;
  uVar1684 = uVar1694 & 0xfffffffffffff;
  auVar1663._8_8_ = 0;
  auVar1663._0_8_ = (uVar1694 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1678 & 0xfffffffffffff);
  auVar740._8_8_ = 0;
  auVar740._0_8_ = uVar1679 >> 0x34 | auVar1662._8_8_ << 0xc;
  auVar1663 = auVar740 * ZEXT816(0x1000003d10) + auVar1663;
  uVar1679 = auVar1663._0_8_;
  uVar1694 = uVar1679 & 0xfffffffffffff;
  uVar1679 = (uVar1679 >> 0x34 | auVar1663._8_8_ << 0xc) + (uVar1683 & 0xffffffffffff);
  auVar741._8_8_ = 0;
  auVar741._0_8_ = uVar1695 * 2;
  auVar1411._8_8_ = 0;
  auVar1411._0_8_ = uVar1694;
  auVar742._8_8_ = 0;
  auVar742._0_8_ = uVar1680 * 2;
  auVar1412._8_8_ = 0;
  auVar1412._0_8_ = uVar1684;
  auVar743._8_8_ = 0;
  auVar743._0_8_ = uVar1679;
  auVar1413._8_8_ = 0;
  auVar1413._0_8_ = uVar1679;
  uVar1678 = SUB168(auVar743 * auVar1413,0);
  auVar744._8_8_ = 0;
  auVar744._0_8_ = uVar1678 & 0xfffffffffffff;
  auVar1 = auVar742 * auVar1412 + auVar741 * auVar1411 + auVar744 * ZEXT816(0x1000003d10);
  uVar1683 = auVar1._0_8_;
  auVar1664._8_8_ = 0;
  auVar1664._0_8_ = uVar1683 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1679 = uVar1679 * 2;
  auVar745._8_8_ = 0;
  auVar745._0_8_ = uVar1695;
  auVar1414._8_8_ = 0;
  auVar1414._0_8_ = uVar1679;
  auVar746._8_8_ = 0;
  auVar746._0_8_ = uVar1680 * 2;
  auVar1415._8_8_ = 0;
  auVar1415._0_8_ = uVar1694;
  auVar747._8_8_ = 0;
  auVar747._0_8_ = uVar1684;
  auVar1416._8_8_ = 0;
  auVar1416._0_8_ = uVar1684;
  auVar748._8_8_ = 0;
  auVar748._0_8_ = uVar1678 >> 0x34 | SUB168(auVar743 * auVar1413,8) << 0xc;
  auVar1 = auVar745 * auVar1414 + auVar1664 + auVar746 * auVar1415 + auVar747 * auVar1416 +
           auVar748 * ZEXT816(0x1000003d10);
  uVar1693 = auVar1._0_8_;
  auVar1665._8_8_ = 0;
  auVar1665._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar749._8_8_ = 0;
  auVar749._0_8_ = uVar1695;
  auVar1417._8_8_ = 0;
  auVar1417._0_8_ = uVar1695;
  auVar750._8_8_ = 0;
  auVar750._0_8_ = uVar1680;
  auVar1418._8_8_ = 0;
  auVar1418._0_8_ = uVar1679;
  auVar751._8_8_ = 0;
  auVar751._0_8_ = uVar1684 * 2;
  auVar1419._8_8_ = 0;
  auVar1419._0_8_ = uVar1694;
  auVar1 = auVar750 * auVar1418 + auVar1665 + auVar751 * auVar1419;
  uVar1678 = auVar1._0_8_;
  auVar1667._8_8_ = 0;
  auVar1667._0_8_ = uVar1678 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1420._8_8_ = 0;
  auVar1420._0_8_ = (uVar1678 & 0xfffffffffffff) << 4 | (uVar1693 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar749 * auVar1417 + ZEXT816(0x1000003d1) * auVar1420;
  uVar1692 = auVar1._0_8_;
  uVar1678 = uVar1692 & 0xfffffffffffff;
  auVar1666._8_8_ = 0;
  auVar1666._0_8_ = uVar1692 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar752._8_8_ = 0;
  auVar752._0_8_ = uVar1695 * 2;
  auVar1421._8_8_ = 0;
  auVar1421._0_8_ = uVar1680;
  auVar753._8_8_ = 0;
  auVar753._0_8_ = uVar1684;
  auVar1422._8_8_ = 0;
  auVar1422._0_8_ = uVar1679;
  auVar754._8_8_ = 0;
  auVar754._0_8_ = uVar1694;
  auVar1423._8_8_ = 0;
  auVar1423._0_8_ = uVar1694;
  auVar2 = auVar753 * auVar1422 + auVar1667 + auVar754 * auVar1423;
  uVar1692 = auVar2._0_8_;
  auVar755._8_8_ = 0;
  auVar755._0_8_ = uVar1692 & 0xfffffffffffff;
  auVar1 = auVar752 * auVar1421 + auVar1666 + auVar755 * ZEXT816(0x1000003d10);
  uVar1682 = auVar1._0_8_;
  auVar1669._8_8_ = 0;
  auVar1669._0_8_ = uVar1692 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1692 = uVar1682 & 0xfffffffffffff;
  auVar1668._8_8_ = 0;
  auVar1668._0_8_ = uVar1682 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar756._8_8_ = 0;
  auVar756._0_8_ = uVar1695 * 2;
  auVar1424._8_8_ = 0;
  auVar1424._0_8_ = uVar1684;
  auVar757._8_8_ = 0;
  auVar757._0_8_ = uVar1680;
  auVar1425._8_8_ = 0;
  auVar1425._0_8_ = uVar1680;
  auVar758._8_8_ = 0;
  auVar758._0_8_ = uVar1694;
  auVar1426._8_8_ = 0;
  auVar1426._0_8_ = uVar1679;
  auVar1669 = auVar758 * auVar1426 + auVar1669;
  uVar1679 = auVar1669._0_8_;
  auVar759._8_8_ = 0;
  auVar759._0_8_ = uVar1679 & 0xfffffffffffff;
  auVar1 = auVar756 * auVar1424 + auVar1668 + auVar757 * auVar1425 +
           auVar759 * ZEXT816(0x1000003d10);
  uVar1684 = auVar1._0_8_;
  uVar1682 = uVar1684 & 0xfffffffffffff;
  auVar1670._8_8_ = 0;
  auVar1670._0_8_ = (uVar1684 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1683 & 0xfffffffffffff);
  auVar760._8_8_ = 0;
  auVar760._0_8_ = uVar1679 >> 0x34 | auVar1669._8_8_ << 0xc;
  auVar1670 = auVar760 * ZEXT816(0x1000003d10) + auVar1670;
  uVar1679 = auVar1670._0_8_;
  uVar1683 = uVar1679 & 0xfffffffffffff;
  uVar1696 = (uVar1679 >> 0x34 | auVar1670._8_8_ << 0xc) + (uVar1693 & 0xffffffffffff);
  uVar1679 = a->n[0];
  uVar1684 = a->n[1];
  uVar1694 = a->n[2];
  uVar1695 = a->n[3];
  uVar1680 = a->n[4];
  auVar761._8_8_ = 0;
  auVar761._0_8_ = uVar1678;
  auVar1427._8_8_ = 0;
  auVar1427._0_8_ = uVar1695;
  auVar762._8_8_ = 0;
  auVar762._0_8_ = uVar1692;
  auVar1428._8_8_ = 0;
  auVar1428._0_8_ = uVar1694;
  auVar763._8_8_ = 0;
  auVar763._0_8_ = uVar1682;
  auVar1429._8_8_ = 0;
  auVar1429._0_8_ = uVar1684;
  auVar764._8_8_ = 0;
  auVar764._0_8_ = uVar1683;
  auVar1430._8_8_ = 0;
  auVar1430._0_8_ = uVar1679;
  auVar765._8_8_ = 0;
  auVar765._0_8_ = uVar1696;
  auVar1431._8_8_ = 0;
  auVar1431._0_8_ = uVar1680;
  uVar1693 = SUB168(auVar765 * auVar1431,0);
  auVar766._8_8_ = 0;
  auVar766._0_8_ = uVar1693 & 0xfffffffffffff;
  auVar1 = auVar762 * auVar1428 + auVar761 * auVar1427 + auVar763 * auVar1429 + auVar764 * auVar1430
           + auVar766 * ZEXT816(0x1000003d10);
  uVar1697 = auVar1._0_8_;
  auVar1671._8_8_ = 0;
  auVar1671._0_8_ = uVar1697 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar767._8_8_ = 0;
  auVar767._0_8_ = uVar1678;
  auVar1432._8_8_ = 0;
  auVar1432._0_8_ = uVar1680;
  auVar768._8_8_ = 0;
  auVar768._0_8_ = uVar1692;
  auVar1433._8_8_ = 0;
  auVar1433._0_8_ = uVar1695;
  auVar769._8_8_ = 0;
  auVar769._0_8_ = uVar1682;
  auVar1434._8_8_ = 0;
  auVar1434._0_8_ = uVar1694;
  auVar770._8_8_ = 0;
  auVar770._0_8_ = uVar1683;
  auVar1435._8_8_ = 0;
  auVar1435._0_8_ = uVar1684;
  auVar771._8_8_ = 0;
  auVar771._0_8_ = uVar1696;
  auVar1436._8_8_ = 0;
  auVar1436._0_8_ = uVar1679;
  auVar772._8_8_ = 0;
  auVar772._0_8_ = uVar1693 >> 0x34 | SUB168(auVar765 * auVar1431,8) << 0xc;
  auVar1 = auVar767 * auVar1432 + auVar1671 + auVar768 * auVar1433 + auVar769 * auVar1434 +
           auVar770 * auVar1435 + auVar771 * auVar1436 + auVar772 * ZEXT816(0x1000003d10);
  uVar1693 = auVar1._0_8_;
  auVar1672._8_8_ = 0;
  auVar1672._0_8_ = uVar1693 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar773._8_8_ = 0;
  auVar773._0_8_ = uVar1678;
  auVar1437._8_8_ = 0;
  auVar1437._0_8_ = uVar1679;
  auVar774._8_8_ = 0;
  auVar774._0_8_ = uVar1692;
  auVar1438._8_8_ = 0;
  auVar1438._0_8_ = uVar1680;
  auVar775._8_8_ = 0;
  auVar775._0_8_ = uVar1682;
  auVar1439._8_8_ = 0;
  auVar1439._0_8_ = uVar1695;
  auVar776._8_8_ = 0;
  auVar776._0_8_ = uVar1683;
  auVar1440._8_8_ = 0;
  auVar1440._0_8_ = uVar1694;
  auVar777._8_8_ = 0;
  auVar777._0_8_ = uVar1696;
  auVar1441._8_8_ = 0;
  auVar1441._0_8_ = uVar1684;
  auVar1 = auVar774 * auVar1438 + auVar1672 + auVar775 * auVar1439 + auVar776 * auVar1440 +
           auVar777 * auVar1441;
  uVar1681 = auVar1._0_8_;
  auVar1674._8_8_ = 0;
  auVar1674._0_8_ = uVar1681 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1442._8_8_ = 0;
  auVar1442._0_8_ = (uVar1681 & 0xfffffffffffff) << 4 | (uVar1693 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar773 * auVar1437 + ZEXT816(0x1000003d1) * auVar1442;
  uVar1681 = auVar1._0_8_;
  r->n[0] = uVar1681 & 0xfffffffffffff;
  auVar1673._8_8_ = 0;
  auVar1673._0_8_ = uVar1681 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar778._8_8_ = 0;
  auVar778._0_8_ = uVar1678;
  auVar1443._8_8_ = 0;
  auVar1443._0_8_ = uVar1684;
  auVar779._8_8_ = 0;
  auVar779._0_8_ = uVar1692;
  auVar1444._8_8_ = 0;
  auVar1444._0_8_ = uVar1679;
  auVar780._8_8_ = 0;
  auVar780._0_8_ = uVar1682;
  auVar1445._8_8_ = 0;
  auVar1445._0_8_ = uVar1680;
  auVar781._8_8_ = 0;
  auVar781._0_8_ = uVar1683;
  auVar1446._8_8_ = 0;
  auVar1446._0_8_ = uVar1695;
  auVar782._8_8_ = 0;
  auVar782._0_8_ = uVar1696;
  auVar1447._8_8_ = 0;
  auVar1447._0_8_ = uVar1694;
  auVar2 = auVar780 * auVar1445 + auVar1674 + auVar781 * auVar1446 + auVar782 * auVar1447;
  uVar1681 = auVar2._0_8_;
  auVar783._8_8_ = 0;
  auVar783._0_8_ = uVar1681 & 0xfffffffffffff;
  auVar1 = auVar778 * auVar1443 + auVar1673 + auVar779 * auVar1444 +
           auVar783 * ZEXT816(0x1000003d10);
  uVar1698 = auVar1._0_8_;
  auVar1676._8_8_ = 0;
  auVar1676._0_8_ = uVar1681 >> 0x34 | auVar2._8_8_ << 0xc;
  r->n[1] = uVar1698 & 0xfffffffffffff;
  auVar1675._8_8_ = 0;
  auVar1675._0_8_ = uVar1698 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar784._8_8_ = 0;
  auVar784._0_8_ = uVar1678;
  auVar1448._8_8_ = 0;
  auVar1448._0_8_ = uVar1694;
  auVar785._8_8_ = 0;
  auVar785._0_8_ = uVar1692;
  auVar1449._8_8_ = 0;
  auVar1449._0_8_ = uVar1684;
  auVar786._8_8_ = 0;
  auVar786._0_8_ = uVar1682;
  auVar1450._8_8_ = 0;
  auVar1450._0_8_ = uVar1679;
  auVar787._8_8_ = 0;
  auVar787._0_8_ = uVar1683;
  auVar1451._8_8_ = 0;
  auVar1451._0_8_ = uVar1680;
  auVar788._8_8_ = 0;
  auVar788._0_8_ = uVar1696;
  auVar1452._8_8_ = 0;
  auVar1452._0_8_ = uVar1695;
  auVar2 = auVar787 * auVar1451 + auVar1676 + auVar788 * auVar1452;
  uVar1679 = auVar2._0_8_;
  auVar789._8_8_ = 0;
  auVar789._0_8_ = uVar1679 & 0xfffffffffffff;
  auVar1 = auVar784 * auVar1448 + auVar1675 + auVar785 * auVar1449 + auVar786 * auVar1450 +
           auVar789 * ZEXT816(0x1000003d10);
  uVar1684 = auVar1._0_8_;
  r->n[2] = uVar1684 & 0xfffffffffffff;
  auVar1677._8_8_ = 0;
  auVar1677._0_8_ = (uVar1684 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1697 & 0xfffffffffffff);
  auVar790._8_8_ = 0;
  auVar790._0_8_ = uVar1679 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1677 = auVar790 * ZEXT816(0x1000003d10) + auVar1677;
  uVar1679 = auVar1677._0_8_;
  r->n[3] = uVar1679 & 0xfffffffffffff;
  r->n[4] = (uVar1679 >> 0x34 | auVar1677._8_8_ << 0xc) + (uVar1693 & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *a) {
    secp256k1_fe x2, x3, x6, x9, x11, x22, x44, x88, x176, x220, x223, t1;
    int j;

    /** The binary representation of (p - 2) has 5 blocks of 1s, with lengths in
     *  { 1, 2, 22, 223 }. Use an addition chain to calculate 2^n - 1 for each block:
     *  [1], [2], 3, 6, 9, 11, [22], 44, 88, 176, 220, [223]
     */

    secp256k1_fe_sqr(&x2, a);
    secp256k1_fe_mul(&x2, &x2, a);

    secp256k1_fe_sqr(&x3, &x2);
    secp256k1_fe_mul(&x3, &x3, a);

    x6 = x3;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x6, &x6);
    }
    secp256k1_fe_mul(&x6, &x6, &x3);

    x9 = x6;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x9, &x9);
    }
    secp256k1_fe_mul(&x9, &x9, &x3);

    x11 = x9;
    for (j=0; j<2; j++) {
        secp256k1_fe_sqr(&x11, &x11);
    }
    secp256k1_fe_mul(&x11, &x11, &x2);

    x22 = x11;
    for (j=0; j<11; j++) {
        secp256k1_fe_sqr(&x22, &x22);
    }
    secp256k1_fe_mul(&x22, &x22, &x11);

    x44 = x22;
    for (j=0; j<22; j++) {
        secp256k1_fe_sqr(&x44, &x44);
    }
    secp256k1_fe_mul(&x44, &x44, &x22);

    x88 = x44;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x88, &x88);
    }
    secp256k1_fe_mul(&x88, &x88, &x44);

    x176 = x88;
    for (j=0; j<88; j++) {
        secp256k1_fe_sqr(&x176, &x176);
    }
    secp256k1_fe_mul(&x176, &x176, &x88);

    x220 = x176;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x220, &x220);
    }
    secp256k1_fe_mul(&x220, &x220, &x44);

    x223 = x220;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x223, &x223);
    }
    secp256k1_fe_mul(&x223, &x223, &x3);

    /* The final result is then assembled using a sliding window over the blocks. */

    t1 = x223;
    for (j=0; j<23; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x22);
    for (j=0; j<5; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, a);
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x2);
    for (j=0; j<2; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(r, a, &t1);
}